

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaCompressorSimd.cpp
# Opt level: O2

void anon_unknown.dwarf_111f50::testDct(void)

{
  undefined1 (*pauVar1) [16];
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined4 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  undefined4 uVar83;
  undefined4 uVar84;
  undefined4 uVar85;
  undefined4 uVar86;
  undefined4 uVar87;
  undefined4 uVar88;
  undefined4 uVar89;
  undefined8 uVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  int iter_1;
  int iVar105;
  ostream *poVar106;
  __m128 *srcVec;
  undefined1 (*pauVar107) [16];
  int col;
  long lVar108;
  undefined8 *puVar109;
  float *pfVar110;
  int iter;
  int iVar111;
  int i;
  long lVar112;
  ulong uVar113;
  int iter_19;
  byte bVar114;
  float fVar115;
  float fVar174;
  float fVar176;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  double dVar116;
  float fVar175;
  undefined1 in_ZMM0 [64];
  undefined1 auVar141 [64];
  undefined1 extraout_var_24 [48];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 extraout_var_08 [56];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  float fVar177;
  float fVar197;
  float fVar198;
  float fVar199;
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar200;
  float fVar209;
  float fVar210;
  float fVar211;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar212;
  float fVar226;
  float fVar227;
  float fVar228;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  float fVar229;
  float fVar238;
  float fVar239;
  float fVar240;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar241;
  float fVar256;
  float fVar257;
  float fVar258;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  float fVar259;
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  float fVar267;
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  float fVar283;
  float fVar284;
  float fVar285;
  undefined1 in_ZMM7 [64];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  undefined1 auVar276 [64];
  undefined1 auVar277 [64];
  undefined1 auVar278 [64];
  undefined1 auVar286 [48];
  undefined1 auVar287 [36];
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  undefined1 auVar282 [64];
  float fVar288;
  float fVar312;
  float fVar313;
  float fVar314;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  float fVar315;
  float fVar324;
  float fVar325;
  float fVar326;
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  float fVar335;
  float fVar336;
  float fVar345;
  float fVar347;
  float fVar349;
  float fVar351;
  float fVar352;
  float fVar353;
  undefined1 auVar337 [32];
  float fVar346;
  float fVar348;
  float fVar350;
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  float fVar385;
  undefined1 auVar371 [32];
  float fVar386;
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  float fVar387;
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  SimdAlignedBuffer64f test;
  SimdAlignedBuffer64f orig;
  Rand48 rand48;
  __m128 in [8];
  CpuId cpuid;
  SimdAlignedBuffer64<float> local_108;
  SimdAlignedBuffer64<float> local_f8;
  ushort local_e6 [3];
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float local_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float local_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float local_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float local_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  CpuId local_5f [5];
  char local_5a;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 extraout_var_15 [56];
  undefined1 extraout_var_16 [56];
  undefined1 extraout_var_17 [56];
  undefined1 extraout_var_18 [56];
  undefined1 extraout_var_19 [56];
  undefined1 extraout_var_20 [56];
  undefined1 extraout_var_21 [56];
  undefined1 extraout_var_22 [56];
  undefined1 extraout_var_23 [56];
  
  bVar114 = 0;
  local_e6[0] = 0x5a5a;
  local_e6[1] = 0x5a5a;
  local_e6[2] = 0x5a5a;
  Imf_3_2::SimdAlignedBuffer64<float>::SimdAlignedBuffer64(&local_f8);
  Imf_3_2::SimdAlignedBuffer64<float>::SimdAlignedBuffer64(&local_108);
  poVar106 = std::operator<<((ostream *)&std::cout,"   DCT Round Trip ");
  std::endl<char,std::char_traits<char>>(poVar106);
  for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
    for (lVar112 = 0; lVar112 != 0x40; lVar112 = lVar112 + 1) {
      auVar141._0_8_ = (double)Imath_3_2::erand48(local_e6);
      auVar141._8_56_ = extraout_var;
      in_ZMM0._4_60_ = auVar141._4_60_;
      in_ZMM0._0_4_ = (float)auVar141._0_8_;
      *(float *)((undefined1 *)local_108._buffer + lVar112 * 4) = in_ZMM0._0_4_;
      local_f8._buffer[lVar112] = in_ZMM0._0_4_;
    }
    for (iVar105 = 0; iVar105 != 2; iVar105 = iVar105 + 1) {
      lVar112 = 0xe0;
      while( true ) {
        if (lVar112 == 0x100) break;
        pfVar110 = (float *)((undefined1 *)local_108._buffer + lVar112);
        pfVar6 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0xe0) + lVar112);
        pfVar7 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0xc0) + lVar112);
        pfVar8 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0xa0) + lVar112);
        pfVar2 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0x80) + lVar112);
        fVar241 = *pfVar6 + *pfVar110;
        fVar256 = pfVar6[1] + pfVar110[1];
        fVar257 = pfVar6[2] + pfVar110[2];
        fVar258 = pfVar6[3] + pfVar110[3];
        fVar115 = *pfVar7 + *pfVar8;
        fVar174 = pfVar7[1] + pfVar8[1];
        fVar175 = pfVar7[2] + pfVar8[2];
        fVar176 = pfVar7[3] + pfVar8[3];
        pfVar3 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0x60) + lVar112);
        fVar267 = *pfVar2 + *pfVar3;
        fVar283 = pfVar2[1] + pfVar3[1];
        fVar284 = pfVar2[2] + pfVar3[2];
        fVar285 = pfVar2[3] + pfVar3[3];
        pfVar4 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0x40) + lVar112);
        pfVar5 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0x20) + lVar112);
        fVar200 = *pfVar6 - *pfVar110;
        fVar209 = pfVar6[1] - pfVar110[1];
        fVar210 = pfVar6[2] - pfVar110[2];
        fVar211 = pfVar6[3] - pfVar110[3];
        fVar259 = *pfVar4 + *pfVar5;
        fVar264 = pfVar4[1] + pfVar5[1];
        fVar265 = pfVar4[2] + pfVar5[2];
        fVar266 = pfVar4[3] + pfVar5[3];
        fVar229 = *pfVar7 - *pfVar8;
        fVar238 = pfVar7[1] - pfVar8[1];
        fVar239 = pfVar7[2] - pfVar8[2];
        fVar240 = pfVar7[3] - pfVar8[3];
        fVar212 = *pfVar2 - *pfVar3;
        fVar226 = pfVar2[1] - pfVar3[1];
        fVar227 = pfVar2[2] - pfVar3[2];
        fVar228 = pfVar2[3] - pfVar3[3];
        fVar177 = *pfVar4 - *pfVar5;
        fVar197 = pfVar4[1] - pfVar5[1];
        fVar198 = pfVar4[2] - pfVar5[2];
        fVar199 = pfVar4[3] - pfVar5[3];
        fVar335 = (float)DAT_001a43a0;
        fVar345 = DAT_001a43a0._4_4_;
        fVar347 = DAT_001a43a0._8_4_;
        fVar349 = DAT_001a43a0._12_4_;
        fVar288 = (fVar241 + fVar267) * fVar335;
        fVar312 = (fVar256 + fVar283) * fVar345;
        fVar313 = (fVar257 + fVar284) * fVar347;
        fVar314 = (fVar258 + fVar285) * fVar349;
        fVar315 = (fVar115 + fVar259) * fVar335;
        fVar324 = (fVar174 + fVar264) * fVar345;
        fVar325 = (fVar175 + fVar265) * fVar347;
        fVar326 = (fVar176 + fVar266) * fVar349;
        pfVar110 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0xe0) + lVar112);
        *pfVar110 = (fVar288 + fVar315) * 0.5;
        pfVar110[1] = (fVar312 + fVar324) * 0.5;
        pfVar110[2] = (fVar313 + fVar325) * 0.5;
        pfVar110[3] = (fVar314 + fVar326) * 0.5;
        pfVar110 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0x60) + lVar112);
        *pfVar110 = (fVar288 - fVar315) * 0.5;
        pfVar110[1] = (fVar312 - fVar324) * 0.5;
        pfVar110[2] = (fVar313 - fVar325) * 0.5;
        pfVar110[3] = (fVar314 - fVar326) * 0.5;
        fVar288 = fVar229 - fVar177;
        fVar312 = fVar238 - fVar197;
        fVar313 = fVar239 - fVar198;
        fVar314 = fVar240 - fVar199;
        fVar241 = fVar241 - fVar267;
        fVar256 = fVar256 - fVar283;
        fVar257 = fVar257 - fVar284;
        fVar258 = fVar258 - fVar285;
        fVar267 = (float)DAT_001a43c0;
        fVar283 = DAT_001a43c0._4_4_;
        fVar284 = DAT_001a43c0._8_4_;
        fVar285 = DAT_001a43c0._12_4_;
        fVar315 = (float)DAT_001a43d0;
        fVar324 = DAT_001a43d0._4_4_;
        fVar325 = DAT_001a43d0._8_4_;
        fVar326 = DAT_001a43d0._12_4_;
        pfVar110 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0xa0) + lVar112);
        *pfVar110 = fVar241 * fVar315 + fVar288 * fVar267;
        pfVar110[1] = fVar256 * fVar324 + fVar312 * fVar283;
        pfVar110[2] = fVar257 * fVar325 + fVar313 * fVar284;
        pfVar110[3] = fVar258 * fVar326 + fVar314 * fVar285;
        pfVar110 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0x20) + lVar112);
        *pfVar110 = fVar241 * fVar267 - fVar288 * fVar315;
        pfVar110[1] = fVar256 * fVar283 - fVar312 * fVar324;
        pfVar110[2] = fVar257 * fVar284 - fVar313 * fVar325;
        pfVar110[3] = fVar258 * fVar285 - fVar314 * fVar326;
        fVar335 = (fVar115 - fVar259) * fVar335;
        fVar345 = (fVar174 - fVar264) * fVar345;
        fVar347 = (fVar175 - fVar265) * fVar347;
        fVar349 = (fVar176 - fVar266) * fVar349;
        fVar115 = (fVar177 + fVar229) * -0.70710677;
        fVar174 = (fVar197 + fVar238) * -0.70710677;
        fVar175 = (fVar198 + fVar239) * -0.70710677;
        fVar176 = (fVar199 + fVar240) * -0.70710677;
        fVar177 = fVar200 - fVar335;
        fVar197 = fVar209 - fVar345;
        fVar198 = fVar210 - fVar347;
        fVar199 = fVar211 - fVar349;
        fVar229 = fVar212 + fVar115;
        fVar238 = fVar226 + fVar174;
        fVar239 = fVar227 + fVar175;
        fVar240 = fVar228 + fVar176;
        fVar241 = (float)DAT_001a43f0;
        fVar256 = DAT_001a43f0._4_4_;
        fVar257 = DAT_001a43f0._8_4_;
        fVar258 = DAT_001a43f0._12_4_;
        fVar259 = (float)DAT_001a4400;
        fVar264 = DAT_001a4400._4_4_;
        fVar265 = DAT_001a4400._8_4_;
        fVar266 = DAT_001a4400._12_4_;
        in_ZMM7._0_4_ = fVar229 * fVar259;
        in_ZMM7._4_4_ = fVar238 * fVar264;
        in_ZMM7._8_4_ = fVar239 * fVar265;
        in_ZMM7._12_4_ = fVar240 * fVar266;
        pfVar110 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0x80) + lVar112);
        *pfVar110 = fVar177 * fVar241 - in_ZMM7._0_4_;
        pfVar110[1] = fVar197 * fVar256 - in_ZMM7._4_4_;
        pfVar110[2] = fVar198 * fVar257 - in_ZMM7._8_4_;
        pfVar110[3] = fVar199 * fVar258 - in_ZMM7._12_4_;
        pfVar110 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0x40) + lVar112);
        *pfVar110 = fVar229 * fVar241 + fVar177 * fVar259;
        pfVar110[1] = fVar238 * fVar256 + fVar197 * fVar264;
        pfVar110[2] = fVar239 * fVar257 + fVar198 * fVar265;
        pfVar110[3] = fVar240 * fVar258 + fVar199 * fVar266;
        fVar335 = fVar335 + fVar200;
        fVar345 = fVar345 + fVar209;
        fVar347 = fVar347 + fVar210;
        fVar349 = fVar349 + fVar211;
        fVar115 = fVar115 - fVar212;
        fVar174 = fVar174 - fVar226;
        fVar175 = fVar175 - fVar227;
        fVar176 = fVar176 - fVar228;
        fVar177 = (float)DAT_001a4420;
        fVar197 = DAT_001a4420._4_4_;
        fVar198 = DAT_001a4420._8_4_;
        fVar199 = DAT_001a4420._12_4_;
        pfVar110 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0xc0) + lVar112);
        *pfVar110 = fVar335 * 0.49039263 - fVar115 * fVar177;
        pfVar110[1] = fVar345 * 0.49039263 - fVar174 * fVar197;
        pfVar110[2] = fVar347 * 0.49039263 - fVar175 * fVar198;
        pfVar110[3] = fVar349 * 0.49039263 - fVar176 * fVar199;
        in_ZMM0._0_4_ = fVar335 * fVar177;
        in_ZMM0._4_4_ = fVar345 * fVar197;
        in_ZMM0._8_4_ = fVar347 * fVar198;
        in_ZMM0._12_4_ = fVar349 * fVar199;
        pfVar110 = (float *)((undefined1 *)local_108._buffer + lVar112);
        *pfVar110 = fVar115 * 0.49039263 + in_ZMM0._0_4_;
        pfVar110[1] = fVar174 * 0.49039263 + in_ZMM0._4_4_;
        pfVar110[2] = fVar175 * 0.49039263 + in_ZMM0._8_4_;
        pfVar110[3] = fVar176 * 0.49039263 + in_ZMM0._12_4_;
        lVar112 = lVar112 + 0x10;
      }
      uVar60 = *(undefined4 *)((undefined1 *)local_108._buffer + 4);
      uVar61 = *(undefined4 *)((undefined1 *)local_108._buffer + 8);
      uVar62 = *(undefined4 *)((undefined1 *)local_108._buffer + 0xc);
      uVar63 = *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      uVar64 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4);
      uVar65 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8);
      uVar66 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc);
      uVar67 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4);
      uVar68 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8);
      uVar69 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc);
      uVar70 = *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      uVar71 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4);
      uVar72 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8);
      uVar73 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc);
      uVar74 = *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40);
      uVar75 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4);
      uVar76 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8);
      uVar77 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc);
      uVar78 = *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60);
      uVar79 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4);
      uVar80 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8);
      uVar81 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc);
      uVar82 = *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x90);
      uVar83 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 4);
      uVar84 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 8);
      uVar85 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 0xc);
      uVar86 = *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0xb0);
      uVar87 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 4);
      uVar88 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 8);
      uVar89 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 0xc);
      auVar117 = *(undefined1 (*) [16])((long)local_108._buffer + 0xd0);
      auVar118 = *(undefined1 (*) [16])((long)local_108._buffer + 0xf0);
      *(undefined4 *)(undefined1 *)local_108._buffer =
           *(undefined4 *)(undefined1 *)local_108._buffer;
      *(undefined4 *)((undefined1 *)local_108._buffer + 4) =
           *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      *(undefined4 *)((undefined1 *)local_108._buffer + 8) = uVar74;
      *(undefined4 *)((undefined1 *)local_108._buffer + 0xc) = uVar78;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) = uVar61;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) = uVar68;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) = uVar76;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) = uVar80;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) = uVar60;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) = uVar67;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) = uVar75;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) = uVar79;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) = uVar62;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) = uVar69;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) = uVar77;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) = uVar81;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x90) = uVar82;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 4) = uVar86;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 8) = auVar117._0_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 0xc) = auVar118._0_4_;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) = uVar84;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 4) = uVar88;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 8) = auVar117._8_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 0xc) = auVar118._8_4_;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) = uVar83;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 4) = uVar87;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 8) = auVar117._4_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 0xc) = auVar118._4_4_;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) = uVar85;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) + 4) = uVar89;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) + 8) = auVar117._12_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) + 0xc) = auVar118._12_4_;
      auVar117 = *(undefined1 (*) [16])((long)local_108._buffer + 0x50);
      auVar118 = *(undefined1 (*) [16])((long)local_108._buffer + 0x70);
      uVar60 = *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x80);
      uVar61 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 4);
      uVar62 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 8);
      uVar67 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 0xc);
      uVar68 = *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0xa0);
      uVar69 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 4);
      uVar74 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 8);
      uVar75 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 0xc);
      auVar119 = *(undefined1 (*) [16])((long)local_108._buffer + 0xc0);
      auVar120 = *(undefined1 (*) [16])((long)local_108._buffer + 0xe0);
      in_ZMM7._8_8_ = auVar120._8_8_;
      in_ZMM7._0_8_ = auVar119._8_8_;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x80) = uVar63;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 4) = uVar70;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 8) = auVar117._0_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 0xc) = auVar118._0_4_;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) = uVar65;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 4) = uVar72;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 8) = auVar117._8_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 0xc) = auVar118._8_4_;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) = uVar64;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 4) = uVar71;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 8) = auVar117._4_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 0xc) = auVar118._4_4_;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) = uVar66;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + 4) = uVar73;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + 8) = auVar117._12_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + 0xc) = auVar118._12_4_;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) = uVar60;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) = uVar68;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) = auVar119._0_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) = auVar120._0_4_;
      auVar117._4_4_ = uVar74;
      auVar117._0_4_ = uVar62;
      auVar117._8_4_ = auVar119._8_4_;
      auVar117._12_4_ = auVar120._8_4_;
      in_ZMM0._0_16_ = auVar117;
      *(undefined1 (*) [16])((long)local_108._buffer + 0x50) = auVar117;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) = uVar61;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) = uVar69;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) = auVar119._4_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) = auVar120._4_4_;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) = uVar67;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) = uVar75;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) = auVar119._12_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) = auVar120._12_4_;
    }
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_108._buffer);
    in_ZMM0._0_12_ = ZEXT812(0x3ca3d70a);
    in_ZMM0._12_4_ = 0.0;
    compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,0.001);
  }
  poVar106 = std::operator<<((ostream *)&std::cout,"      Inverse, DC Only");
  std::endl<char,std::char_traits<char>>(poVar106);
  for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
    dVar116 = (double)Imath_3_2::erand48(local_e6);
    *(float *)(undefined1 *)local_108._buffer = (float)dVar116;
    *local_f8._buffer = (float)dVar116;
    for (lVar112 = 1; lVar112 != 0x40; lVar112 = lVar112 + 1) {
      *(undefined4 *)((undefined1 *)local_108._buffer + lVar112 * 4) = 0;
      local_f8._buffer[lVar112] = 0.0;
    }
    in_ZMM0._16_48_ = extraout_var_24;
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
    fVar115 = *(float *)(undefined1 *)local_108._buffer * 0.3535536 * 0.3535536;
    for (lVar112 = 0; lVar112 != 0x100; lVar112 = lVar112 + 0x10) {
      pfVar110 = (float *)((undefined1 *)local_108._buffer + lVar112);
      *pfVar110 = fVar115;
      pfVar110[1] = fVar115;
      pfVar110[2] = fVar115;
      pfVar110[3] = fVar115;
    }
    in_ZMM0._0_12_ = ZEXT812(0x3c23d70a);
    in_ZMM0._12_4_ = 0.0;
    compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,1e-06);
  }
  poVar106 = std::operator<<((ostream *)&std::cout,"      Inverse, Scalar: ");
  std::endl<char,std::char_traits<char>>(poVar106);
  poVar106 = std::operator<<((ostream *)&std::cout,"         ");
  poVar106 = std::operator<<(poVar106,"8x8");
  std::endl<char,std::char_traits<char>>(poVar106);
  for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
    for (lVar112 = 0; lVar112 != 0x40; lVar112 = lVar112 + 1) {
      auVar142._0_8_ = (double)Imath_3_2::erand48(local_e6);
      auVar142._8_56_ = extraout_var_00;
      in_ZMM0._4_60_ = auVar142._4_60_;
      in_ZMM0._0_4_ = (float)auVar142._0_8_;
      *(float *)((undefined1 *)local_108._buffer + lVar112 * 4) = in_ZMM0._0_4_;
      local_f8._buffer[lVar112] = in_ZMM0._0_4_;
    }
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_108._buffer);
    in_ZMM0._0_12_ = ZEXT812(0x3c23d70a);
    in_ZMM0._12_4_ = 0.0;
    compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,1e-06);
  }
  poVar106 = std::operator<<((ostream *)&std::cout,"         ");
  poVar106 = std::operator<<(poVar106,"7x8");
  std::endl<char,std::char_traits<char>>(poVar106);
  for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
    for (uVar113 = 0; uVar113 != 0x40; uVar113 = uVar113 + 1) {
      in_ZMM0._0_16_ = ZEXT816(0);
      if (uVar113 < 0x38) {
        auVar143._0_8_ = (double)Imath_3_2::erand48(local_e6);
        auVar143._8_56_ = extraout_var_01;
        in_ZMM0._4_60_ = auVar143._4_60_;
        in_ZMM0._0_4_ = (float)auVar143._0_8_;
      }
      *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
      local_f8._buffer[uVar113] = in_ZMM0._0_4_;
    }
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
    for (lVar112 = 0; lVar112 != 0xe0; lVar112 = lVar112 + 0x20) {
      fVar175 = (*(float *)((undefined1 *)local_108._buffer + lVar112) +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112)) *
                0.35355362;
      fVar347 = (*(float *)((undefined1 *)local_108._buffer + lVar112) -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112)) *
                0.35355362;
      fVar349 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 8) * 0.19134216 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 8) *
                0.46193984;
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 8) *
                0.19134216 + *(float *)((undefined1 *)local_108._buffer + lVar112 + 8) * 0.46193984;
      fVar115 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 0xc);
      fVar335 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 4);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 4);
      fVar345 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 0xc);
      fVar177 = fVar345 * 0.097545706 +
                fVar174 * 0.27778545 + fVar335 * 0.49039266 + fVar115 * 0.41573495;
      fVar197 = fVar345 * -0.27778545 +
                fVar174 * -0.49039266 + fVar335 * 0.41573495 + fVar115 * -0.097545706;
      fVar198 = fVar345 * 0.41573495 +
                fVar174 * 0.097545706 + fVar335 * 0.27778545 + fVar115 * -0.49039266;
      fVar174 = fVar345 * -0.49039266 +
                fVar174 * 0.41573495 + fVar335 * 0.097545706 + fVar115 * -0.27778545;
      fVar115 = fVar349 + fVar347;
      fVar335 = fVar176 + fVar175;
      fVar175 = fVar175 - fVar176;
      fVar347 = fVar347 - fVar349;
      auVar118._0_4_ = fVar177 + fVar335;
      auVar118._4_4_ = fVar197 + fVar115;
      auVar118._8_4_ = fVar198 + fVar347;
      auVar118._12_4_ = fVar174 + fVar175;
      in_ZMM0._0_16_ = auVar118;
      *(undefined1 (*) [16])((undefined1 *)local_108._buffer + lVar112) = auVar118;
      pfVar110 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112);
      *pfVar110 = fVar175 - fVar174;
      pfVar110[1] = fVar347 - fVar198;
      pfVar110[2] = fVar115 - fVar197;
      pfVar110[3] = fVar335 - fVar177;
    }
    for (lVar112 = -8; auVar144._16_48_ = in_ZMM0._16_48_, lVar112 != 0; lVar112 = lVar112 + 1) {
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.19134216 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.46193984;
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.19134216 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.46193984;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4);
      auVar272._16_48_ = in_ZMM7._16_48_;
      fVar345 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4);
      fVar349 = fVar345 * 0.097545706 +
                fVar174 * 0.27778545 + fVar115 * 0.49039266 + fVar335 * 0.41573495;
      fVar177 = fVar345 * -0.27778545 +
                fVar174 * -0.49039266 + fVar115 * 0.41573495 + fVar335 * -0.097545706;
      fVar197 = fVar345 * 0.41573495 +
                fVar174 * 0.097545706 + fVar115 * 0.27778545 + fVar335 * -0.49039266;
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4);
      fVar335 = fVar345 * -0.49039266 +
                fVar174 * 0.41573495 + fVar115 * 0.097545706 + fVar335 * -0.27778545;
      auVar272._0_16_ = ZEXT416((uint)fVar175);
      in_ZMM7._4_60_ = auVar272._4_60_;
      fVar345 = (fVar175 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar175 = (fVar175 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar174 = fVar347 + fVar175;
      fVar175 = fVar175 - fVar347;
      auVar144._0_16_ = ZEXT416((uint)fVar176);
      in_ZMM0._4_60_ = auVar144._4_60_;
      fVar115 = fVar176 + fVar345;
      fVar345 = fVar345 - fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4) =
           fVar349 + fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4) =
           fVar177 + fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) =
           fVar197 + fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4) =
           fVar335 + fVar345;
      in_ZMM7._0_4_ = fVar345 - fVar335;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4) =
           in_ZMM7._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4) =
           fVar175 - fVar197;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) =
           fVar174 - fVar177;
      in_ZMM0._0_4_ = fVar115 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4) =
           in_ZMM0._0_4_;
    }
    in_ZMM0._0_12_ = ZEXT812(0x3c23d70a);
    in_ZMM0._12_4_ = 0.0;
    in_ZMM0._16_48_ = auVar144._16_48_;
    compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,1e-06);
  }
  poVar106 = std::operator<<((ostream *)&std::cout,"         ");
  poVar106 = std::operator<<(poVar106,"6x8");
  std::endl<char,std::char_traits<char>>(poVar106);
  for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
    for (uVar113 = 0; uVar113 != 0x40; uVar113 = uVar113 + 1) {
      in_ZMM0._0_16_ = ZEXT816(0);
      if (uVar113 < 0x30) {
        auVar145._0_8_ = (double)Imath_3_2::erand48(local_e6);
        auVar145._8_56_ = extraout_var_02;
        in_ZMM0._4_60_ = auVar145._4_60_;
        in_ZMM0._0_4_ = (float)auVar145._0_8_;
      }
      *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
      local_f8._buffer[uVar113] = in_ZMM0._0_4_;
    }
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
    for (lVar112 = 0; lVar112 != 0xc0; lVar112 = lVar112 + 0x20) {
      fVar175 = (*(float *)((undefined1 *)local_108._buffer + lVar112) +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112)) *
                0.35355362;
      fVar347 = (*(float *)((undefined1 *)local_108._buffer + lVar112) -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112)) *
                0.35355362;
      fVar349 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 8) * 0.19134216 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 8) *
                0.46193984;
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 8) *
                0.19134216 + *(float *)((undefined1 *)local_108._buffer + lVar112 + 8) * 0.46193984;
      fVar115 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 0xc);
      fVar335 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 4);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 4);
      fVar345 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 0xc);
      fVar177 = fVar345 * 0.097545706 +
                fVar174 * 0.27778545 + fVar335 * 0.49039266 + fVar115 * 0.41573495;
      fVar197 = fVar345 * -0.27778545 +
                fVar174 * -0.49039266 + fVar335 * 0.41573495 + fVar115 * -0.097545706;
      fVar198 = fVar345 * 0.41573495 +
                fVar174 * 0.097545706 + fVar335 * 0.27778545 + fVar115 * -0.49039266;
      fVar174 = fVar345 * -0.49039266 +
                fVar174 * 0.41573495 + fVar335 * 0.097545706 + fVar115 * -0.27778545;
      fVar115 = fVar349 + fVar347;
      fVar335 = fVar176 + fVar175;
      fVar175 = fVar175 - fVar176;
      fVar347 = fVar347 - fVar349;
      auVar119._0_4_ = fVar177 + fVar335;
      auVar119._4_4_ = fVar197 + fVar115;
      auVar119._8_4_ = fVar198 + fVar347;
      auVar119._12_4_ = fVar174 + fVar175;
      in_ZMM0._0_16_ = auVar119;
      *(undefined1 (*) [16])((undefined1 *)local_108._buffer + lVar112) = auVar119;
      pfVar110 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112);
      *pfVar110 = fVar175 - fVar174;
      pfVar110[1] = fVar347 - fVar198;
      pfVar110[2] = fVar115 - fVar197;
      pfVar110[3] = fVar335 - fVar177;
    }
    for (lVar112 = -8; auVar146._16_48_ = in_ZMM0._16_48_, lVar112 != 0; lVar112 = lVar112 + 1) {
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.19134216 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.46193984;
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.19134216 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.46193984;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4);
      auVar273._16_48_ = in_ZMM7._16_48_;
      fVar345 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4);
      fVar349 = fVar345 * 0.097545706 +
                fVar174 * 0.27778545 + fVar115 * 0.49039266 + fVar335 * 0.41573495;
      fVar177 = fVar345 * -0.27778545 +
                fVar174 * -0.49039266 + fVar115 * 0.41573495 + fVar335 * -0.097545706;
      fVar197 = fVar345 * 0.41573495 +
                fVar174 * 0.097545706 + fVar115 * 0.27778545 + fVar335 * -0.49039266;
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4);
      fVar335 = fVar345 * -0.49039266 +
                fVar174 * 0.41573495 + fVar115 * 0.097545706 + fVar335 * -0.27778545;
      auVar273._0_16_ = ZEXT416((uint)fVar175);
      in_ZMM7._4_60_ = auVar273._4_60_;
      fVar345 = (fVar175 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar175 = (fVar175 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar174 = fVar347 + fVar175;
      fVar175 = fVar175 - fVar347;
      auVar146._0_16_ = ZEXT416((uint)fVar176);
      in_ZMM0._4_60_ = auVar146._4_60_;
      fVar115 = fVar176 + fVar345;
      fVar345 = fVar345 - fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4) =
           fVar349 + fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4) =
           fVar177 + fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) =
           fVar197 + fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4) =
           fVar335 + fVar345;
      in_ZMM7._0_4_ = fVar345 - fVar335;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4) =
           in_ZMM7._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4) =
           fVar175 - fVar197;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) =
           fVar174 - fVar177;
      in_ZMM0._0_4_ = fVar115 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4) =
           in_ZMM0._0_4_;
    }
    in_ZMM0._0_12_ = ZEXT812(0x3c23d70a);
    in_ZMM0._12_4_ = 0.0;
    in_ZMM0._16_48_ = auVar146._16_48_;
    compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,1e-06);
  }
  poVar106 = std::operator<<((ostream *)&std::cout,"         ");
  poVar106 = std::operator<<(poVar106,"5x8");
  std::endl<char,std::char_traits<char>>(poVar106);
  for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
    for (uVar113 = 0; uVar113 != 0x40; uVar113 = uVar113 + 1) {
      in_ZMM0._0_16_ = ZEXT816(0);
      if (uVar113 < 0x28) {
        auVar147._0_8_ = (double)Imath_3_2::erand48(local_e6);
        auVar147._8_56_ = extraout_var_03;
        in_ZMM0._4_60_ = auVar147._4_60_;
        in_ZMM0._0_4_ = (float)auVar147._0_8_;
      }
      *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
      local_f8._buffer[uVar113] = in_ZMM0._0_4_;
    }
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
    for (lVar112 = 0; lVar112 != 0xa0; lVar112 = lVar112 + 0x20) {
      fVar175 = (*(float *)((undefined1 *)local_108._buffer + lVar112) +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112)) *
                0.35355362;
      fVar347 = (*(float *)((undefined1 *)local_108._buffer + lVar112) -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112)) *
                0.35355362;
      fVar349 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 8) * 0.19134216 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 8) *
                0.46193984;
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 8) *
                0.19134216 + *(float *)((undefined1 *)local_108._buffer + lVar112 + 8) * 0.46193984;
      fVar115 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 0xc);
      fVar335 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 4);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 4);
      fVar345 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 0xc);
      fVar177 = fVar345 * 0.097545706 +
                fVar174 * 0.27778545 + fVar335 * 0.49039266 + fVar115 * 0.41573495;
      fVar197 = fVar345 * -0.27778545 +
                fVar174 * -0.49039266 + fVar335 * 0.41573495 + fVar115 * -0.097545706;
      fVar198 = fVar345 * 0.41573495 +
                fVar174 * 0.097545706 + fVar335 * 0.27778545 + fVar115 * -0.49039266;
      fVar174 = fVar345 * -0.49039266 +
                fVar174 * 0.41573495 + fVar335 * 0.097545706 + fVar115 * -0.27778545;
      fVar115 = fVar349 + fVar347;
      fVar335 = fVar176 + fVar175;
      fVar175 = fVar175 - fVar176;
      fVar347 = fVar347 - fVar349;
      auVar120._0_4_ = fVar177 + fVar335;
      auVar120._4_4_ = fVar197 + fVar115;
      auVar120._8_4_ = fVar198 + fVar347;
      auVar120._12_4_ = fVar174 + fVar175;
      in_ZMM0._0_16_ = auVar120;
      *(undefined1 (*) [16])((undefined1 *)local_108._buffer + lVar112) = auVar120;
      pfVar110 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112);
      *pfVar110 = fVar175 - fVar174;
      pfVar110[1] = fVar347 - fVar198;
      pfVar110[2] = fVar115 - fVar197;
      pfVar110[3] = fVar335 - fVar177;
    }
    for (lVar112 = -8; auVar148._16_48_ = in_ZMM0._16_48_, lVar112 != 0; lVar112 = lVar112 + 1) {
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.19134216 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.46193984;
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.19134216 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.46193984;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4);
      auVar274._16_48_ = in_ZMM7._16_48_;
      fVar345 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4);
      fVar349 = fVar345 * 0.097545706 +
                fVar174 * 0.27778545 + fVar115 * 0.49039266 + fVar335 * 0.41573495;
      fVar177 = fVar345 * -0.27778545 +
                fVar174 * -0.49039266 + fVar115 * 0.41573495 + fVar335 * -0.097545706;
      fVar197 = fVar345 * 0.41573495 +
                fVar174 * 0.097545706 + fVar115 * 0.27778545 + fVar335 * -0.49039266;
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4);
      fVar335 = fVar345 * -0.49039266 +
                fVar174 * 0.41573495 + fVar115 * 0.097545706 + fVar335 * -0.27778545;
      auVar274._0_16_ = ZEXT416((uint)fVar175);
      in_ZMM7._4_60_ = auVar274._4_60_;
      fVar345 = (fVar175 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar175 = (fVar175 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar174 = fVar347 + fVar175;
      fVar175 = fVar175 - fVar347;
      auVar148._0_16_ = ZEXT416((uint)fVar176);
      in_ZMM0._4_60_ = auVar148._4_60_;
      fVar115 = fVar176 + fVar345;
      fVar345 = fVar345 - fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4) =
           fVar349 + fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4) =
           fVar177 + fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) =
           fVar197 + fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4) =
           fVar335 + fVar345;
      in_ZMM7._0_4_ = fVar345 - fVar335;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4) =
           in_ZMM7._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4) =
           fVar175 - fVar197;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) =
           fVar174 - fVar177;
      in_ZMM0._0_4_ = fVar115 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4) =
           in_ZMM0._0_4_;
    }
    in_ZMM0._0_12_ = ZEXT812(0x3c23d70a);
    in_ZMM0._12_4_ = 0.0;
    in_ZMM0._16_48_ = auVar148._16_48_;
    compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,1e-06);
  }
  poVar106 = std::operator<<((ostream *)&std::cout,"         ");
  poVar106 = std::operator<<(poVar106,"4x8");
  std::endl<char,std::char_traits<char>>(poVar106);
  for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
    for (uVar113 = 0; uVar113 != 0x40; uVar113 = uVar113 + 1) {
      in_ZMM0._0_16_ = ZEXT816(0);
      if (uVar113 < 0x20) {
        auVar149._0_8_ = (double)Imath_3_2::erand48(local_e6);
        auVar149._8_56_ = extraout_var_04;
        in_ZMM0._4_60_ = auVar149._4_60_;
        in_ZMM0._0_4_ = (float)auVar149._0_8_;
      }
      *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
      local_f8._buffer[uVar113] = in_ZMM0._0_4_;
    }
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
    for (lVar112 = 0; lVar112 != 0x80; lVar112 = lVar112 + 0x20) {
      fVar175 = (*(float *)((undefined1 *)local_108._buffer + lVar112) +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112)) *
                0.35355362;
      fVar347 = (*(float *)((undefined1 *)local_108._buffer + lVar112) -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112)) *
                0.35355362;
      fVar349 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 8) * 0.19134216 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 8) *
                0.46193984;
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 8) *
                0.19134216 + *(float *)((undefined1 *)local_108._buffer + lVar112 + 8) * 0.46193984;
      fVar115 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 0xc);
      fVar335 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 4);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 4);
      fVar345 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 0xc);
      fVar177 = fVar345 * 0.097545706 +
                fVar174 * 0.27778545 + fVar335 * 0.49039266 + fVar115 * 0.41573495;
      fVar197 = fVar345 * -0.27778545 +
                fVar174 * -0.49039266 + fVar335 * 0.41573495 + fVar115 * -0.097545706;
      fVar198 = fVar345 * 0.41573495 +
                fVar174 * 0.097545706 + fVar335 * 0.27778545 + fVar115 * -0.49039266;
      fVar174 = fVar345 * -0.49039266 +
                fVar174 * 0.41573495 + fVar335 * 0.097545706 + fVar115 * -0.27778545;
      fVar115 = fVar349 + fVar347;
      fVar335 = fVar176 + fVar175;
      fVar175 = fVar175 - fVar176;
      fVar347 = fVar347 - fVar349;
      auVar121._0_4_ = fVar177 + fVar335;
      auVar121._4_4_ = fVar197 + fVar115;
      auVar121._8_4_ = fVar198 + fVar347;
      auVar121._12_4_ = fVar174 + fVar175;
      in_ZMM0._0_16_ = auVar121;
      *(undefined1 (*) [16])((undefined1 *)local_108._buffer + lVar112) = auVar121;
      pfVar110 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112);
      *pfVar110 = fVar175 - fVar174;
      pfVar110[1] = fVar347 - fVar198;
      pfVar110[2] = fVar115 - fVar197;
      pfVar110[3] = fVar335 - fVar177;
    }
    for (lVar112 = -8; auVar150._16_48_ = in_ZMM0._16_48_, lVar112 != 0; lVar112 = lVar112 + 1) {
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.19134216 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.46193984;
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.19134216 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.46193984;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4);
      auVar275._16_48_ = in_ZMM7._16_48_;
      fVar345 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4);
      fVar349 = fVar345 * 0.097545706 +
                fVar174 * 0.27778545 + fVar115 * 0.49039266 + fVar335 * 0.41573495;
      fVar177 = fVar345 * -0.27778545 +
                fVar174 * -0.49039266 + fVar115 * 0.41573495 + fVar335 * -0.097545706;
      fVar197 = fVar345 * 0.41573495 +
                fVar174 * 0.097545706 + fVar115 * 0.27778545 + fVar335 * -0.49039266;
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4);
      fVar335 = fVar345 * -0.49039266 +
                fVar174 * 0.41573495 + fVar115 * 0.097545706 + fVar335 * -0.27778545;
      auVar275._0_16_ = ZEXT416((uint)fVar175);
      in_ZMM7._4_60_ = auVar275._4_60_;
      fVar345 = (fVar175 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar175 = (fVar175 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar174 = fVar347 + fVar175;
      fVar175 = fVar175 - fVar347;
      auVar150._0_16_ = ZEXT416((uint)fVar176);
      in_ZMM0._4_60_ = auVar150._4_60_;
      fVar115 = fVar176 + fVar345;
      fVar345 = fVar345 - fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4) =
           fVar349 + fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4) =
           fVar177 + fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) =
           fVar197 + fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4) =
           fVar335 + fVar345;
      in_ZMM7._0_4_ = fVar345 - fVar335;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4) =
           in_ZMM7._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4) =
           fVar175 - fVar197;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) =
           fVar174 - fVar177;
      in_ZMM0._0_4_ = fVar115 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4) =
           in_ZMM0._0_4_;
    }
    in_ZMM0._0_12_ = ZEXT812(0x3c23d70a);
    in_ZMM0._12_4_ = 0.0;
    in_ZMM0._16_48_ = auVar150._16_48_;
    compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,1e-06);
  }
  poVar106 = std::operator<<((ostream *)&std::cout,"         ");
  poVar106 = std::operator<<(poVar106,"3x8");
  std::endl<char,std::char_traits<char>>(poVar106);
  for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
    for (uVar113 = 0; uVar113 != 0x40; uVar113 = uVar113 + 1) {
      in_ZMM0._0_16_ = ZEXT816(0);
      if (uVar113 < 0x18) {
        auVar151._0_8_ = (double)Imath_3_2::erand48(local_e6);
        auVar151._8_56_ = extraout_var_05;
        in_ZMM0._4_60_ = auVar151._4_60_;
        in_ZMM0._0_4_ = (float)auVar151._0_8_;
      }
      *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
      local_f8._buffer[uVar113] = in_ZMM0._0_4_;
    }
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
    for (lVar112 = 0; lVar112 != 0x60; lVar112 = lVar112 + 0x20) {
      fVar175 = (*(float *)((undefined1 *)local_108._buffer + lVar112) +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112)) *
                0.35355362;
      fVar347 = (*(float *)((undefined1 *)local_108._buffer + lVar112) -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112)) *
                0.35355362;
      fVar349 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 8) * 0.19134216 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 8) *
                0.46193984;
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 8) *
                0.19134216 + *(float *)((undefined1 *)local_108._buffer + lVar112 + 8) * 0.46193984;
      fVar115 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 0xc);
      fVar335 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 4);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 4);
      fVar345 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 0xc);
      fVar177 = fVar345 * 0.097545706 +
                fVar174 * 0.27778545 + fVar335 * 0.49039266 + fVar115 * 0.41573495;
      fVar197 = fVar345 * -0.27778545 +
                fVar174 * -0.49039266 + fVar335 * 0.41573495 + fVar115 * -0.097545706;
      fVar198 = fVar345 * 0.41573495 +
                fVar174 * 0.097545706 + fVar335 * 0.27778545 + fVar115 * -0.49039266;
      fVar174 = fVar345 * -0.49039266 +
                fVar174 * 0.41573495 + fVar335 * 0.097545706 + fVar115 * -0.27778545;
      fVar115 = fVar349 + fVar347;
      fVar335 = fVar176 + fVar175;
      fVar175 = fVar175 - fVar176;
      fVar347 = fVar347 - fVar349;
      auVar122._0_4_ = fVar177 + fVar335;
      auVar122._4_4_ = fVar197 + fVar115;
      auVar122._8_4_ = fVar198 + fVar347;
      auVar122._12_4_ = fVar174 + fVar175;
      in_ZMM0._0_16_ = auVar122;
      *(undefined1 (*) [16])((undefined1 *)local_108._buffer + lVar112) = auVar122;
      pfVar110 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112);
      *pfVar110 = fVar175 - fVar174;
      pfVar110[1] = fVar347 - fVar198;
      pfVar110[2] = fVar115 - fVar197;
      pfVar110[3] = fVar335 - fVar177;
    }
    for (lVar112 = -8; auVar152._16_48_ = in_ZMM0._16_48_, lVar112 != 0; lVar112 = lVar112 + 1) {
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.19134216 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.46193984;
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.19134216 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.46193984;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4);
      auVar276._16_48_ = in_ZMM7._16_48_;
      fVar345 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4);
      fVar349 = fVar345 * 0.097545706 +
                fVar174 * 0.27778545 + fVar115 * 0.49039266 + fVar335 * 0.41573495;
      fVar177 = fVar345 * -0.27778545 +
                fVar174 * -0.49039266 + fVar115 * 0.41573495 + fVar335 * -0.097545706;
      fVar197 = fVar345 * 0.41573495 +
                fVar174 * 0.097545706 + fVar115 * 0.27778545 + fVar335 * -0.49039266;
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4);
      fVar335 = fVar345 * -0.49039266 +
                fVar174 * 0.41573495 + fVar115 * 0.097545706 + fVar335 * -0.27778545;
      auVar276._0_16_ = ZEXT416((uint)fVar175);
      in_ZMM7._4_60_ = auVar276._4_60_;
      fVar345 = (fVar175 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar175 = (fVar175 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar174 = fVar347 + fVar175;
      fVar175 = fVar175 - fVar347;
      auVar152._0_16_ = ZEXT416((uint)fVar176);
      in_ZMM0._4_60_ = auVar152._4_60_;
      fVar115 = fVar176 + fVar345;
      fVar345 = fVar345 - fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4) =
           fVar349 + fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4) =
           fVar177 + fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) =
           fVar197 + fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4) =
           fVar335 + fVar345;
      in_ZMM7._0_4_ = fVar345 - fVar335;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4) =
           in_ZMM7._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4) =
           fVar175 - fVar197;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) =
           fVar174 - fVar177;
      in_ZMM0._0_4_ = fVar115 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4) =
           in_ZMM0._0_4_;
    }
    in_ZMM0._0_12_ = ZEXT812(0x3c23d70a);
    in_ZMM0._12_4_ = 0.0;
    in_ZMM0._16_48_ = auVar152._16_48_;
    compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,1e-06);
  }
  poVar106 = std::operator<<((ostream *)&std::cout,"         ");
  poVar106 = std::operator<<(poVar106,"2x8");
  std::endl<char,std::char_traits<char>>(poVar106);
  for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
    for (uVar113 = 0; uVar113 != 0x40; uVar113 = uVar113 + 1) {
      in_ZMM0._0_16_ = ZEXT816(0);
      if (uVar113 < 0x10) {
        auVar153._0_8_ = (double)Imath_3_2::erand48(local_e6);
        auVar153._8_56_ = extraout_var_06;
        in_ZMM0._4_60_ = auVar153._4_60_;
        in_ZMM0._0_4_ = (float)auVar153._0_8_;
      }
      *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
      local_f8._buffer[uVar113] = in_ZMM0._0_4_;
    }
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
    for (lVar112 = 0; lVar112 != 0x40; lVar112 = lVar112 + 0x20) {
      fVar175 = (*(float *)((undefined1 *)local_108._buffer + lVar112) +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112)) *
                0.35355362;
      fVar347 = (*(float *)((undefined1 *)local_108._buffer + lVar112) -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112)) *
                0.35355362;
      fVar349 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 8) * 0.19134216 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 8) *
                0.46193984;
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 8) *
                0.19134216 + *(float *)((undefined1 *)local_108._buffer + lVar112 + 8) * 0.46193984;
      fVar115 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 0xc);
      fVar335 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 4);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 4);
      fVar345 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 0xc);
      fVar177 = fVar345 * 0.097545706 +
                fVar174 * 0.27778545 + fVar335 * 0.49039266 + fVar115 * 0.41573495;
      fVar197 = fVar345 * -0.27778545 +
                fVar174 * -0.49039266 + fVar335 * 0.41573495 + fVar115 * -0.097545706;
      fVar198 = fVar345 * 0.41573495 +
                fVar174 * 0.097545706 + fVar335 * 0.27778545 + fVar115 * -0.49039266;
      fVar174 = fVar345 * -0.49039266 +
                fVar174 * 0.41573495 + fVar335 * 0.097545706 + fVar115 * -0.27778545;
      fVar115 = fVar349 + fVar347;
      fVar335 = fVar176 + fVar175;
      fVar175 = fVar175 - fVar176;
      fVar347 = fVar347 - fVar349;
      auVar123._0_4_ = fVar177 + fVar335;
      auVar123._4_4_ = fVar197 + fVar115;
      auVar123._8_4_ = fVar198 + fVar347;
      auVar123._12_4_ = fVar174 + fVar175;
      in_ZMM0._0_16_ = auVar123;
      *(undefined1 (*) [16])((undefined1 *)local_108._buffer + lVar112) = auVar123;
      pfVar110 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112);
      *pfVar110 = fVar175 - fVar174;
      pfVar110[1] = fVar347 - fVar198;
      pfVar110[2] = fVar115 - fVar197;
      pfVar110[3] = fVar335 - fVar177;
    }
    for (lVar112 = -8; auVar154._16_48_ = in_ZMM0._16_48_, lVar112 != 0; lVar112 = lVar112 + 1) {
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.19134216 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.46193984;
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.19134216 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.46193984;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4);
      auVar277._16_48_ = in_ZMM7._16_48_;
      fVar345 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4);
      fVar349 = fVar345 * 0.097545706 +
                fVar174 * 0.27778545 + fVar115 * 0.49039266 + fVar335 * 0.41573495;
      fVar177 = fVar345 * -0.27778545 +
                fVar174 * -0.49039266 + fVar115 * 0.41573495 + fVar335 * -0.097545706;
      fVar197 = fVar345 * 0.41573495 +
                fVar174 * 0.097545706 + fVar115 * 0.27778545 + fVar335 * -0.49039266;
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4);
      fVar335 = fVar345 * -0.49039266 +
                fVar174 * 0.41573495 + fVar115 * 0.097545706 + fVar335 * -0.27778545;
      auVar277._0_16_ = ZEXT416((uint)fVar175);
      in_ZMM7._4_60_ = auVar277._4_60_;
      fVar345 = (fVar175 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar175 = (fVar175 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar174 = fVar347 + fVar175;
      fVar175 = fVar175 - fVar347;
      auVar154._0_16_ = ZEXT416((uint)fVar176);
      in_ZMM0._4_60_ = auVar154._4_60_;
      fVar115 = fVar176 + fVar345;
      fVar345 = fVar345 - fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4) =
           fVar349 + fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4) =
           fVar177 + fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) =
           fVar197 + fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4) =
           fVar335 + fVar345;
      in_ZMM7._0_4_ = fVar345 - fVar335;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4) =
           in_ZMM7._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4) =
           fVar175 - fVar197;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) =
           fVar174 - fVar177;
      in_ZMM0._0_4_ = fVar115 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4) =
           in_ZMM0._0_4_;
    }
    in_ZMM0._0_12_ = ZEXT812(0x3c23d70a);
    in_ZMM0._12_4_ = 0.0;
    in_ZMM0._16_48_ = auVar154._16_48_;
    compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,1e-06);
  }
  poVar106 = std::operator<<((ostream *)&std::cout,"         ");
  poVar106 = std::operator<<(poVar106,"1x8");
  std::endl<char,std::char_traits<char>>(poVar106);
  for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
    for (uVar113 = 0; uVar113 != 0x40; uVar113 = uVar113 + 1) {
      in_ZMM0._0_16_ = ZEXT816(0);
      if (uVar113 < 8) {
        auVar155._0_8_ = (double)Imath_3_2::erand48(local_e6);
        auVar155._8_56_ = extraout_var_07;
        in_ZMM0._4_60_ = auVar155._4_60_;
        in_ZMM0._0_4_ = (float)auVar155._0_8_;
      }
      *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
      local_f8._buffer[uVar113] = in_ZMM0._0_4_;
    }
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
    fVar175 = (*(float *)(undefined1 *)local_108._buffer +
              *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10)) * 0.35355362;
    fVar347 = (*(float *)(undefined1 *)local_108._buffer -
              *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10)) * 0.35355362;
    fVar349 = *(float *)((undefined1 *)local_108._buffer + 8) * 0.19134216 -
              *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) * 0.46193984;
    fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) * 0.19134216 +
              *(float *)((undefined1 *)local_108._buffer + 8) * 0.46193984;
    fVar115 = *(float *)((undefined1 *)local_108._buffer + 0xc);
    fVar335 = *(float *)((undefined1 *)local_108._buffer + 4);
    fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4);
    fVar345 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc);
    fVar177 = fVar345 * 0.097545706 +
              fVar174 * 0.27778545 + fVar335 * 0.49039266 + fVar115 * 0.41573495;
    fVar197 = fVar345 * -0.27778545 +
              fVar174 * -0.49039266 + fVar335 * 0.41573495 + fVar115 * -0.097545706;
    fVar198 = fVar345 * 0.41573495 +
              fVar174 * 0.097545706 + fVar335 * 0.27778545 + fVar115 * -0.49039266;
    fVar174 = fVar345 * -0.49039266 +
              fVar174 * 0.41573495 + fVar335 * 0.097545706 + fVar115 * -0.27778545;
    fVar115 = fVar349 + fVar347;
    fVar335 = fVar176 + fVar175;
    fVar175 = fVar175 - fVar176;
    fVar347 = fVar347 - fVar349;
    auVar124._0_4_ = fVar177 + fVar335;
    auVar124._4_4_ = fVar197 + fVar115;
    auVar124._8_4_ = fVar198 + fVar347;
    auVar124._12_4_ = fVar174 + fVar175;
    auVar157._16_48_ = in_ZMM0._16_48_;
    auVar157._0_16_ = auVar124;
    *(undefined1 (*) [16])local_108._buffer = auVar124;
    *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) = fVar175 - fVar174;
    *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) = fVar347 - fVar198;
    *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) = fVar115 - fVar197;
    *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) = fVar335 - fVar177;
    for (lVar112 = -8; auVar156._16_48_ = auVar157._16_48_, lVar112 != 0; lVar112 = lVar112 + 1) {
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.19134216 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.46193984;
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.19134216 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.46193984;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4);
      auVar278._16_48_ = in_ZMM7._16_48_;
      fVar345 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4);
      fVar349 = fVar345 * 0.097545706 +
                fVar174 * 0.27778545 + fVar115 * 0.49039266 + fVar335 * 0.41573495;
      fVar177 = fVar345 * -0.27778545 +
                fVar174 * -0.49039266 + fVar115 * 0.41573495 + fVar335 * -0.097545706;
      fVar197 = fVar345 * 0.41573495 +
                fVar174 * 0.097545706 + fVar115 * 0.27778545 + fVar335 * -0.49039266;
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4);
      fVar335 = fVar345 * -0.49039266 +
                fVar174 * 0.41573495 + fVar115 * 0.097545706 + fVar335 * -0.27778545;
      auVar278._0_16_ = ZEXT416((uint)fVar175);
      in_ZMM7._4_60_ = auVar278._4_60_;
      fVar345 = (fVar175 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar175 = (fVar175 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar174 = fVar347 + fVar175;
      fVar175 = fVar175 - fVar347;
      auVar156._0_16_ = ZEXT416((uint)fVar176);
      auVar157._4_60_ = auVar156._4_60_;
      fVar115 = fVar176 + fVar345;
      fVar345 = fVar345 - fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4) =
           fVar349 + fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4) =
           fVar177 + fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) =
           fVar197 + fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4) =
           fVar335 + fVar345;
      in_ZMM7._0_4_ = fVar345 - fVar335;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4) =
           in_ZMM7._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4) =
           fVar175 - fVar197;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) =
           fVar174 - fVar177;
      auVar157._0_4_ = fVar115 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4) =
           auVar157._0_4_;
    }
    in_ZMM0._0_12_ = ZEXT812(0x3c23d70a);
    in_ZMM0._12_4_ = 0.0;
    in_ZMM0._16_48_ = auVar156._16_48_;
    compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,1e-06);
  }
  auVar159._0_8_ = Imf_3_2::CpuId::CpuId(local_5f);
  auVar159._8_56_ = extraout_var_08;
  if (local_5f[0] == (CpuId)0x1) {
    poVar106 = std::operator<<((ostream *)&std::cout,"      Inverse, SSE2: ");
    std::endl<char,std::char_traits<char>>(poVar106);
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"8x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      lVar112 = 0;
      while( true ) {
        auVar286 = in_ZMM7._16_48_;
        in_ZMM0._16_48_ = auVar159._16_48_;
        if (lVar112 == 0x40) break;
        auVar158._0_8_ = (double)Imath_3_2::erand48(local_e6);
        auVar158._8_56_ = extraout_var_09;
        auVar159._4_60_ = auVar158._4_60_;
        auVar159._0_4_ = (float)auVar158._0_8_;
        *(float *)((undefined1 *)local_108._buffer + lVar112 * 4) = auVar159._0_4_;
        local_f8._buffer[lVar112] = auVar159._0_4_;
        lVar112 = lVar112 + 1;
      }
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      fVar115 = *(float *)((undefined1 *)local_108._buffer + 4);
      fVar335 = *(float *)((undefined1 *)local_108._buffer + 8);
      fVar174 = *(float *)((undefined1 *)local_108._buffer + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc);
      fVar349 = *(float *)(undefined1 *)local_108._buffer * 0.3535536 + 0.0;
      fVar228 = (float)DAT_001a44b0;
      fVar229 = DAT_001a44b0._4_4_;
      fVar238 = DAT_001a44b0._8_4_;
      fVar239 = DAT_001a44b0._12_4_;
      in_ZMM7._16_48_ = auVar286;
      in_ZMM7._0_16_ = _DAT_001a44b0;
      fVar240 = (float)DAT_001a44c0;
      fVar241 = DAT_001a44c0._4_4_;
      fVar256 = DAT_001a44c0._8_4_;
      fVar257 = DAT_001a44c0._12_4_;
      fVar200 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar209 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar210 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar211 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar335 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      fVar345 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8);
      fVar349 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc);
      fVar258 = (float)DAT_001a44d0;
      fVar259 = DAT_001a44d0._4_4_;
      fVar264 = DAT_001a44d0._8_4_;
      fVar265 = DAT_001a44d0._12_4_;
      fVar266 = (float)DAT_001a44e0;
      fVar267 = DAT_001a44e0._4_4_;
      fVar283 = DAT_001a44e0._8_4_;
      fVar284 = DAT_001a44e0._12_4_;
      fVar285 = (float)DAT_001a44f0;
      fVar288 = DAT_001a44f0._4_4_;
      fVar312 = DAT_001a44f0._8_4_;
      fVar313 = DAT_001a44f0._12_4_;
      fVar177 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      fVar197 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4);
      fVar198 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8);
      fVar199 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc);
      fVar314 = (float)DAT_001a4500;
      fVar315 = DAT_001a4500._4_4_;
      fVar324 = DAT_001a4500._8_4_;
      fVar325 = DAT_001a4500._12_4_;
      fVar212 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar226 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar227 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)(undefined1 *)local_108._buffer = fVar200 + fVar212;
      *(float *)((undefined1 *)local_108._buffer + 4) = fVar209 + fVar226;
      *(float *)((undefined1 *)local_108._buffer + 8) = fVar210 + fVar227;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = fVar211 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) = fVar211 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) = fVar210 - fVar227;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) = fVar209 - fVar226;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) = fVar200 - fVar212;
      fVar115 = fVar335 * 0.3535536 + 0.0;
      fVar335 = fVar115 + fVar347 * 0.4619398 + fVar177 * fVar228 + fVar198 * fVar240;
      fVar174 = fVar115 + fVar347 * 0.1913422 + fVar177 * fVar229 + fVar198 * fVar241;
      fVar175 = fVar115 + fVar347 * -0.1913422 + fVar177 * fVar238 + fVar198 * fVar256;
      fVar115 = fVar115 + fVar347 * -0.4619398 + fVar177 * fVar239 + fVar198 * fVar257;
      fVar347 = fVar345 * fVar258 + 0.0 + fVar349 * fVar266 + fVar197 * fVar285 + fVar199 * fVar314;
      fVar176 = fVar345 * fVar259 + 0.0 + fVar349 * fVar267 + fVar197 * fVar288 + fVar199 * fVar315;
      fVar177 = fVar345 * fVar264 + 0.0 + fVar349 * fVar283 + fVar197 * fVar312 + fVar199 * fVar324;
      fVar345 = fVar345 * fVar265 + 0.0 + fVar349 * fVar284 + fVar197 * fVar313 + fVar199 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) = fVar335 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) = fVar174 + fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) = fVar175 + fVar177;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) = fVar115 + fVar345;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) = fVar115 - fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) = fVar175 - fVar177;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) = fVar174 - fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) = fVar335 - fVar347;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc);
      fVar349 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) * 0.3535536 + 0.0;
      fVar177 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar197 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar198 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar335 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar345 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar347 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar349 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) = fVar177 + fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) = fVar197 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) = fVar198 + fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) = fVar335 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) = fVar335 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) = fVar198 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) = fVar197 - fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) = fVar177 - fVar345;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc);
      fVar349 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) * 0.3535536 + 0.0;
      fVar177 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar197 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar198 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar335 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar345 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar347 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar349 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) = fVar177 + fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) = fVar197 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) = fVar198 + fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) = fVar335 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) = fVar335 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) = fVar198 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) = fVar197 - fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) = fVar177 - fVar345;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 8);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x90);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 0xc);
      fVar349 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x80) * 0.3535536 + 0.0;
      fVar177 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar197 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar198 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar335 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar345 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar347 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar349 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x80) = fVar177 + fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 4) = fVar197 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 8) = fVar198 + fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 0xc) = fVar335 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x90) = fVar335 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 4) = fVar198 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 8) = fVar197 - fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 0xc) = fVar177 - fVar345;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 8);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xb0);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 0xc);
      fVar349 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) * 0.3535536 + 0.0;
      fVar177 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar197 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar198 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar335 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar345 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar347 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar349 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) = fVar177 + fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 4) = fVar197 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 8) = fVar198 + fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 0xc) = fVar335 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) = fVar335 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 4) = fVar198 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 8) = fVar197 - fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 0xc) = fVar177 - fVar345;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 8);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xd0);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 0xc);
      fVar349 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) * 0.3535536 + 0.0;
      fVar177 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar197 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar198 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar335 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar345 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar347 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar349 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) = fVar177 + fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 4) = fVar197 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 8) = fVar198 + fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 0xc) = fVar335 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) = fVar335 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 4) = fVar198 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 8) = fVar197 - fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 0xc) = fVar177 - fVar345;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + 8);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xf0);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) + 0xc);
      fVar349 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) * 0.3535536 + 0.0;
      fVar177 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar197 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar198 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar335 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar345 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar347 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar349 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) = fVar177 + fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + 4) = fVar197 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + 8) = fVar198 + fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + 0xc) = fVar335 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) = fVar335 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) + 4) = fVar198 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) + 8) = fVar197 - fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) + 0xc) = fVar177 - fVar345;
      pauVar107 = (undefined1 (*) [16])local_108._buffer;
      for (lVar112 = 0; lVar112 != 2; lVar112 = lVar112 + 1) {
        for (lVar108 = 0; lVar108 != 0x80; lVar108 = lVar108 + 0x10) {
          uVar90 = *(undefined8 *)((long)(*pauVar107 + lVar108 * 2) + 8);
          *(undefined8 *)((long)&local_e0 + lVar108) = *(undefined8 *)(*pauVar107 + lVar108 * 2);
          *(undefined8 *)((long)&fStack_d8 + lVar108) = uVar90;
        }
        fVar175 = local_c0 * 0.1913422 - local_80 * 0.4619398;
        fVar347 = fStack_bc * 0.1913422 - fStack_7c * 0.4619398;
        fVar176 = fStack_b8 * 0.1913422 - fStack_78 * 0.4619398;
        fVar349 = fStack_b4 * 0.1913422 - fStack_74 * 0.4619398;
        fVar200 = local_80 * 0.1913422 + local_c0 * 0.4619398;
        fVar209 = fStack_7c * 0.1913422 + fStack_bc * 0.4619398;
        fVar210 = fStack_78 * 0.1913422 + fStack_b8 * 0.4619398;
        fVar211 = fStack_74 * 0.1913422 + fStack_b4 * 0.4619398;
        fVar177 = (float)DAT_001a4530;
        fVar197 = DAT_001a4530._4_4_;
        fVar198 = DAT_001a4530._8_4_;
        fVar199 = DAT_001a4530._12_4_;
        fVar229 = (float)DAT_001a4540;
        fVar238 = DAT_001a4540._4_4_;
        fVar239 = DAT_001a4540._8_4_;
        fVar240 = DAT_001a4540._12_4_;
        fVar241 = (float)DAT_001a4550;
        fVar256 = DAT_001a4550._4_4_;
        fVar257 = DAT_001a4550._8_4_;
        fVar258 = DAT_001a4550._12_4_;
        fVar259 = (float)DAT_001a4560;
        fVar264 = DAT_001a4560._4_4_;
        fVar265 = DAT_001a4560._8_4_;
        fVar266 = DAT_001a4560._12_4_;
        fVar115 = local_70 * fVar259 + local_90 * fVar241 + local_b0 * fVar229 + local_d0 * fVar177;
        fVar335 = fStack_6c * fVar264 + fStack_8c * fVar256 +
                  fStack_ac * fVar238 + fStack_cc * fVar197;
        fVar174 = fStack_68 * fVar265 + fStack_88 * fVar257 +
                  fStack_a8 * fVar239 + fStack_c8 * fVar198;
        fVar345 = fStack_64 * fVar266 + fStack_84 * fVar258 +
                  fStack_a4 * fVar240 + fStack_c4 * fVar199;
        fVar212 = (local_d0 * fVar229 - local_b0 * fVar259) -
                  (local_70 * fVar241 + local_90 * fVar177);
        fVar226 = (fStack_cc * fVar238 - fStack_ac * fVar264) -
                  (fStack_6c * fVar256 + fStack_8c * fVar197);
        fVar227 = (fStack_c8 * fVar239 - fStack_a8 * fVar265) -
                  (fStack_68 * fVar257 + fStack_88 * fVar198);
        fVar228 = (fStack_c4 * fVar240 - fStack_a4 * fVar266) -
                  (fStack_64 * fVar258 + fStack_84 * fVar199);
        in_ZMM7._0_4_ =
             local_70 * fVar229 + local_90 * fVar259 + (local_d0 * fVar241 - local_b0 * fVar177);
        in_ZMM7._4_4_ =
             fStack_6c * fVar238 + fStack_8c * fVar264 + (fStack_cc * fVar256 - fStack_ac * fVar197)
        ;
        in_ZMM7._8_4_ =
             fStack_68 * fVar239 + fStack_88 * fVar265 + (fStack_c8 * fVar257 - fStack_a8 * fVar198)
        ;
        in_ZMM7._12_4_ =
             fStack_64 * fVar240 + fStack_84 * fVar266 + (fStack_c4 * fVar258 - fStack_a4 * fVar199)
        ;
        fVar177 = (local_90 * fVar229 - local_70 * fVar177) +
                  (local_d0 * fVar259 - local_b0 * fVar241);
        fVar197 = (fStack_8c * fVar238 - fStack_6c * fVar197) +
                  (fStack_cc * fVar264 - fStack_ac * fVar256);
        fVar198 = (fStack_88 * fVar239 - fStack_68 * fVar198) +
                  (fStack_c8 * fVar265 - fStack_a8 * fVar257);
        fVar199 = (fStack_84 * fVar240 - fStack_64 * fVar199) +
                  (fStack_c4 * fVar266 - fStack_a4 * fVar258);
        fVar229 = (local_e0 + local_a0) * (float)DAT_001a4570;
        fVar238 = (fStack_dc + fStack_9c) * DAT_001a4570._4_4_;
        fVar239 = (fStack_d8 + fStack_98) * DAT_001a4570._8_4_;
        fVar240 = (fStack_d4 + fStack_94) * DAT_001a4570._12_4_;
        fVar241 = (local_e0 - local_a0) * (float)DAT_001a4570;
        fVar256 = (fStack_dc - fStack_9c) * DAT_001a4570._4_4_;
        fVar257 = (fStack_d8 - fStack_98) * DAT_001a4570._8_4_;
        fVar258 = (fStack_d4 - fStack_94) * DAT_001a4570._12_4_;
        fVar259 = fVar175 + fVar241;
        fVar264 = fVar347 + fVar256;
        fVar265 = fVar176 + fVar257;
        fVar266 = fVar349 + fVar258;
        fVar241 = fVar241 - fVar175;
        fVar256 = fVar256 - fVar347;
        fVar257 = fVar257 - fVar176;
        fVar258 = fVar258 - fVar349;
        fVar175 = fVar200 + fVar229;
        fVar347 = fVar209 + fVar238;
        fVar176 = fVar210 + fVar239;
        fVar349 = fVar211 + fVar240;
        fVar229 = fVar229 - fVar200;
        fVar238 = fVar238 - fVar209;
        fVar239 = fVar239 - fVar210;
        fVar240 = fVar240 - fVar211;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + lVar112 * 0x10);
        *(float *)*pauVar1 = fVar115 + fVar175;
        *(float *)(*pauVar1 + 4) = fVar335 + fVar347;
        *(float *)(*pauVar1 + 8) = fVar174 + fVar176;
        *(float *)(*pauVar1 + 0xc) = fVar345 + fVar349;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 2) * 0x10);
        *(float *)*pauVar1 = fVar212 + fVar259;
        *(float *)(*pauVar1 + 4) = fVar226 + fVar264;
        *(float *)(*pauVar1 + 8) = fVar227 + fVar265;
        *(float *)(*pauVar1 + 0xc) = fVar228 + fVar266;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 4) * 0x10);
        *(float *)*pauVar1 = in_ZMM7._0_4_ + fVar241;
        *(float *)(*pauVar1 + 4) = in_ZMM7._4_4_ + fVar256;
        *(float *)(*pauVar1 + 8) = in_ZMM7._8_4_ + fVar257;
        *(float *)(*pauVar1 + 0xc) = in_ZMM7._12_4_ + fVar258;
        auVar213._0_4_ = fVar177 + fVar229;
        auVar213._4_4_ = fVar197 + fVar238;
        auVar213._8_4_ = fVar198 + fVar239;
        auVar213._12_4_ = fVar199 + fVar240;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 6) * 0x10) = auVar213;
        auVar242._0_4_ = fVar229 - fVar177;
        auVar242._4_4_ = fVar238 - fVar197;
        auVar242._8_4_ = fVar239 - fVar198;
        auVar242._12_4_ = fVar240 - fVar199;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 8) * 0x10) = auVar242;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 10) * 0x10);
        *(float *)*pauVar1 = fVar241 - in_ZMM7._0_4_;
        *(float *)(*pauVar1 + 4) = fVar256 - in_ZMM7._4_4_;
        *(float *)(*pauVar1 + 8) = fVar257 - in_ZMM7._8_4_;
        *(float *)(*pauVar1 + 0xc) = fVar258 - in_ZMM7._12_4_;
        auVar289._0_4_ = fVar259 - fVar212;
        auVar289._4_4_ = fVar264 - fVar226;
        auVar289._8_4_ = fVar265 - fVar227;
        auVar289._12_4_ = fVar266 - fVar228;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xc) * 0x10) = auVar289;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar175 - fVar115;
        *(float *)(*pauVar1 + 4) = fVar347 - fVar335;
        *(float *)(*pauVar1 + 8) = fVar176 - fVar174;
        *(float *)(*pauVar1 + 0xc) = fVar349 - fVar345;
        pauVar107 = pauVar107 + 1;
      }
      auVar159._0_12_ = ZEXT812(0x3c23d70a);
      auVar159._12_4_ = 0;
      auVar159._16_48_ = in_ZMM0._16_48_;
      compareBufferRelative(&local_f8,&local_108,auVar159._0_4_,1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"7x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      uVar113 = 0;
      while( true ) {
        in_ZMM0._16_48_ = in_ZMM7._16_48_;
        if (uVar113 == 0x40) break;
        auVar159._0_16_ = ZEXT816(0);
        if (uVar113 < 0x38) {
          auVar160._0_8_ = (double)Imath_3_2::erand48(local_e6);
          auVar160._8_56_ = extraout_var_10;
          auVar159._4_60_ = auVar160._4_60_;
          auVar159._0_4_ = (float)auVar160._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = auVar159._0_4_;
        local_f8._buffer[uVar113] = auVar159._0_4_;
        uVar113 = uVar113 + 1;
      }
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      fVar115 = *(float *)((undefined1 *)local_108._buffer + 4);
      fVar335 = *(float *)((undefined1 *)local_108._buffer + 8);
      fVar174 = *(float *)((undefined1 *)local_108._buffer + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc);
      fVar349 = *(float *)(undefined1 *)local_108._buffer * 0.3535536 + 0.0;
      fVar228 = (float)DAT_001a44b0;
      fVar229 = DAT_001a44b0._4_4_;
      fVar238 = DAT_001a44b0._8_4_;
      fVar239 = DAT_001a44b0._12_4_;
      in_ZMM7._16_48_ = in_ZMM0._16_48_;
      in_ZMM7._0_16_ = _DAT_001a44b0;
      fVar240 = (float)DAT_001a44c0;
      fVar241 = DAT_001a44c0._4_4_;
      fVar256 = DAT_001a44c0._8_4_;
      fVar257 = DAT_001a44c0._12_4_;
      fVar200 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar209 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar210 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar211 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar335 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      fVar345 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8);
      fVar349 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc);
      fVar258 = (float)DAT_001a44d0;
      fVar259 = DAT_001a44d0._4_4_;
      fVar264 = DAT_001a44d0._8_4_;
      fVar265 = DAT_001a44d0._12_4_;
      fVar266 = (float)DAT_001a44e0;
      fVar267 = DAT_001a44e0._4_4_;
      fVar283 = DAT_001a44e0._8_4_;
      fVar284 = DAT_001a44e0._12_4_;
      fVar285 = (float)DAT_001a44f0;
      fVar288 = DAT_001a44f0._4_4_;
      fVar312 = DAT_001a44f0._8_4_;
      fVar313 = DAT_001a44f0._12_4_;
      fVar177 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      fVar197 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4);
      fVar198 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8);
      fVar199 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc);
      fVar314 = (float)DAT_001a4500;
      fVar315 = DAT_001a4500._4_4_;
      fVar324 = DAT_001a4500._8_4_;
      fVar325 = DAT_001a4500._12_4_;
      fVar212 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar226 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar227 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)(undefined1 *)local_108._buffer = fVar200 + fVar212;
      *(float *)((undefined1 *)local_108._buffer + 4) = fVar209 + fVar226;
      *(float *)((undefined1 *)local_108._buffer + 8) = fVar210 + fVar227;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = fVar211 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) = fVar211 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) = fVar210 - fVar227;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) = fVar209 - fVar226;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) = fVar200 - fVar212;
      fVar115 = fVar335 * 0.3535536 + 0.0;
      fVar335 = fVar115 + fVar347 * 0.4619398 + fVar177 * fVar228 + fVar198 * fVar240;
      fVar174 = fVar115 + fVar347 * 0.1913422 + fVar177 * fVar229 + fVar198 * fVar241;
      fVar175 = fVar115 + fVar347 * -0.1913422 + fVar177 * fVar238 + fVar198 * fVar256;
      fVar115 = fVar115 + fVar347 * -0.4619398 + fVar177 * fVar239 + fVar198 * fVar257;
      fVar347 = fVar345 * fVar258 + 0.0 + fVar349 * fVar266 + fVar197 * fVar285 + fVar199 * fVar314;
      fVar176 = fVar345 * fVar259 + 0.0 + fVar349 * fVar267 + fVar197 * fVar288 + fVar199 * fVar315;
      fVar177 = fVar345 * fVar264 + 0.0 + fVar349 * fVar283 + fVar197 * fVar312 + fVar199 * fVar324;
      fVar345 = fVar345 * fVar265 + 0.0 + fVar349 * fVar284 + fVar197 * fVar313 + fVar199 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) = fVar335 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) = fVar174 + fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) = fVar175 + fVar177;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) = fVar115 + fVar345;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) = fVar115 - fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) = fVar175 - fVar177;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) = fVar174 - fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) = fVar335 - fVar347;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc);
      fVar349 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) * 0.3535536 + 0.0;
      fVar177 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar197 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar198 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar335 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar345 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar347 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar349 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) = fVar177 + fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) = fVar197 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) = fVar198 + fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) = fVar335 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) = fVar335 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) = fVar198 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) = fVar197 - fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) = fVar177 - fVar345;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc);
      fVar349 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) * 0.3535536 + 0.0;
      fVar177 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar197 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar198 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar335 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar345 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar347 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar349 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) = fVar177 + fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) = fVar197 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) = fVar198 + fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) = fVar335 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) = fVar335 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) = fVar198 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) = fVar197 - fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) = fVar177 - fVar345;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 8);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x90);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 0xc);
      fVar349 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x80) * 0.3535536 + 0.0;
      fVar177 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar197 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar198 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar335 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar345 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar347 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar349 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x80) = fVar177 + fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 4) = fVar197 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 8) = fVar198 + fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 0xc) = fVar335 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x90) = fVar335 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 4) = fVar198 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 8) = fVar197 - fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 0xc) = fVar177 - fVar345;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 8);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xb0);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 0xc);
      fVar349 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) * 0.3535536 + 0.0;
      fVar177 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar197 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar198 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar335 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar345 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar347 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar349 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) = fVar177 + fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 4) = fVar197 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 8) = fVar198 + fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 0xc) = fVar335 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) = fVar335 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 4) = fVar198 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 8) = fVar197 - fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 0xc) = fVar177 - fVar345;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 8);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xd0);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 0xc);
      fVar349 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) * 0.3535536 + 0.0;
      fVar177 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar197 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar198 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar335 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar345 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar347 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar349 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) = fVar177 + fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 4) = fVar197 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 8) = fVar198 + fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 0xc) = fVar335 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) = fVar335 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 4) = fVar198 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 8) = fVar197 - fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 0xc) = fVar177 - fVar345;
      pauVar107 = (undefined1 (*) [16])local_108._buffer;
      for (lVar112 = 0; lVar112 != 2; lVar112 = lVar112 + 1) {
        for (lVar108 = 0; lVar108 != 0x80; lVar108 = lVar108 + 0x10) {
          uVar90 = *(undefined8 *)((long)(*pauVar107 + lVar108 * 2) + 8);
          *(undefined8 *)((long)&local_e0 + lVar108) = *(undefined8 *)(*pauVar107 + lVar108 * 2);
          *(undefined8 *)((long)&fStack_d8 + lVar108) = uVar90;
        }
        fVar175 = local_c0 * 0.1913422 - local_80 * 0.4619398;
        fVar347 = fStack_bc * 0.1913422 - fStack_7c * 0.4619398;
        fVar176 = fStack_b8 * 0.1913422 - fStack_78 * 0.4619398;
        fVar349 = fStack_b4 * 0.1913422 - fStack_74 * 0.4619398;
        fVar200 = local_80 * 0.1913422 + local_c0 * 0.4619398;
        fVar209 = fStack_7c * 0.1913422 + fStack_bc * 0.4619398;
        fVar210 = fStack_78 * 0.1913422 + fStack_b8 * 0.4619398;
        fVar211 = fStack_74 * 0.1913422 + fStack_b4 * 0.4619398;
        fVar177 = (float)DAT_001a4530;
        fVar197 = DAT_001a4530._4_4_;
        fVar198 = DAT_001a4530._8_4_;
        fVar199 = DAT_001a4530._12_4_;
        fVar229 = (float)DAT_001a4540;
        fVar238 = DAT_001a4540._4_4_;
        fVar239 = DAT_001a4540._8_4_;
        fVar240 = DAT_001a4540._12_4_;
        fVar241 = (float)DAT_001a4550;
        fVar256 = DAT_001a4550._4_4_;
        fVar257 = DAT_001a4550._8_4_;
        fVar258 = DAT_001a4550._12_4_;
        fVar259 = (float)DAT_001a4560;
        fVar264 = DAT_001a4560._4_4_;
        fVar265 = DAT_001a4560._8_4_;
        fVar266 = DAT_001a4560._12_4_;
        fVar115 = local_70 * fVar259 + local_90 * fVar241 + local_b0 * fVar229 + local_d0 * fVar177;
        fVar335 = fStack_6c * fVar264 + fStack_8c * fVar256 +
                  fStack_ac * fVar238 + fStack_cc * fVar197;
        fVar174 = fStack_68 * fVar265 + fStack_88 * fVar257 +
                  fStack_a8 * fVar239 + fStack_c8 * fVar198;
        fVar345 = fStack_64 * fVar266 + fStack_84 * fVar258 +
                  fStack_a4 * fVar240 + fStack_c4 * fVar199;
        fVar212 = (local_d0 * fVar229 - local_b0 * fVar259) -
                  (local_70 * fVar241 + local_90 * fVar177);
        fVar226 = (fStack_cc * fVar238 - fStack_ac * fVar264) -
                  (fStack_6c * fVar256 + fStack_8c * fVar197);
        fVar227 = (fStack_c8 * fVar239 - fStack_a8 * fVar265) -
                  (fStack_68 * fVar257 + fStack_88 * fVar198);
        fVar228 = (fStack_c4 * fVar240 - fStack_a4 * fVar266) -
                  (fStack_64 * fVar258 + fStack_84 * fVar199);
        in_ZMM7._0_4_ =
             local_70 * fVar229 + local_90 * fVar259 + (local_d0 * fVar241 - local_b0 * fVar177);
        in_ZMM7._4_4_ =
             fStack_6c * fVar238 + fStack_8c * fVar264 + (fStack_cc * fVar256 - fStack_ac * fVar197)
        ;
        in_ZMM7._8_4_ =
             fStack_68 * fVar239 + fStack_88 * fVar265 + (fStack_c8 * fVar257 - fStack_a8 * fVar198)
        ;
        in_ZMM7._12_4_ =
             fStack_64 * fVar240 + fStack_84 * fVar266 + (fStack_c4 * fVar258 - fStack_a4 * fVar199)
        ;
        fVar177 = (local_90 * fVar229 - local_70 * fVar177) +
                  (local_d0 * fVar259 - local_b0 * fVar241);
        fVar197 = (fStack_8c * fVar238 - fStack_6c * fVar197) +
                  (fStack_cc * fVar264 - fStack_ac * fVar256);
        fVar198 = (fStack_88 * fVar239 - fStack_68 * fVar198) +
                  (fStack_c8 * fVar265 - fStack_a8 * fVar257);
        fVar199 = (fStack_84 * fVar240 - fStack_64 * fVar199) +
                  (fStack_c4 * fVar266 - fStack_a4 * fVar258);
        fVar229 = (local_e0 + local_a0) * (float)DAT_001a4570;
        fVar238 = (fStack_dc + fStack_9c) * DAT_001a4570._4_4_;
        fVar239 = (fStack_d8 + fStack_98) * DAT_001a4570._8_4_;
        fVar240 = (fStack_d4 + fStack_94) * DAT_001a4570._12_4_;
        fVar241 = (local_e0 - local_a0) * (float)DAT_001a4570;
        fVar256 = (fStack_dc - fStack_9c) * DAT_001a4570._4_4_;
        fVar257 = (fStack_d8 - fStack_98) * DAT_001a4570._8_4_;
        fVar258 = (fStack_d4 - fStack_94) * DAT_001a4570._12_4_;
        fVar259 = fVar175 + fVar241;
        fVar264 = fVar347 + fVar256;
        fVar265 = fVar176 + fVar257;
        fVar266 = fVar349 + fVar258;
        fVar241 = fVar241 - fVar175;
        fVar256 = fVar256 - fVar347;
        fVar257 = fVar257 - fVar176;
        fVar258 = fVar258 - fVar349;
        fVar175 = fVar200 + fVar229;
        fVar347 = fVar209 + fVar238;
        fVar176 = fVar210 + fVar239;
        fVar349 = fVar211 + fVar240;
        fVar229 = fVar229 - fVar200;
        fVar238 = fVar238 - fVar209;
        fVar239 = fVar239 - fVar210;
        fVar240 = fVar240 - fVar211;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + lVar112 * 0x10);
        *(float *)*pauVar1 = fVar115 + fVar175;
        *(float *)(*pauVar1 + 4) = fVar335 + fVar347;
        *(float *)(*pauVar1 + 8) = fVar174 + fVar176;
        *(float *)(*pauVar1 + 0xc) = fVar345 + fVar349;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 2) * 0x10);
        *(float *)*pauVar1 = fVar212 + fVar259;
        *(float *)(*pauVar1 + 4) = fVar226 + fVar264;
        *(float *)(*pauVar1 + 8) = fVar227 + fVar265;
        *(float *)(*pauVar1 + 0xc) = fVar228 + fVar266;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 4) * 0x10);
        *(float *)*pauVar1 = in_ZMM7._0_4_ + fVar241;
        *(float *)(*pauVar1 + 4) = in_ZMM7._4_4_ + fVar256;
        *(float *)(*pauVar1 + 8) = in_ZMM7._8_4_ + fVar257;
        *(float *)(*pauVar1 + 0xc) = in_ZMM7._12_4_ + fVar258;
        auVar214._0_4_ = fVar177 + fVar229;
        auVar214._4_4_ = fVar197 + fVar238;
        auVar214._8_4_ = fVar198 + fVar239;
        auVar214._12_4_ = fVar199 + fVar240;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 6) * 0x10) = auVar214;
        auVar243._0_4_ = fVar229 - fVar177;
        auVar243._4_4_ = fVar238 - fVar197;
        auVar243._8_4_ = fVar239 - fVar198;
        auVar243._12_4_ = fVar240 - fVar199;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 8) * 0x10) = auVar243;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 10) * 0x10);
        *(float *)*pauVar1 = fVar241 - in_ZMM7._0_4_;
        *(float *)(*pauVar1 + 4) = fVar256 - in_ZMM7._4_4_;
        *(float *)(*pauVar1 + 8) = fVar257 - in_ZMM7._8_4_;
        *(float *)(*pauVar1 + 0xc) = fVar258 - in_ZMM7._12_4_;
        auVar290._0_4_ = fVar259 - fVar212;
        auVar290._4_4_ = fVar264 - fVar226;
        auVar290._8_4_ = fVar265 - fVar227;
        auVar290._12_4_ = fVar266 - fVar228;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xc) * 0x10) = auVar290;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar175 - fVar115;
        *(float *)(*pauVar1 + 4) = fVar347 - fVar335;
        *(float *)(*pauVar1 + 8) = fVar176 - fVar174;
        *(float *)(*pauVar1 + 0xc) = fVar349 - fVar345;
        pauVar107 = pauVar107 + 1;
      }
      auVar159._0_12_ = ZEXT812(0x3c23d70a);
      auVar159._12_4_ = 0;
      compareBufferRelative(&local_f8,&local_108,auVar159._0_4_,1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"6x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      uVar113 = 0;
      while( true ) {
        in_ZMM0._16_48_ = in_ZMM7._16_48_;
        if (uVar113 == 0x40) break;
        auVar159._0_16_ = ZEXT816(0);
        if (uVar113 < 0x30) {
          auVar161._0_8_ = (double)Imath_3_2::erand48(local_e6);
          auVar161._8_56_ = extraout_var_11;
          auVar159._4_60_ = auVar161._4_60_;
          auVar159._0_4_ = (float)auVar161._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = auVar159._0_4_;
        local_f8._buffer[uVar113] = auVar159._0_4_;
        uVar113 = uVar113 + 1;
      }
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      fVar115 = *(float *)((undefined1 *)local_108._buffer + 4);
      fVar335 = *(float *)((undefined1 *)local_108._buffer + 8);
      fVar174 = *(float *)((undefined1 *)local_108._buffer + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc);
      fVar349 = *(float *)(undefined1 *)local_108._buffer * 0.3535536 + 0.0;
      fVar228 = (float)DAT_001a44b0;
      fVar229 = DAT_001a44b0._4_4_;
      fVar238 = DAT_001a44b0._8_4_;
      fVar239 = DAT_001a44b0._12_4_;
      in_ZMM7._16_48_ = in_ZMM0._16_48_;
      in_ZMM7._0_16_ = _DAT_001a44b0;
      fVar240 = (float)DAT_001a44c0;
      fVar241 = DAT_001a44c0._4_4_;
      fVar256 = DAT_001a44c0._8_4_;
      fVar257 = DAT_001a44c0._12_4_;
      fVar200 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar209 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar210 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar211 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar335 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      fVar345 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8);
      fVar349 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc);
      fVar258 = (float)DAT_001a44d0;
      fVar259 = DAT_001a44d0._4_4_;
      fVar264 = DAT_001a44d0._8_4_;
      fVar265 = DAT_001a44d0._12_4_;
      fVar266 = (float)DAT_001a44e0;
      fVar267 = DAT_001a44e0._4_4_;
      fVar283 = DAT_001a44e0._8_4_;
      fVar284 = DAT_001a44e0._12_4_;
      fVar285 = (float)DAT_001a44f0;
      fVar288 = DAT_001a44f0._4_4_;
      fVar312 = DAT_001a44f0._8_4_;
      fVar313 = DAT_001a44f0._12_4_;
      fVar177 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      fVar197 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4);
      fVar198 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8);
      fVar199 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc);
      fVar314 = (float)DAT_001a4500;
      fVar315 = DAT_001a4500._4_4_;
      fVar324 = DAT_001a4500._8_4_;
      fVar325 = DAT_001a4500._12_4_;
      fVar212 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar226 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar227 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)(undefined1 *)local_108._buffer = fVar200 + fVar212;
      *(float *)((undefined1 *)local_108._buffer + 4) = fVar209 + fVar226;
      *(float *)((undefined1 *)local_108._buffer + 8) = fVar210 + fVar227;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = fVar211 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) = fVar211 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) = fVar210 - fVar227;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) = fVar209 - fVar226;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) = fVar200 - fVar212;
      fVar115 = fVar335 * 0.3535536 + 0.0;
      fVar335 = fVar115 + fVar347 * 0.4619398 + fVar177 * fVar228 + fVar198 * fVar240;
      fVar174 = fVar115 + fVar347 * 0.1913422 + fVar177 * fVar229 + fVar198 * fVar241;
      fVar175 = fVar115 + fVar347 * -0.1913422 + fVar177 * fVar238 + fVar198 * fVar256;
      fVar115 = fVar115 + fVar347 * -0.4619398 + fVar177 * fVar239 + fVar198 * fVar257;
      fVar347 = fVar345 * fVar258 + 0.0 + fVar349 * fVar266 + fVar197 * fVar285 + fVar199 * fVar314;
      fVar176 = fVar345 * fVar259 + 0.0 + fVar349 * fVar267 + fVar197 * fVar288 + fVar199 * fVar315;
      fVar177 = fVar345 * fVar264 + 0.0 + fVar349 * fVar283 + fVar197 * fVar312 + fVar199 * fVar324;
      fVar345 = fVar345 * fVar265 + 0.0 + fVar349 * fVar284 + fVar197 * fVar313 + fVar199 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) = fVar335 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) = fVar174 + fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) = fVar175 + fVar177;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) = fVar115 + fVar345;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) = fVar115 - fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) = fVar175 - fVar177;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) = fVar174 - fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) = fVar335 - fVar347;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc);
      fVar349 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) * 0.3535536 + 0.0;
      fVar177 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar197 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar198 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar335 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar345 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar347 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar349 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) = fVar177 + fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) = fVar197 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) = fVar198 + fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) = fVar335 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) = fVar335 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) = fVar198 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) = fVar197 - fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) = fVar177 - fVar345;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc);
      fVar349 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) * 0.3535536 + 0.0;
      fVar177 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar197 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar198 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar335 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar345 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar347 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar349 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) = fVar177 + fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) = fVar197 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) = fVar198 + fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) = fVar335 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) = fVar335 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) = fVar198 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) = fVar197 - fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) = fVar177 - fVar345;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 8);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x90);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 0xc);
      fVar349 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x80) * 0.3535536 + 0.0;
      fVar177 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar197 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar198 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar335 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar345 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar347 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar349 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x80) = fVar177 + fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 4) = fVar197 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 8) = fVar198 + fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 0xc) = fVar335 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x90) = fVar335 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 4) = fVar198 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 8) = fVar197 - fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 0xc) = fVar177 - fVar345;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 8);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xb0);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 0xc);
      fVar349 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) * 0.3535536 + 0.0;
      fVar177 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar197 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar198 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar335 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar345 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar347 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar349 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) = fVar177 + fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 4) = fVar197 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 8) = fVar198 + fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 0xc) = fVar335 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) = fVar335 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 4) = fVar198 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 8) = fVar197 - fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 0xc) = fVar177 - fVar345;
      pauVar107 = (undefined1 (*) [16])local_108._buffer;
      for (lVar112 = 0; lVar112 != 2; lVar112 = lVar112 + 1) {
        for (lVar108 = 0; lVar108 != 0x80; lVar108 = lVar108 + 0x10) {
          uVar90 = *(undefined8 *)((long)(*pauVar107 + lVar108 * 2) + 8);
          *(undefined8 *)((long)&local_e0 + lVar108) = *(undefined8 *)(*pauVar107 + lVar108 * 2);
          *(undefined8 *)((long)&fStack_d8 + lVar108) = uVar90;
        }
        fVar175 = local_c0 * 0.1913422 - local_80 * 0.4619398;
        fVar347 = fStack_bc * 0.1913422 - fStack_7c * 0.4619398;
        fVar176 = fStack_b8 * 0.1913422 - fStack_78 * 0.4619398;
        fVar349 = fStack_b4 * 0.1913422 - fStack_74 * 0.4619398;
        fVar200 = local_80 * 0.1913422 + local_c0 * 0.4619398;
        fVar209 = fStack_7c * 0.1913422 + fStack_bc * 0.4619398;
        fVar210 = fStack_78 * 0.1913422 + fStack_b8 * 0.4619398;
        fVar211 = fStack_74 * 0.1913422 + fStack_b4 * 0.4619398;
        fVar177 = (float)DAT_001a4530;
        fVar197 = DAT_001a4530._4_4_;
        fVar198 = DAT_001a4530._8_4_;
        fVar199 = DAT_001a4530._12_4_;
        fVar229 = (float)DAT_001a4540;
        fVar238 = DAT_001a4540._4_4_;
        fVar239 = DAT_001a4540._8_4_;
        fVar240 = DAT_001a4540._12_4_;
        fVar241 = (float)DAT_001a4550;
        fVar256 = DAT_001a4550._4_4_;
        fVar257 = DAT_001a4550._8_4_;
        fVar258 = DAT_001a4550._12_4_;
        fVar259 = (float)DAT_001a4560;
        fVar264 = DAT_001a4560._4_4_;
        fVar265 = DAT_001a4560._8_4_;
        fVar266 = DAT_001a4560._12_4_;
        fVar115 = local_70 * fVar259 + local_90 * fVar241 + local_b0 * fVar229 + local_d0 * fVar177;
        fVar335 = fStack_6c * fVar264 + fStack_8c * fVar256 +
                  fStack_ac * fVar238 + fStack_cc * fVar197;
        fVar174 = fStack_68 * fVar265 + fStack_88 * fVar257 +
                  fStack_a8 * fVar239 + fStack_c8 * fVar198;
        fVar345 = fStack_64 * fVar266 + fStack_84 * fVar258 +
                  fStack_a4 * fVar240 + fStack_c4 * fVar199;
        fVar212 = (local_d0 * fVar229 - local_b0 * fVar259) -
                  (local_70 * fVar241 + local_90 * fVar177);
        fVar226 = (fStack_cc * fVar238 - fStack_ac * fVar264) -
                  (fStack_6c * fVar256 + fStack_8c * fVar197);
        fVar227 = (fStack_c8 * fVar239 - fStack_a8 * fVar265) -
                  (fStack_68 * fVar257 + fStack_88 * fVar198);
        fVar228 = (fStack_c4 * fVar240 - fStack_a4 * fVar266) -
                  (fStack_64 * fVar258 + fStack_84 * fVar199);
        in_ZMM7._0_4_ =
             local_70 * fVar229 + local_90 * fVar259 + (local_d0 * fVar241 - local_b0 * fVar177);
        in_ZMM7._4_4_ =
             fStack_6c * fVar238 + fStack_8c * fVar264 + (fStack_cc * fVar256 - fStack_ac * fVar197)
        ;
        in_ZMM7._8_4_ =
             fStack_68 * fVar239 + fStack_88 * fVar265 + (fStack_c8 * fVar257 - fStack_a8 * fVar198)
        ;
        in_ZMM7._12_4_ =
             fStack_64 * fVar240 + fStack_84 * fVar266 + (fStack_c4 * fVar258 - fStack_a4 * fVar199)
        ;
        fVar177 = (local_90 * fVar229 - local_70 * fVar177) +
                  (local_d0 * fVar259 - local_b0 * fVar241);
        fVar197 = (fStack_8c * fVar238 - fStack_6c * fVar197) +
                  (fStack_cc * fVar264 - fStack_ac * fVar256);
        fVar198 = (fStack_88 * fVar239 - fStack_68 * fVar198) +
                  (fStack_c8 * fVar265 - fStack_a8 * fVar257);
        fVar199 = (fStack_84 * fVar240 - fStack_64 * fVar199) +
                  (fStack_c4 * fVar266 - fStack_a4 * fVar258);
        fVar229 = (local_e0 + local_a0) * (float)DAT_001a4570;
        fVar238 = (fStack_dc + fStack_9c) * DAT_001a4570._4_4_;
        fVar239 = (fStack_d8 + fStack_98) * DAT_001a4570._8_4_;
        fVar240 = (fStack_d4 + fStack_94) * DAT_001a4570._12_4_;
        fVar241 = (local_e0 - local_a0) * (float)DAT_001a4570;
        fVar256 = (fStack_dc - fStack_9c) * DAT_001a4570._4_4_;
        fVar257 = (fStack_d8 - fStack_98) * DAT_001a4570._8_4_;
        fVar258 = (fStack_d4 - fStack_94) * DAT_001a4570._12_4_;
        fVar259 = fVar175 + fVar241;
        fVar264 = fVar347 + fVar256;
        fVar265 = fVar176 + fVar257;
        fVar266 = fVar349 + fVar258;
        fVar241 = fVar241 - fVar175;
        fVar256 = fVar256 - fVar347;
        fVar257 = fVar257 - fVar176;
        fVar258 = fVar258 - fVar349;
        fVar175 = fVar200 + fVar229;
        fVar347 = fVar209 + fVar238;
        fVar176 = fVar210 + fVar239;
        fVar349 = fVar211 + fVar240;
        fVar229 = fVar229 - fVar200;
        fVar238 = fVar238 - fVar209;
        fVar239 = fVar239 - fVar210;
        fVar240 = fVar240 - fVar211;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + lVar112 * 0x10);
        *(float *)*pauVar1 = fVar115 + fVar175;
        *(float *)(*pauVar1 + 4) = fVar335 + fVar347;
        *(float *)(*pauVar1 + 8) = fVar174 + fVar176;
        *(float *)(*pauVar1 + 0xc) = fVar345 + fVar349;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 2) * 0x10);
        *(float *)*pauVar1 = fVar212 + fVar259;
        *(float *)(*pauVar1 + 4) = fVar226 + fVar264;
        *(float *)(*pauVar1 + 8) = fVar227 + fVar265;
        *(float *)(*pauVar1 + 0xc) = fVar228 + fVar266;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 4) * 0x10);
        *(float *)*pauVar1 = in_ZMM7._0_4_ + fVar241;
        *(float *)(*pauVar1 + 4) = in_ZMM7._4_4_ + fVar256;
        *(float *)(*pauVar1 + 8) = in_ZMM7._8_4_ + fVar257;
        *(float *)(*pauVar1 + 0xc) = in_ZMM7._12_4_ + fVar258;
        auVar215._0_4_ = fVar177 + fVar229;
        auVar215._4_4_ = fVar197 + fVar238;
        auVar215._8_4_ = fVar198 + fVar239;
        auVar215._12_4_ = fVar199 + fVar240;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 6) * 0x10) = auVar215;
        auVar244._0_4_ = fVar229 - fVar177;
        auVar244._4_4_ = fVar238 - fVar197;
        auVar244._8_4_ = fVar239 - fVar198;
        auVar244._12_4_ = fVar240 - fVar199;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 8) * 0x10) = auVar244;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 10) * 0x10);
        *(float *)*pauVar1 = fVar241 - in_ZMM7._0_4_;
        *(float *)(*pauVar1 + 4) = fVar256 - in_ZMM7._4_4_;
        *(float *)(*pauVar1 + 8) = fVar257 - in_ZMM7._8_4_;
        *(float *)(*pauVar1 + 0xc) = fVar258 - in_ZMM7._12_4_;
        auVar291._0_4_ = fVar259 - fVar212;
        auVar291._4_4_ = fVar264 - fVar226;
        auVar291._8_4_ = fVar265 - fVar227;
        auVar291._12_4_ = fVar266 - fVar228;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xc) * 0x10) = auVar291;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar175 - fVar115;
        *(float *)(*pauVar1 + 4) = fVar347 - fVar335;
        *(float *)(*pauVar1 + 8) = fVar176 - fVar174;
        *(float *)(*pauVar1 + 0xc) = fVar349 - fVar345;
        pauVar107 = pauVar107 + 1;
      }
      auVar159._0_12_ = ZEXT812(0x3c23d70a);
      auVar159._12_4_ = 0;
      compareBufferRelative(&local_f8,&local_108,auVar159._0_4_,1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"5x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      uVar113 = 0;
      while( true ) {
        in_ZMM0._16_48_ = in_ZMM7._16_48_;
        if (uVar113 == 0x40) break;
        auVar159._0_16_ = ZEXT816(0);
        if (uVar113 < 0x28) {
          auVar162._0_8_ = (double)Imath_3_2::erand48(local_e6);
          auVar162._8_56_ = extraout_var_12;
          auVar159._4_60_ = auVar162._4_60_;
          auVar159._0_4_ = (float)auVar162._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = auVar159._0_4_;
        local_f8._buffer[uVar113] = auVar159._0_4_;
        uVar113 = uVar113 + 1;
      }
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      fVar115 = *(float *)((undefined1 *)local_108._buffer + 4);
      fVar335 = *(float *)((undefined1 *)local_108._buffer + 8);
      fVar174 = *(float *)((undefined1 *)local_108._buffer + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc);
      fVar349 = *(float *)(undefined1 *)local_108._buffer * 0.3535536 + 0.0;
      fVar228 = (float)DAT_001a44b0;
      fVar229 = DAT_001a44b0._4_4_;
      fVar238 = DAT_001a44b0._8_4_;
      fVar239 = DAT_001a44b0._12_4_;
      in_ZMM7._16_48_ = in_ZMM0._16_48_;
      in_ZMM7._0_16_ = _DAT_001a44b0;
      fVar240 = (float)DAT_001a44c0;
      fVar241 = DAT_001a44c0._4_4_;
      fVar256 = DAT_001a44c0._8_4_;
      fVar257 = DAT_001a44c0._12_4_;
      fVar200 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar209 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar210 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar211 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar335 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      fVar345 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8);
      fVar349 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc);
      fVar258 = (float)DAT_001a44d0;
      fVar259 = DAT_001a44d0._4_4_;
      fVar264 = DAT_001a44d0._8_4_;
      fVar265 = DAT_001a44d0._12_4_;
      fVar266 = (float)DAT_001a44e0;
      fVar267 = DAT_001a44e0._4_4_;
      fVar283 = DAT_001a44e0._8_4_;
      fVar284 = DAT_001a44e0._12_4_;
      fVar285 = (float)DAT_001a44f0;
      fVar288 = DAT_001a44f0._4_4_;
      fVar312 = DAT_001a44f0._8_4_;
      fVar313 = DAT_001a44f0._12_4_;
      fVar177 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      fVar197 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4);
      fVar198 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8);
      fVar199 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc);
      fVar314 = (float)DAT_001a4500;
      fVar315 = DAT_001a4500._4_4_;
      fVar324 = DAT_001a4500._8_4_;
      fVar325 = DAT_001a4500._12_4_;
      fVar212 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar226 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar227 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)(undefined1 *)local_108._buffer = fVar200 + fVar212;
      *(float *)((undefined1 *)local_108._buffer + 4) = fVar209 + fVar226;
      *(float *)((undefined1 *)local_108._buffer + 8) = fVar210 + fVar227;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = fVar211 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) = fVar211 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) = fVar210 - fVar227;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) = fVar209 - fVar226;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) = fVar200 - fVar212;
      fVar115 = fVar335 * 0.3535536 + 0.0;
      fVar335 = fVar115 + fVar347 * 0.4619398 + fVar177 * fVar228 + fVar198 * fVar240;
      fVar174 = fVar115 + fVar347 * 0.1913422 + fVar177 * fVar229 + fVar198 * fVar241;
      fVar175 = fVar115 + fVar347 * -0.1913422 + fVar177 * fVar238 + fVar198 * fVar256;
      fVar115 = fVar115 + fVar347 * -0.4619398 + fVar177 * fVar239 + fVar198 * fVar257;
      fVar347 = fVar345 * fVar258 + 0.0 + fVar349 * fVar266 + fVar197 * fVar285 + fVar199 * fVar314;
      fVar176 = fVar345 * fVar259 + 0.0 + fVar349 * fVar267 + fVar197 * fVar288 + fVar199 * fVar315;
      fVar177 = fVar345 * fVar264 + 0.0 + fVar349 * fVar283 + fVar197 * fVar312 + fVar199 * fVar324;
      fVar345 = fVar345 * fVar265 + 0.0 + fVar349 * fVar284 + fVar197 * fVar313 + fVar199 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) = fVar335 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) = fVar174 + fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) = fVar175 + fVar177;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) = fVar115 + fVar345;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) = fVar115 - fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) = fVar175 - fVar177;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) = fVar174 - fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) = fVar335 - fVar347;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc);
      fVar349 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) * 0.3535536 + 0.0;
      fVar177 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar197 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar198 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar335 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar345 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar347 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar349 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) = fVar177 + fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) = fVar197 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) = fVar198 + fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) = fVar335 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) = fVar335 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) = fVar198 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) = fVar197 - fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) = fVar177 - fVar345;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc);
      fVar349 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) * 0.3535536 + 0.0;
      fVar177 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar197 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar198 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar335 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar345 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar347 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar349 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) = fVar177 + fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) = fVar197 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) = fVar198 + fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) = fVar335 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) = fVar335 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) = fVar198 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) = fVar197 - fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) = fVar177 - fVar345;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 8);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x90);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 0xc);
      fVar349 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x80) * 0.3535536 + 0.0;
      fVar177 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar197 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar198 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar335 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar345 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar347 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar349 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x80) = fVar177 + fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 4) = fVar197 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 8) = fVar198 + fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 0xc) = fVar335 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x90) = fVar335 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 4) = fVar198 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 8) = fVar197 - fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 0xc) = fVar177 - fVar345;
      pauVar107 = (undefined1 (*) [16])local_108._buffer;
      for (lVar112 = 0; lVar112 != 2; lVar112 = lVar112 + 1) {
        for (lVar108 = 0; lVar108 != 0x80; lVar108 = lVar108 + 0x10) {
          uVar90 = *(undefined8 *)((long)(*pauVar107 + lVar108 * 2) + 8);
          *(undefined8 *)((long)&local_e0 + lVar108) = *(undefined8 *)(*pauVar107 + lVar108 * 2);
          *(undefined8 *)((long)&fStack_d8 + lVar108) = uVar90;
        }
        fVar175 = local_c0 * 0.1913422 - local_80 * 0.4619398;
        fVar347 = fStack_bc * 0.1913422 - fStack_7c * 0.4619398;
        fVar176 = fStack_b8 * 0.1913422 - fStack_78 * 0.4619398;
        fVar349 = fStack_b4 * 0.1913422 - fStack_74 * 0.4619398;
        fVar200 = local_80 * 0.1913422 + local_c0 * 0.4619398;
        fVar209 = fStack_7c * 0.1913422 + fStack_bc * 0.4619398;
        fVar210 = fStack_78 * 0.1913422 + fStack_b8 * 0.4619398;
        fVar211 = fStack_74 * 0.1913422 + fStack_b4 * 0.4619398;
        fVar177 = (float)DAT_001a4530;
        fVar197 = DAT_001a4530._4_4_;
        fVar198 = DAT_001a4530._8_4_;
        fVar199 = DAT_001a4530._12_4_;
        fVar229 = (float)DAT_001a4540;
        fVar238 = DAT_001a4540._4_4_;
        fVar239 = DAT_001a4540._8_4_;
        fVar240 = DAT_001a4540._12_4_;
        fVar241 = (float)DAT_001a4550;
        fVar256 = DAT_001a4550._4_4_;
        fVar257 = DAT_001a4550._8_4_;
        fVar258 = DAT_001a4550._12_4_;
        fVar259 = (float)DAT_001a4560;
        fVar264 = DAT_001a4560._4_4_;
        fVar265 = DAT_001a4560._8_4_;
        fVar266 = DAT_001a4560._12_4_;
        fVar115 = local_70 * fVar259 + local_90 * fVar241 + local_b0 * fVar229 + local_d0 * fVar177;
        fVar335 = fStack_6c * fVar264 + fStack_8c * fVar256 +
                  fStack_ac * fVar238 + fStack_cc * fVar197;
        fVar174 = fStack_68 * fVar265 + fStack_88 * fVar257 +
                  fStack_a8 * fVar239 + fStack_c8 * fVar198;
        fVar345 = fStack_64 * fVar266 + fStack_84 * fVar258 +
                  fStack_a4 * fVar240 + fStack_c4 * fVar199;
        fVar212 = (local_d0 * fVar229 - local_b0 * fVar259) -
                  (local_70 * fVar241 + local_90 * fVar177);
        fVar226 = (fStack_cc * fVar238 - fStack_ac * fVar264) -
                  (fStack_6c * fVar256 + fStack_8c * fVar197);
        fVar227 = (fStack_c8 * fVar239 - fStack_a8 * fVar265) -
                  (fStack_68 * fVar257 + fStack_88 * fVar198);
        fVar228 = (fStack_c4 * fVar240 - fStack_a4 * fVar266) -
                  (fStack_64 * fVar258 + fStack_84 * fVar199);
        in_ZMM7._0_4_ =
             local_70 * fVar229 + local_90 * fVar259 + (local_d0 * fVar241 - local_b0 * fVar177);
        in_ZMM7._4_4_ =
             fStack_6c * fVar238 + fStack_8c * fVar264 + (fStack_cc * fVar256 - fStack_ac * fVar197)
        ;
        in_ZMM7._8_4_ =
             fStack_68 * fVar239 + fStack_88 * fVar265 + (fStack_c8 * fVar257 - fStack_a8 * fVar198)
        ;
        in_ZMM7._12_4_ =
             fStack_64 * fVar240 + fStack_84 * fVar266 + (fStack_c4 * fVar258 - fStack_a4 * fVar199)
        ;
        fVar177 = (local_90 * fVar229 - local_70 * fVar177) +
                  (local_d0 * fVar259 - local_b0 * fVar241);
        fVar197 = (fStack_8c * fVar238 - fStack_6c * fVar197) +
                  (fStack_cc * fVar264 - fStack_ac * fVar256);
        fVar198 = (fStack_88 * fVar239 - fStack_68 * fVar198) +
                  (fStack_c8 * fVar265 - fStack_a8 * fVar257);
        fVar199 = (fStack_84 * fVar240 - fStack_64 * fVar199) +
                  (fStack_c4 * fVar266 - fStack_a4 * fVar258);
        fVar229 = (local_e0 + local_a0) * (float)DAT_001a4570;
        fVar238 = (fStack_dc + fStack_9c) * DAT_001a4570._4_4_;
        fVar239 = (fStack_d8 + fStack_98) * DAT_001a4570._8_4_;
        fVar240 = (fStack_d4 + fStack_94) * DAT_001a4570._12_4_;
        fVar241 = (local_e0 - local_a0) * (float)DAT_001a4570;
        fVar256 = (fStack_dc - fStack_9c) * DAT_001a4570._4_4_;
        fVar257 = (fStack_d8 - fStack_98) * DAT_001a4570._8_4_;
        fVar258 = (fStack_d4 - fStack_94) * DAT_001a4570._12_4_;
        fVar259 = fVar175 + fVar241;
        fVar264 = fVar347 + fVar256;
        fVar265 = fVar176 + fVar257;
        fVar266 = fVar349 + fVar258;
        fVar241 = fVar241 - fVar175;
        fVar256 = fVar256 - fVar347;
        fVar257 = fVar257 - fVar176;
        fVar258 = fVar258 - fVar349;
        fVar175 = fVar200 + fVar229;
        fVar347 = fVar209 + fVar238;
        fVar176 = fVar210 + fVar239;
        fVar349 = fVar211 + fVar240;
        fVar229 = fVar229 - fVar200;
        fVar238 = fVar238 - fVar209;
        fVar239 = fVar239 - fVar210;
        fVar240 = fVar240 - fVar211;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + lVar112 * 0x10);
        *(float *)*pauVar1 = fVar115 + fVar175;
        *(float *)(*pauVar1 + 4) = fVar335 + fVar347;
        *(float *)(*pauVar1 + 8) = fVar174 + fVar176;
        *(float *)(*pauVar1 + 0xc) = fVar345 + fVar349;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 2) * 0x10);
        *(float *)*pauVar1 = fVar212 + fVar259;
        *(float *)(*pauVar1 + 4) = fVar226 + fVar264;
        *(float *)(*pauVar1 + 8) = fVar227 + fVar265;
        *(float *)(*pauVar1 + 0xc) = fVar228 + fVar266;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 4) * 0x10);
        *(float *)*pauVar1 = in_ZMM7._0_4_ + fVar241;
        *(float *)(*pauVar1 + 4) = in_ZMM7._4_4_ + fVar256;
        *(float *)(*pauVar1 + 8) = in_ZMM7._8_4_ + fVar257;
        *(float *)(*pauVar1 + 0xc) = in_ZMM7._12_4_ + fVar258;
        auVar216._0_4_ = fVar177 + fVar229;
        auVar216._4_4_ = fVar197 + fVar238;
        auVar216._8_4_ = fVar198 + fVar239;
        auVar216._12_4_ = fVar199 + fVar240;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 6) * 0x10) = auVar216;
        auVar245._0_4_ = fVar229 - fVar177;
        auVar245._4_4_ = fVar238 - fVar197;
        auVar245._8_4_ = fVar239 - fVar198;
        auVar245._12_4_ = fVar240 - fVar199;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 8) * 0x10) = auVar245;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 10) * 0x10);
        *(float *)*pauVar1 = fVar241 - in_ZMM7._0_4_;
        *(float *)(*pauVar1 + 4) = fVar256 - in_ZMM7._4_4_;
        *(float *)(*pauVar1 + 8) = fVar257 - in_ZMM7._8_4_;
        *(float *)(*pauVar1 + 0xc) = fVar258 - in_ZMM7._12_4_;
        auVar292._0_4_ = fVar259 - fVar212;
        auVar292._4_4_ = fVar264 - fVar226;
        auVar292._8_4_ = fVar265 - fVar227;
        auVar292._12_4_ = fVar266 - fVar228;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xc) * 0x10) = auVar292;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar175 - fVar115;
        *(float *)(*pauVar1 + 4) = fVar347 - fVar335;
        *(float *)(*pauVar1 + 8) = fVar176 - fVar174;
        *(float *)(*pauVar1 + 0xc) = fVar349 - fVar345;
        pauVar107 = pauVar107 + 1;
      }
      auVar159._0_12_ = ZEXT812(0x3c23d70a);
      auVar159._12_4_ = 0;
      compareBufferRelative(&local_f8,&local_108,auVar159._0_4_,1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"4x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      uVar113 = 0;
      while( true ) {
        in_ZMM0._16_48_ = in_ZMM7._16_48_;
        if (uVar113 == 0x40) break;
        auVar159._0_16_ = ZEXT816(0);
        if (uVar113 < 0x20) {
          auVar163._0_8_ = (double)Imath_3_2::erand48(local_e6);
          auVar163._8_56_ = extraout_var_13;
          auVar159._4_60_ = auVar163._4_60_;
          auVar159._0_4_ = (float)auVar163._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = auVar159._0_4_;
        local_f8._buffer[uVar113] = auVar159._0_4_;
        uVar113 = uVar113 + 1;
      }
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      fVar115 = *(float *)((undefined1 *)local_108._buffer + 4);
      fVar335 = *(float *)((undefined1 *)local_108._buffer + 8);
      fVar174 = *(float *)((undefined1 *)local_108._buffer + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc);
      fVar349 = *(float *)(undefined1 *)local_108._buffer * 0.3535536 + 0.0;
      fVar228 = (float)DAT_001a44b0;
      fVar229 = DAT_001a44b0._4_4_;
      fVar238 = DAT_001a44b0._8_4_;
      fVar239 = DAT_001a44b0._12_4_;
      in_ZMM7._16_48_ = in_ZMM0._16_48_;
      in_ZMM7._0_16_ = _DAT_001a44b0;
      fVar240 = (float)DAT_001a44c0;
      fVar241 = DAT_001a44c0._4_4_;
      fVar256 = DAT_001a44c0._8_4_;
      fVar257 = DAT_001a44c0._12_4_;
      fVar200 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar209 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar210 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar211 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar335 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      fVar345 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8);
      fVar349 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc);
      fVar258 = (float)DAT_001a44d0;
      fVar259 = DAT_001a44d0._4_4_;
      fVar264 = DAT_001a44d0._8_4_;
      fVar265 = DAT_001a44d0._12_4_;
      fVar266 = (float)DAT_001a44e0;
      fVar267 = DAT_001a44e0._4_4_;
      fVar283 = DAT_001a44e0._8_4_;
      fVar284 = DAT_001a44e0._12_4_;
      fVar285 = (float)DAT_001a44f0;
      fVar288 = DAT_001a44f0._4_4_;
      fVar312 = DAT_001a44f0._8_4_;
      fVar313 = DAT_001a44f0._12_4_;
      fVar177 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      fVar197 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4);
      fVar198 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8);
      fVar199 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc);
      fVar314 = (float)DAT_001a4500;
      fVar315 = DAT_001a4500._4_4_;
      fVar324 = DAT_001a4500._8_4_;
      fVar325 = DAT_001a4500._12_4_;
      fVar212 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar226 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar227 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)(undefined1 *)local_108._buffer = fVar200 + fVar212;
      *(float *)((undefined1 *)local_108._buffer + 4) = fVar209 + fVar226;
      *(float *)((undefined1 *)local_108._buffer + 8) = fVar210 + fVar227;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = fVar211 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) = fVar211 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) = fVar210 - fVar227;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) = fVar209 - fVar226;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) = fVar200 - fVar212;
      fVar115 = fVar335 * 0.3535536 + 0.0;
      fVar335 = fVar115 + fVar347 * 0.4619398 + fVar177 * fVar228 + fVar198 * fVar240;
      fVar174 = fVar115 + fVar347 * 0.1913422 + fVar177 * fVar229 + fVar198 * fVar241;
      fVar175 = fVar115 + fVar347 * -0.1913422 + fVar177 * fVar238 + fVar198 * fVar256;
      fVar115 = fVar115 + fVar347 * -0.4619398 + fVar177 * fVar239 + fVar198 * fVar257;
      fVar347 = fVar345 * fVar258 + 0.0 + fVar349 * fVar266 + fVar197 * fVar285 + fVar199 * fVar314;
      fVar176 = fVar345 * fVar259 + 0.0 + fVar349 * fVar267 + fVar197 * fVar288 + fVar199 * fVar315;
      fVar177 = fVar345 * fVar264 + 0.0 + fVar349 * fVar283 + fVar197 * fVar312 + fVar199 * fVar324;
      fVar345 = fVar345 * fVar265 + 0.0 + fVar349 * fVar284 + fVar197 * fVar313 + fVar199 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) = fVar335 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) = fVar174 + fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) = fVar175 + fVar177;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) = fVar115 + fVar345;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) = fVar115 - fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) = fVar175 - fVar177;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) = fVar174 - fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) = fVar335 - fVar347;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc);
      fVar349 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) * 0.3535536 + 0.0;
      fVar177 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar197 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar198 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar335 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar345 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar347 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar349 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) = fVar177 + fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) = fVar197 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) = fVar198 + fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) = fVar335 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) = fVar335 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) = fVar198 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) = fVar197 - fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) = fVar177 - fVar345;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc);
      fVar349 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) * 0.3535536 + 0.0;
      fVar177 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar197 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar198 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar335 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar345 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar347 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar349 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) = fVar177 + fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) = fVar197 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) = fVar198 + fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) = fVar335 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) = fVar335 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) = fVar198 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) = fVar197 - fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) = fVar177 - fVar345;
      pauVar107 = (undefined1 (*) [16])local_108._buffer;
      for (lVar112 = 0; lVar112 != 2; lVar112 = lVar112 + 1) {
        for (lVar108 = 0; lVar108 != 0x80; lVar108 = lVar108 + 0x10) {
          uVar90 = *(undefined8 *)((long)(*pauVar107 + lVar108 * 2) + 8);
          *(undefined8 *)((long)&local_e0 + lVar108) = *(undefined8 *)(*pauVar107 + lVar108 * 2);
          *(undefined8 *)((long)&fStack_d8 + lVar108) = uVar90;
        }
        fVar175 = local_c0 * 0.1913422 - local_80 * 0.4619398;
        fVar347 = fStack_bc * 0.1913422 - fStack_7c * 0.4619398;
        fVar176 = fStack_b8 * 0.1913422 - fStack_78 * 0.4619398;
        fVar349 = fStack_b4 * 0.1913422 - fStack_74 * 0.4619398;
        fVar200 = local_80 * 0.1913422 + local_c0 * 0.4619398;
        fVar209 = fStack_7c * 0.1913422 + fStack_bc * 0.4619398;
        fVar210 = fStack_78 * 0.1913422 + fStack_b8 * 0.4619398;
        fVar211 = fStack_74 * 0.1913422 + fStack_b4 * 0.4619398;
        fVar177 = (float)DAT_001a4530;
        fVar197 = DAT_001a4530._4_4_;
        fVar198 = DAT_001a4530._8_4_;
        fVar199 = DAT_001a4530._12_4_;
        fVar229 = (float)DAT_001a4540;
        fVar238 = DAT_001a4540._4_4_;
        fVar239 = DAT_001a4540._8_4_;
        fVar240 = DAT_001a4540._12_4_;
        fVar241 = (float)DAT_001a4550;
        fVar256 = DAT_001a4550._4_4_;
        fVar257 = DAT_001a4550._8_4_;
        fVar258 = DAT_001a4550._12_4_;
        fVar259 = (float)DAT_001a4560;
        fVar264 = DAT_001a4560._4_4_;
        fVar265 = DAT_001a4560._8_4_;
        fVar266 = DAT_001a4560._12_4_;
        fVar115 = local_70 * fVar259 + local_90 * fVar241 + local_b0 * fVar229 + local_d0 * fVar177;
        fVar335 = fStack_6c * fVar264 + fStack_8c * fVar256 +
                  fStack_ac * fVar238 + fStack_cc * fVar197;
        fVar174 = fStack_68 * fVar265 + fStack_88 * fVar257 +
                  fStack_a8 * fVar239 + fStack_c8 * fVar198;
        fVar345 = fStack_64 * fVar266 + fStack_84 * fVar258 +
                  fStack_a4 * fVar240 + fStack_c4 * fVar199;
        fVar212 = (local_d0 * fVar229 - local_b0 * fVar259) -
                  (local_70 * fVar241 + local_90 * fVar177);
        fVar226 = (fStack_cc * fVar238 - fStack_ac * fVar264) -
                  (fStack_6c * fVar256 + fStack_8c * fVar197);
        fVar227 = (fStack_c8 * fVar239 - fStack_a8 * fVar265) -
                  (fStack_68 * fVar257 + fStack_88 * fVar198);
        fVar228 = (fStack_c4 * fVar240 - fStack_a4 * fVar266) -
                  (fStack_64 * fVar258 + fStack_84 * fVar199);
        in_ZMM7._0_4_ =
             local_70 * fVar229 + local_90 * fVar259 + (local_d0 * fVar241 - local_b0 * fVar177);
        in_ZMM7._4_4_ =
             fStack_6c * fVar238 + fStack_8c * fVar264 + (fStack_cc * fVar256 - fStack_ac * fVar197)
        ;
        in_ZMM7._8_4_ =
             fStack_68 * fVar239 + fStack_88 * fVar265 + (fStack_c8 * fVar257 - fStack_a8 * fVar198)
        ;
        in_ZMM7._12_4_ =
             fStack_64 * fVar240 + fStack_84 * fVar266 + (fStack_c4 * fVar258 - fStack_a4 * fVar199)
        ;
        fVar177 = (local_90 * fVar229 - local_70 * fVar177) +
                  (local_d0 * fVar259 - local_b0 * fVar241);
        fVar197 = (fStack_8c * fVar238 - fStack_6c * fVar197) +
                  (fStack_cc * fVar264 - fStack_ac * fVar256);
        fVar198 = (fStack_88 * fVar239 - fStack_68 * fVar198) +
                  (fStack_c8 * fVar265 - fStack_a8 * fVar257);
        fVar199 = (fStack_84 * fVar240 - fStack_64 * fVar199) +
                  (fStack_c4 * fVar266 - fStack_a4 * fVar258);
        fVar229 = (local_e0 + local_a0) * (float)DAT_001a4570;
        fVar238 = (fStack_dc + fStack_9c) * DAT_001a4570._4_4_;
        fVar239 = (fStack_d8 + fStack_98) * DAT_001a4570._8_4_;
        fVar240 = (fStack_d4 + fStack_94) * DAT_001a4570._12_4_;
        fVar241 = (local_e0 - local_a0) * (float)DAT_001a4570;
        fVar256 = (fStack_dc - fStack_9c) * DAT_001a4570._4_4_;
        fVar257 = (fStack_d8 - fStack_98) * DAT_001a4570._8_4_;
        fVar258 = (fStack_d4 - fStack_94) * DAT_001a4570._12_4_;
        fVar259 = fVar175 + fVar241;
        fVar264 = fVar347 + fVar256;
        fVar265 = fVar176 + fVar257;
        fVar266 = fVar349 + fVar258;
        fVar241 = fVar241 - fVar175;
        fVar256 = fVar256 - fVar347;
        fVar257 = fVar257 - fVar176;
        fVar258 = fVar258 - fVar349;
        fVar175 = fVar200 + fVar229;
        fVar347 = fVar209 + fVar238;
        fVar176 = fVar210 + fVar239;
        fVar349 = fVar211 + fVar240;
        fVar229 = fVar229 - fVar200;
        fVar238 = fVar238 - fVar209;
        fVar239 = fVar239 - fVar210;
        fVar240 = fVar240 - fVar211;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + lVar112 * 0x10);
        *(float *)*pauVar1 = fVar115 + fVar175;
        *(float *)(*pauVar1 + 4) = fVar335 + fVar347;
        *(float *)(*pauVar1 + 8) = fVar174 + fVar176;
        *(float *)(*pauVar1 + 0xc) = fVar345 + fVar349;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 2) * 0x10);
        *(float *)*pauVar1 = fVar212 + fVar259;
        *(float *)(*pauVar1 + 4) = fVar226 + fVar264;
        *(float *)(*pauVar1 + 8) = fVar227 + fVar265;
        *(float *)(*pauVar1 + 0xc) = fVar228 + fVar266;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 4) * 0x10);
        *(float *)*pauVar1 = in_ZMM7._0_4_ + fVar241;
        *(float *)(*pauVar1 + 4) = in_ZMM7._4_4_ + fVar256;
        *(float *)(*pauVar1 + 8) = in_ZMM7._8_4_ + fVar257;
        *(float *)(*pauVar1 + 0xc) = in_ZMM7._12_4_ + fVar258;
        auVar217._0_4_ = fVar177 + fVar229;
        auVar217._4_4_ = fVar197 + fVar238;
        auVar217._8_4_ = fVar198 + fVar239;
        auVar217._12_4_ = fVar199 + fVar240;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 6) * 0x10) = auVar217;
        auVar246._0_4_ = fVar229 - fVar177;
        auVar246._4_4_ = fVar238 - fVar197;
        auVar246._8_4_ = fVar239 - fVar198;
        auVar246._12_4_ = fVar240 - fVar199;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 8) * 0x10) = auVar246;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 10) * 0x10);
        *(float *)*pauVar1 = fVar241 - in_ZMM7._0_4_;
        *(float *)(*pauVar1 + 4) = fVar256 - in_ZMM7._4_4_;
        *(float *)(*pauVar1 + 8) = fVar257 - in_ZMM7._8_4_;
        *(float *)(*pauVar1 + 0xc) = fVar258 - in_ZMM7._12_4_;
        auVar293._0_4_ = fVar259 - fVar212;
        auVar293._4_4_ = fVar264 - fVar226;
        auVar293._8_4_ = fVar265 - fVar227;
        auVar293._12_4_ = fVar266 - fVar228;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xc) * 0x10) = auVar293;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar175 - fVar115;
        *(float *)(*pauVar1 + 4) = fVar347 - fVar335;
        *(float *)(*pauVar1 + 8) = fVar176 - fVar174;
        *(float *)(*pauVar1 + 0xc) = fVar349 - fVar345;
        pauVar107 = pauVar107 + 1;
      }
      auVar159._0_12_ = ZEXT812(0x3c23d70a);
      auVar159._12_4_ = 0;
      compareBufferRelative(&local_f8,&local_108,auVar159._0_4_,1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"3x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      uVar113 = 0;
      while( true ) {
        in_ZMM0._16_48_ = in_ZMM7._16_48_;
        if (uVar113 == 0x40) break;
        auVar159._0_16_ = ZEXT816(0);
        if (uVar113 < 0x18) {
          auVar164._0_8_ = (double)Imath_3_2::erand48(local_e6);
          auVar164._8_56_ = extraout_var_14;
          auVar159._4_60_ = auVar164._4_60_;
          auVar159._0_4_ = (float)auVar164._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = auVar159._0_4_;
        local_f8._buffer[uVar113] = auVar159._0_4_;
        uVar113 = uVar113 + 1;
      }
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      fVar115 = *(float *)((undefined1 *)local_108._buffer + 4);
      fVar335 = *(float *)((undefined1 *)local_108._buffer + 8);
      fVar174 = *(float *)((undefined1 *)local_108._buffer + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc);
      fVar349 = *(float *)(undefined1 *)local_108._buffer * 0.3535536 + 0.0;
      fVar228 = (float)DAT_001a44b0;
      fVar229 = DAT_001a44b0._4_4_;
      fVar238 = DAT_001a44b0._8_4_;
      fVar239 = DAT_001a44b0._12_4_;
      in_ZMM7._16_48_ = in_ZMM0._16_48_;
      in_ZMM7._0_16_ = _DAT_001a44b0;
      fVar240 = (float)DAT_001a44c0;
      fVar241 = DAT_001a44c0._4_4_;
      fVar256 = DAT_001a44c0._8_4_;
      fVar257 = DAT_001a44c0._12_4_;
      fVar200 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar209 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar210 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar211 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar335 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      fVar345 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8);
      fVar349 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc);
      fVar258 = (float)DAT_001a44d0;
      fVar259 = DAT_001a44d0._4_4_;
      fVar264 = DAT_001a44d0._8_4_;
      fVar265 = DAT_001a44d0._12_4_;
      fVar266 = (float)DAT_001a44e0;
      fVar267 = DAT_001a44e0._4_4_;
      fVar283 = DAT_001a44e0._8_4_;
      fVar284 = DAT_001a44e0._12_4_;
      fVar285 = (float)DAT_001a44f0;
      fVar288 = DAT_001a44f0._4_4_;
      fVar312 = DAT_001a44f0._8_4_;
      fVar313 = DAT_001a44f0._12_4_;
      fVar177 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      fVar197 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4);
      fVar198 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8);
      fVar199 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc);
      fVar314 = (float)DAT_001a4500;
      fVar315 = DAT_001a4500._4_4_;
      fVar324 = DAT_001a4500._8_4_;
      fVar325 = DAT_001a4500._12_4_;
      fVar212 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar226 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar227 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)(undefined1 *)local_108._buffer = fVar200 + fVar212;
      *(float *)((undefined1 *)local_108._buffer + 4) = fVar209 + fVar226;
      *(float *)((undefined1 *)local_108._buffer + 8) = fVar210 + fVar227;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = fVar211 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) = fVar211 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) = fVar210 - fVar227;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) = fVar209 - fVar226;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) = fVar200 - fVar212;
      fVar115 = fVar335 * 0.3535536 + 0.0;
      fVar335 = fVar115 + fVar347 * 0.4619398 + fVar177 * fVar228 + fVar198 * fVar240;
      fVar174 = fVar115 + fVar347 * 0.1913422 + fVar177 * fVar229 + fVar198 * fVar241;
      fVar175 = fVar115 + fVar347 * -0.1913422 + fVar177 * fVar238 + fVar198 * fVar256;
      fVar115 = fVar115 + fVar347 * -0.4619398 + fVar177 * fVar239 + fVar198 * fVar257;
      fVar347 = fVar345 * fVar258 + 0.0 + fVar349 * fVar266 + fVar197 * fVar285 + fVar199 * fVar314;
      fVar176 = fVar345 * fVar259 + 0.0 + fVar349 * fVar267 + fVar197 * fVar288 + fVar199 * fVar315;
      fVar177 = fVar345 * fVar264 + 0.0 + fVar349 * fVar283 + fVar197 * fVar312 + fVar199 * fVar324;
      fVar345 = fVar345 * fVar265 + 0.0 + fVar349 * fVar284 + fVar197 * fVar313 + fVar199 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) = fVar335 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) = fVar174 + fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) = fVar175 + fVar177;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) = fVar115 + fVar345;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) = fVar115 - fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) = fVar175 - fVar177;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) = fVar174 - fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) = fVar335 - fVar347;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4);
      fVar335 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc);
      fVar349 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) * 0.3535536 + 0.0;
      fVar177 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar197 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar198 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar335 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar345 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar347 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar349 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) = fVar177 + fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) = fVar197 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) = fVar198 + fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) = fVar335 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) = fVar335 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) = fVar198 - fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) = fVar197 - fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) = fVar177 - fVar345;
      pauVar107 = (undefined1 (*) [16])local_108._buffer;
      for (lVar112 = 0; lVar112 != 2; lVar112 = lVar112 + 1) {
        for (lVar108 = 0; lVar108 != 0x80; lVar108 = lVar108 + 0x10) {
          uVar90 = *(undefined8 *)((long)(*pauVar107 + lVar108 * 2) + 8);
          *(undefined8 *)((long)&local_e0 + lVar108) = *(undefined8 *)(*pauVar107 + lVar108 * 2);
          *(undefined8 *)((long)&fStack_d8 + lVar108) = uVar90;
        }
        fVar175 = local_c0 * 0.1913422 - local_80 * 0.4619398;
        fVar347 = fStack_bc * 0.1913422 - fStack_7c * 0.4619398;
        fVar176 = fStack_b8 * 0.1913422 - fStack_78 * 0.4619398;
        fVar349 = fStack_b4 * 0.1913422 - fStack_74 * 0.4619398;
        fVar200 = local_80 * 0.1913422 + local_c0 * 0.4619398;
        fVar209 = fStack_7c * 0.1913422 + fStack_bc * 0.4619398;
        fVar210 = fStack_78 * 0.1913422 + fStack_b8 * 0.4619398;
        fVar211 = fStack_74 * 0.1913422 + fStack_b4 * 0.4619398;
        fVar177 = (float)DAT_001a4530;
        fVar197 = DAT_001a4530._4_4_;
        fVar198 = DAT_001a4530._8_4_;
        fVar199 = DAT_001a4530._12_4_;
        fVar229 = (float)DAT_001a4540;
        fVar238 = DAT_001a4540._4_4_;
        fVar239 = DAT_001a4540._8_4_;
        fVar240 = DAT_001a4540._12_4_;
        fVar241 = (float)DAT_001a4550;
        fVar256 = DAT_001a4550._4_4_;
        fVar257 = DAT_001a4550._8_4_;
        fVar258 = DAT_001a4550._12_4_;
        fVar259 = (float)DAT_001a4560;
        fVar264 = DAT_001a4560._4_4_;
        fVar265 = DAT_001a4560._8_4_;
        fVar266 = DAT_001a4560._12_4_;
        fVar115 = local_70 * fVar259 + local_90 * fVar241 + local_b0 * fVar229 + local_d0 * fVar177;
        fVar335 = fStack_6c * fVar264 + fStack_8c * fVar256 +
                  fStack_ac * fVar238 + fStack_cc * fVar197;
        fVar174 = fStack_68 * fVar265 + fStack_88 * fVar257 +
                  fStack_a8 * fVar239 + fStack_c8 * fVar198;
        fVar345 = fStack_64 * fVar266 + fStack_84 * fVar258 +
                  fStack_a4 * fVar240 + fStack_c4 * fVar199;
        fVar212 = (local_d0 * fVar229 - local_b0 * fVar259) -
                  (local_70 * fVar241 + local_90 * fVar177);
        fVar226 = (fStack_cc * fVar238 - fStack_ac * fVar264) -
                  (fStack_6c * fVar256 + fStack_8c * fVar197);
        fVar227 = (fStack_c8 * fVar239 - fStack_a8 * fVar265) -
                  (fStack_68 * fVar257 + fStack_88 * fVar198);
        fVar228 = (fStack_c4 * fVar240 - fStack_a4 * fVar266) -
                  (fStack_64 * fVar258 + fStack_84 * fVar199);
        in_ZMM7._0_4_ =
             local_70 * fVar229 + local_90 * fVar259 + (local_d0 * fVar241 - local_b0 * fVar177);
        in_ZMM7._4_4_ =
             fStack_6c * fVar238 + fStack_8c * fVar264 + (fStack_cc * fVar256 - fStack_ac * fVar197)
        ;
        in_ZMM7._8_4_ =
             fStack_68 * fVar239 + fStack_88 * fVar265 + (fStack_c8 * fVar257 - fStack_a8 * fVar198)
        ;
        in_ZMM7._12_4_ =
             fStack_64 * fVar240 + fStack_84 * fVar266 + (fStack_c4 * fVar258 - fStack_a4 * fVar199)
        ;
        fVar177 = (local_90 * fVar229 - local_70 * fVar177) +
                  (local_d0 * fVar259 - local_b0 * fVar241);
        fVar197 = (fStack_8c * fVar238 - fStack_6c * fVar197) +
                  (fStack_cc * fVar264 - fStack_ac * fVar256);
        fVar198 = (fStack_88 * fVar239 - fStack_68 * fVar198) +
                  (fStack_c8 * fVar265 - fStack_a8 * fVar257);
        fVar199 = (fStack_84 * fVar240 - fStack_64 * fVar199) +
                  (fStack_c4 * fVar266 - fStack_a4 * fVar258);
        fVar229 = (local_e0 + local_a0) * (float)DAT_001a4570;
        fVar238 = (fStack_dc + fStack_9c) * DAT_001a4570._4_4_;
        fVar239 = (fStack_d8 + fStack_98) * DAT_001a4570._8_4_;
        fVar240 = (fStack_d4 + fStack_94) * DAT_001a4570._12_4_;
        fVar241 = (local_e0 - local_a0) * (float)DAT_001a4570;
        fVar256 = (fStack_dc - fStack_9c) * DAT_001a4570._4_4_;
        fVar257 = (fStack_d8 - fStack_98) * DAT_001a4570._8_4_;
        fVar258 = (fStack_d4 - fStack_94) * DAT_001a4570._12_4_;
        fVar259 = fVar175 + fVar241;
        fVar264 = fVar347 + fVar256;
        fVar265 = fVar176 + fVar257;
        fVar266 = fVar349 + fVar258;
        fVar241 = fVar241 - fVar175;
        fVar256 = fVar256 - fVar347;
        fVar257 = fVar257 - fVar176;
        fVar258 = fVar258 - fVar349;
        fVar175 = fVar200 + fVar229;
        fVar347 = fVar209 + fVar238;
        fVar176 = fVar210 + fVar239;
        fVar349 = fVar211 + fVar240;
        fVar229 = fVar229 - fVar200;
        fVar238 = fVar238 - fVar209;
        fVar239 = fVar239 - fVar210;
        fVar240 = fVar240 - fVar211;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + lVar112 * 0x10);
        *(float *)*pauVar1 = fVar115 + fVar175;
        *(float *)(*pauVar1 + 4) = fVar335 + fVar347;
        *(float *)(*pauVar1 + 8) = fVar174 + fVar176;
        *(float *)(*pauVar1 + 0xc) = fVar345 + fVar349;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 2) * 0x10);
        *(float *)*pauVar1 = fVar212 + fVar259;
        *(float *)(*pauVar1 + 4) = fVar226 + fVar264;
        *(float *)(*pauVar1 + 8) = fVar227 + fVar265;
        *(float *)(*pauVar1 + 0xc) = fVar228 + fVar266;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 4) * 0x10);
        *(float *)*pauVar1 = in_ZMM7._0_4_ + fVar241;
        *(float *)(*pauVar1 + 4) = in_ZMM7._4_4_ + fVar256;
        *(float *)(*pauVar1 + 8) = in_ZMM7._8_4_ + fVar257;
        *(float *)(*pauVar1 + 0xc) = in_ZMM7._12_4_ + fVar258;
        auVar218._0_4_ = fVar177 + fVar229;
        auVar218._4_4_ = fVar197 + fVar238;
        auVar218._8_4_ = fVar198 + fVar239;
        auVar218._12_4_ = fVar199 + fVar240;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 6) * 0x10) = auVar218;
        auVar247._0_4_ = fVar229 - fVar177;
        auVar247._4_4_ = fVar238 - fVar197;
        auVar247._8_4_ = fVar239 - fVar198;
        auVar247._12_4_ = fVar240 - fVar199;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 8) * 0x10) = auVar247;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 10) * 0x10);
        *(float *)*pauVar1 = fVar241 - in_ZMM7._0_4_;
        *(float *)(*pauVar1 + 4) = fVar256 - in_ZMM7._4_4_;
        *(float *)(*pauVar1 + 8) = fVar257 - in_ZMM7._8_4_;
        *(float *)(*pauVar1 + 0xc) = fVar258 - in_ZMM7._12_4_;
        auVar294._0_4_ = fVar259 - fVar212;
        auVar294._4_4_ = fVar264 - fVar226;
        auVar294._8_4_ = fVar265 - fVar227;
        auVar294._12_4_ = fVar266 - fVar228;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xc) * 0x10) = auVar294;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar175 - fVar115;
        *(float *)(*pauVar1 + 4) = fVar347 - fVar335;
        *(float *)(*pauVar1 + 8) = fVar176 - fVar174;
        *(float *)(*pauVar1 + 0xc) = fVar349 - fVar345;
        pauVar107 = pauVar107 + 1;
      }
      auVar159._0_12_ = ZEXT812(0x3c23d70a);
      auVar159._12_4_ = 0;
      compareBufferRelative(&local_f8,&local_108,auVar159._0_4_,1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"2x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      uVar113 = 0;
      while( true ) {
        in_ZMM0._16_48_ = in_ZMM7._16_48_;
        if (uVar113 == 0x40) break;
        auVar159._0_16_ = ZEXT816(0);
        if (uVar113 < 0x10) {
          auVar165._0_8_ = (double)Imath_3_2::erand48(local_e6);
          auVar165._8_56_ = extraout_var_15;
          auVar159._4_60_ = auVar165._4_60_;
          auVar159._0_4_ = (float)auVar165._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = auVar159._0_4_;
        local_f8._buffer[uVar113] = auVar159._0_4_;
        uVar113 = uVar113 + 1;
      }
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      fVar115 = *(float *)((undefined1 *)local_108._buffer + 4);
      fVar335 = *(float *)((undefined1 *)local_108._buffer + 8);
      fVar174 = *(float *)((undefined1 *)local_108._buffer + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc);
      fVar349 = *(float *)(undefined1 *)local_108._buffer * 0.3535536 + 0.0;
      fVar228 = (float)DAT_001a44b0;
      fVar229 = DAT_001a44b0._4_4_;
      fVar238 = DAT_001a44b0._8_4_;
      fVar239 = DAT_001a44b0._12_4_;
      in_ZMM7._16_48_ = in_ZMM0._16_48_;
      in_ZMM7._0_16_ = _DAT_001a44b0;
      fVar240 = (float)DAT_001a44c0;
      fVar241 = DAT_001a44c0._4_4_;
      fVar256 = DAT_001a44c0._8_4_;
      fVar257 = DAT_001a44c0._12_4_;
      fVar200 = fVar349 + fVar335 * 0.4619398 + fVar345 * fVar228 + fVar347 * fVar240;
      fVar209 = fVar349 + fVar335 * 0.1913422 + fVar345 * fVar229 + fVar347 * fVar241;
      fVar210 = fVar349 + fVar335 * -0.1913422 + fVar345 * fVar238 + fVar347 * fVar256;
      fVar211 = fVar349 + fVar335 * -0.4619398 + fVar345 * fVar239 + fVar347 * fVar257;
      fVar335 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      fVar345 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8);
      fVar349 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc);
      fVar258 = (float)DAT_001a44d0;
      fVar259 = DAT_001a44d0._4_4_;
      fVar264 = DAT_001a44d0._8_4_;
      fVar265 = DAT_001a44d0._12_4_;
      fVar266 = (float)DAT_001a44e0;
      fVar267 = DAT_001a44e0._4_4_;
      fVar283 = DAT_001a44e0._8_4_;
      fVar284 = DAT_001a44e0._12_4_;
      fVar285 = (float)DAT_001a44f0;
      fVar288 = DAT_001a44f0._4_4_;
      fVar312 = DAT_001a44f0._8_4_;
      fVar313 = DAT_001a44f0._12_4_;
      fVar177 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      fVar197 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4);
      fVar198 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8);
      fVar199 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc);
      fVar314 = (float)DAT_001a4500;
      fVar315 = DAT_001a4500._4_4_;
      fVar324 = DAT_001a4500._8_4_;
      fVar325 = DAT_001a4500._12_4_;
      fVar212 = fVar115 * fVar258 + 0.0 + fVar174 * fVar266 + fVar175 * fVar285 + fVar176 * fVar314;
      fVar226 = fVar115 * fVar259 + 0.0 + fVar174 * fVar267 + fVar175 * fVar288 + fVar176 * fVar315;
      fVar227 = fVar115 * fVar264 + 0.0 + fVar174 * fVar283 + fVar175 * fVar312 + fVar176 * fVar324;
      fVar115 = fVar115 * fVar265 + 0.0 + fVar174 * fVar284 + fVar175 * fVar313 + fVar176 * fVar325;
      *(float *)(undefined1 *)local_108._buffer = fVar200 + fVar212;
      *(float *)((undefined1 *)local_108._buffer + 4) = fVar209 + fVar226;
      *(float *)((undefined1 *)local_108._buffer + 8) = fVar210 + fVar227;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = fVar211 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) = fVar211 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) = fVar210 - fVar227;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) = fVar209 - fVar226;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) = fVar200 - fVar212;
      fVar115 = fVar335 * 0.3535536 + 0.0;
      fVar335 = fVar115 + fVar347 * 0.4619398 + fVar177 * fVar228 + fVar198 * fVar240;
      fVar174 = fVar115 + fVar347 * 0.1913422 + fVar177 * fVar229 + fVar198 * fVar241;
      fVar175 = fVar115 + fVar347 * -0.1913422 + fVar177 * fVar238 + fVar198 * fVar256;
      fVar115 = fVar115 + fVar347 * -0.4619398 + fVar177 * fVar239 + fVar198 * fVar257;
      fVar347 = fVar345 * fVar258 + 0.0 + fVar349 * fVar266 + fVar197 * fVar285 + fVar199 * fVar314;
      fVar176 = fVar345 * fVar259 + 0.0 + fVar349 * fVar267 + fVar197 * fVar288 + fVar199 * fVar315;
      fVar177 = fVar345 * fVar264 + 0.0 + fVar349 * fVar283 + fVar197 * fVar312 + fVar199 * fVar324;
      fVar345 = fVar345 * fVar265 + 0.0 + fVar349 * fVar284 + fVar197 * fVar313 + fVar199 * fVar325;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) = fVar335 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) = fVar174 + fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) = fVar175 + fVar177;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) = fVar115 + fVar345;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) = fVar115 - fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) = fVar175 - fVar177;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) = fVar174 - fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) = fVar335 - fVar347;
      pauVar107 = (undefined1 (*) [16])local_108._buffer;
      for (lVar112 = 0; lVar112 != 2; lVar112 = lVar112 + 1) {
        for (lVar108 = 0; lVar108 != 0x80; lVar108 = lVar108 + 0x10) {
          uVar90 = *(undefined8 *)((long)(*pauVar107 + lVar108 * 2) + 8);
          *(undefined8 *)((long)&local_e0 + lVar108) = *(undefined8 *)(*pauVar107 + lVar108 * 2);
          *(undefined8 *)((long)&fStack_d8 + lVar108) = uVar90;
        }
        fVar175 = local_c0 * 0.1913422 - local_80 * 0.4619398;
        fVar347 = fStack_bc * 0.1913422 - fStack_7c * 0.4619398;
        fVar176 = fStack_b8 * 0.1913422 - fStack_78 * 0.4619398;
        fVar349 = fStack_b4 * 0.1913422 - fStack_74 * 0.4619398;
        fVar200 = local_80 * 0.1913422 + local_c0 * 0.4619398;
        fVar209 = fStack_7c * 0.1913422 + fStack_bc * 0.4619398;
        fVar210 = fStack_78 * 0.1913422 + fStack_b8 * 0.4619398;
        fVar211 = fStack_74 * 0.1913422 + fStack_b4 * 0.4619398;
        fVar177 = (float)DAT_001a4530;
        fVar197 = DAT_001a4530._4_4_;
        fVar198 = DAT_001a4530._8_4_;
        fVar199 = DAT_001a4530._12_4_;
        fVar229 = (float)DAT_001a4540;
        fVar238 = DAT_001a4540._4_4_;
        fVar239 = DAT_001a4540._8_4_;
        fVar240 = DAT_001a4540._12_4_;
        fVar241 = (float)DAT_001a4550;
        fVar256 = DAT_001a4550._4_4_;
        fVar257 = DAT_001a4550._8_4_;
        fVar258 = DAT_001a4550._12_4_;
        fVar259 = (float)DAT_001a4560;
        fVar264 = DAT_001a4560._4_4_;
        fVar265 = DAT_001a4560._8_4_;
        fVar266 = DAT_001a4560._12_4_;
        fVar115 = local_70 * fVar259 + local_90 * fVar241 + local_b0 * fVar229 + local_d0 * fVar177;
        fVar335 = fStack_6c * fVar264 + fStack_8c * fVar256 +
                  fStack_ac * fVar238 + fStack_cc * fVar197;
        fVar174 = fStack_68 * fVar265 + fStack_88 * fVar257 +
                  fStack_a8 * fVar239 + fStack_c8 * fVar198;
        fVar345 = fStack_64 * fVar266 + fStack_84 * fVar258 +
                  fStack_a4 * fVar240 + fStack_c4 * fVar199;
        fVar212 = (local_d0 * fVar229 - local_b0 * fVar259) -
                  (local_70 * fVar241 + local_90 * fVar177);
        fVar226 = (fStack_cc * fVar238 - fStack_ac * fVar264) -
                  (fStack_6c * fVar256 + fStack_8c * fVar197);
        fVar227 = (fStack_c8 * fVar239 - fStack_a8 * fVar265) -
                  (fStack_68 * fVar257 + fStack_88 * fVar198);
        fVar228 = (fStack_c4 * fVar240 - fStack_a4 * fVar266) -
                  (fStack_64 * fVar258 + fStack_84 * fVar199);
        in_ZMM7._0_4_ =
             local_70 * fVar229 + local_90 * fVar259 + (local_d0 * fVar241 - local_b0 * fVar177);
        in_ZMM7._4_4_ =
             fStack_6c * fVar238 + fStack_8c * fVar264 + (fStack_cc * fVar256 - fStack_ac * fVar197)
        ;
        in_ZMM7._8_4_ =
             fStack_68 * fVar239 + fStack_88 * fVar265 + (fStack_c8 * fVar257 - fStack_a8 * fVar198)
        ;
        in_ZMM7._12_4_ =
             fStack_64 * fVar240 + fStack_84 * fVar266 + (fStack_c4 * fVar258 - fStack_a4 * fVar199)
        ;
        fVar177 = (local_90 * fVar229 - local_70 * fVar177) +
                  (local_d0 * fVar259 - local_b0 * fVar241);
        fVar197 = (fStack_8c * fVar238 - fStack_6c * fVar197) +
                  (fStack_cc * fVar264 - fStack_ac * fVar256);
        fVar198 = (fStack_88 * fVar239 - fStack_68 * fVar198) +
                  (fStack_c8 * fVar265 - fStack_a8 * fVar257);
        fVar199 = (fStack_84 * fVar240 - fStack_64 * fVar199) +
                  (fStack_c4 * fVar266 - fStack_a4 * fVar258);
        fVar229 = (local_e0 + local_a0) * (float)DAT_001a4570;
        fVar238 = (fStack_dc + fStack_9c) * DAT_001a4570._4_4_;
        fVar239 = (fStack_d8 + fStack_98) * DAT_001a4570._8_4_;
        fVar240 = (fStack_d4 + fStack_94) * DAT_001a4570._12_4_;
        fVar241 = (local_e0 - local_a0) * (float)DAT_001a4570;
        fVar256 = (fStack_dc - fStack_9c) * DAT_001a4570._4_4_;
        fVar257 = (fStack_d8 - fStack_98) * DAT_001a4570._8_4_;
        fVar258 = (fStack_d4 - fStack_94) * DAT_001a4570._12_4_;
        fVar259 = fVar175 + fVar241;
        fVar264 = fVar347 + fVar256;
        fVar265 = fVar176 + fVar257;
        fVar266 = fVar349 + fVar258;
        fVar241 = fVar241 - fVar175;
        fVar256 = fVar256 - fVar347;
        fVar257 = fVar257 - fVar176;
        fVar258 = fVar258 - fVar349;
        fVar175 = fVar200 + fVar229;
        fVar347 = fVar209 + fVar238;
        fVar176 = fVar210 + fVar239;
        fVar349 = fVar211 + fVar240;
        fVar229 = fVar229 - fVar200;
        fVar238 = fVar238 - fVar209;
        fVar239 = fVar239 - fVar210;
        fVar240 = fVar240 - fVar211;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + lVar112 * 0x10);
        *(float *)*pauVar1 = fVar115 + fVar175;
        *(float *)(*pauVar1 + 4) = fVar335 + fVar347;
        *(float *)(*pauVar1 + 8) = fVar174 + fVar176;
        *(float *)(*pauVar1 + 0xc) = fVar345 + fVar349;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 2) * 0x10);
        *(float *)*pauVar1 = fVar212 + fVar259;
        *(float *)(*pauVar1 + 4) = fVar226 + fVar264;
        *(float *)(*pauVar1 + 8) = fVar227 + fVar265;
        *(float *)(*pauVar1 + 0xc) = fVar228 + fVar266;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 4) * 0x10);
        *(float *)*pauVar1 = in_ZMM7._0_4_ + fVar241;
        *(float *)(*pauVar1 + 4) = in_ZMM7._4_4_ + fVar256;
        *(float *)(*pauVar1 + 8) = in_ZMM7._8_4_ + fVar257;
        *(float *)(*pauVar1 + 0xc) = in_ZMM7._12_4_ + fVar258;
        auVar219._0_4_ = fVar177 + fVar229;
        auVar219._4_4_ = fVar197 + fVar238;
        auVar219._8_4_ = fVar198 + fVar239;
        auVar219._12_4_ = fVar199 + fVar240;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 6) * 0x10) = auVar219;
        auVar248._0_4_ = fVar229 - fVar177;
        auVar248._4_4_ = fVar238 - fVar197;
        auVar248._8_4_ = fVar239 - fVar198;
        auVar248._12_4_ = fVar240 - fVar199;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 8) * 0x10) = auVar248;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 10) * 0x10);
        *(float *)*pauVar1 = fVar241 - in_ZMM7._0_4_;
        *(float *)(*pauVar1 + 4) = fVar256 - in_ZMM7._4_4_;
        *(float *)(*pauVar1 + 8) = fVar257 - in_ZMM7._8_4_;
        *(float *)(*pauVar1 + 0xc) = fVar258 - in_ZMM7._12_4_;
        auVar295._0_4_ = fVar259 - fVar212;
        auVar295._4_4_ = fVar264 - fVar226;
        auVar295._8_4_ = fVar265 - fVar227;
        auVar295._12_4_ = fVar266 - fVar228;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xc) * 0x10) = auVar295;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar175 - fVar115;
        *(float *)(*pauVar1 + 4) = fVar347 - fVar335;
        *(float *)(*pauVar1 + 8) = fVar176 - fVar174;
        *(float *)(*pauVar1 + 0xc) = fVar349 - fVar345;
        pauVar107 = pauVar107 + 1;
      }
      auVar159._0_12_ = ZEXT812(0x3c23d70a);
      auVar159._12_4_ = 0;
      compareBufferRelative(&local_f8,&local_108,auVar159._0_4_,1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"1x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      for (uVar113 = 0; uVar113 != 0x40; uVar113 = uVar113 + 1) {
        auVar159._0_16_ = ZEXT816(0);
        if (uVar113 < 8) {
          auVar166._0_8_ = (double)Imath_3_2::erand48(local_e6);
          auVar166._8_56_ = extraout_var_16;
          auVar159._4_60_ = auVar166._4_60_;
          auVar159._0_4_ = (float)auVar166._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = auVar159._0_4_;
        local_f8._buffer[uVar113] = auVar159._0_4_;
      }
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      fVar115 = *(float *)((undefined1 *)local_108._buffer + 4);
      fVar335 = *(float *)((undefined1 *)local_108._buffer + 8);
      fVar174 = *(float *)((undefined1 *)local_108._buffer + 0xc);
      fVar345 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4);
      fVar347 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8);
      fVar176 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc);
      fVar349 = fVar176 * 0.09754573 +
                fVar175 * 0.2777855 + fVar174 * 0.4157349 + fVar115 * 0.4903927 + 0.0;
      fVar177 = fVar176 * -0.2777855 +
                fVar175 * -0.4903927 + fVar174 * -0.09754573 + fVar115 * 0.4157349 + 0.0;
      fVar197 = fVar176 * 0.4157349 +
                fVar175 * 0.09754573 + fVar174 * -0.4903927 + fVar115 * 0.2777855 + 0.0;
      fVar198 = fVar176 * -0.4903927 +
                fVar175 * 0.4157349 + fVar174 * -0.2777855 + fVar115 * 0.09754573 + 0.0;
      fVar115 = *(float *)(undefined1 *)local_108._buffer * 0.3535536 + 0.0;
      fVar174 = fVar115 + fVar335 * 0.4619398 + fVar345 * 0.3535536 + fVar347 * 0.1913422;
      fVar175 = fVar115 + fVar335 * 0.1913422 + fVar345 * -0.3535536 + fVar347 * -0.4619398;
      fVar176 = fVar115 + fVar335 * -0.1913422 + fVar345 * -0.3535536 + fVar347 * 0.4619398;
      fVar115 = fVar115 + fVar335 * -0.4619398 + fVar345 * 0.3535536 + fVar347 * -0.1913422;
      *(float *)(undefined1 *)local_108._buffer = fVar174 + fVar349;
      *(float *)((undefined1 *)local_108._buffer + 4) = fVar175 + fVar177;
      *(float *)((undefined1 *)local_108._buffer + 8) = fVar176 + fVar197;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = fVar115 + fVar198;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) = fVar115 - fVar198;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) = fVar176 - fVar197;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) = fVar175 - fVar177;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) = fVar174 - fVar349;
      pauVar107 = (undefined1 (*) [16])local_108._buffer;
      for (lVar112 = 0; lVar112 != 2; lVar112 = lVar112 + 1) {
        for (lVar108 = 0; lVar108 != 0x80; lVar108 = lVar108 + 0x10) {
          uVar90 = *(undefined8 *)((long)(*pauVar107 + lVar108 * 2) + 8);
          *(undefined8 *)((long)&local_e0 + lVar108) = *(undefined8 *)(*pauVar107 + lVar108 * 2);
          *(undefined8 *)((long)&fStack_d8 + lVar108) = uVar90;
        }
        fVar175 = local_c0 * 0.1913422 - local_80 * 0.4619398;
        fVar347 = fStack_bc * 0.1913422 - fStack_7c * 0.4619398;
        fVar176 = fStack_b8 * 0.1913422 - fStack_78 * 0.4619398;
        fVar349 = fStack_b4 * 0.1913422 - fStack_74 * 0.4619398;
        fVar200 = local_80 * 0.1913422 + local_c0 * 0.4619398;
        fVar209 = fStack_7c * 0.1913422 + fStack_bc * 0.4619398;
        fVar210 = fStack_78 * 0.1913422 + fStack_b8 * 0.4619398;
        fVar211 = fStack_74 * 0.1913422 + fStack_b4 * 0.4619398;
        fVar177 = (float)DAT_001a4530;
        fVar197 = DAT_001a4530._4_4_;
        fVar198 = DAT_001a4530._8_4_;
        fVar199 = DAT_001a4530._12_4_;
        fVar229 = (float)DAT_001a4540;
        fVar238 = DAT_001a4540._4_4_;
        fVar239 = DAT_001a4540._8_4_;
        fVar240 = DAT_001a4540._12_4_;
        fVar241 = (float)DAT_001a4550;
        fVar256 = DAT_001a4550._4_4_;
        fVar257 = DAT_001a4550._8_4_;
        fVar258 = DAT_001a4550._12_4_;
        fVar259 = (float)DAT_001a4560;
        fVar264 = DAT_001a4560._4_4_;
        fVar265 = DAT_001a4560._8_4_;
        fVar266 = DAT_001a4560._12_4_;
        fVar115 = local_70 * fVar259 + local_90 * fVar241 + local_b0 * fVar229 + local_d0 * fVar177;
        fVar335 = fStack_6c * fVar264 + fStack_8c * fVar256 +
                  fStack_ac * fVar238 + fStack_cc * fVar197;
        fVar174 = fStack_68 * fVar265 + fStack_88 * fVar257 +
                  fStack_a8 * fVar239 + fStack_c8 * fVar198;
        fVar345 = fStack_64 * fVar266 + fStack_84 * fVar258 +
                  fStack_a4 * fVar240 + fStack_c4 * fVar199;
        fVar212 = (local_d0 * fVar229 - local_b0 * fVar259) -
                  (local_70 * fVar241 + local_90 * fVar177);
        fVar226 = (fStack_cc * fVar238 - fStack_ac * fVar264) -
                  (fStack_6c * fVar256 + fStack_8c * fVar197);
        fVar227 = (fStack_c8 * fVar239 - fStack_a8 * fVar265) -
                  (fStack_68 * fVar257 + fStack_88 * fVar198);
        fVar228 = (fStack_c4 * fVar240 - fStack_a4 * fVar266) -
                  (fStack_64 * fVar258 + fStack_84 * fVar199);
        in_ZMM7._0_4_ =
             local_70 * fVar229 + local_90 * fVar259 + (local_d0 * fVar241 - local_b0 * fVar177);
        in_ZMM7._4_4_ =
             fStack_6c * fVar238 + fStack_8c * fVar264 + (fStack_cc * fVar256 - fStack_ac * fVar197)
        ;
        in_ZMM7._8_4_ =
             fStack_68 * fVar239 + fStack_88 * fVar265 + (fStack_c8 * fVar257 - fStack_a8 * fVar198)
        ;
        in_ZMM7._12_4_ =
             fStack_64 * fVar240 + fStack_84 * fVar266 + (fStack_c4 * fVar258 - fStack_a4 * fVar199)
        ;
        fVar177 = (local_90 * fVar229 - local_70 * fVar177) +
                  (local_d0 * fVar259 - local_b0 * fVar241);
        fVar197 = (fStack_8c * fVar238 - fStack_6c * fVar197) +
                  (fStack_cc * fVar264 - fStack_ac * fVar256);
        fVar198 = (fStack_88 * fVar239 - fStack_68 * fVar198) +
                  (fStack_c8 * fVar265 - fStack_a8 * fVar257);
        fVar199 = (fStack_84 * fVar240 - fStack_64 * fVar199) +
                  (fStack_c4 * fVar266 - fStack_a4 * fVar258);
        fVar229 = (local_e0 + local_a0) * (float)DAT_001a4570;
        fVar238 = (fStack_dc + fStack_9c) * DAT_001a4570._4_4_;
        fVar239 = (fStack_d8 + fStack_98) * DAT_001a4570._8_4_;
        fVar240 = (fStack_d4 + fStack_94) * DAT_001a4570._12_4_;
        fVar241 = (local_e0 - local_a0) * (float)DAT_001a4570;
        fVar256 = (fStack_dc - fStack_9c) * DAT_001a4570._4_4_;
        fVar257 = (fStack_d8 - fStack_98) * DAT_001a4570._8_4_;
        fVar258 = (fStack_d4 - fStack_94) * DAT_001a4570._12_4_;
        fVar259 = fVar175 + fVar241;
        fVar264 = fVar347 + fVar256;
        fVar265 = fVar176 + fVar257;
        fVar266 = fVar349 + fVar258;
        fVar241 = fVar241 - fVar175;
        fVar256 = fVar256 - fVar347;
        fVar257 = fVar257 - fVar176;
        fVar258 = fVar258 - fVar349;
        fVar175 = fVar200 + fVar229;
        fVar347 = fVar209 + fVar238;
        fVar176 = fVar210 + fVar239;
        fVar349 = fVar211 + fVar240;
        fVar229 = fVar229 - fVar200;
        fVar238 = fVar238 - fVar209;
        fVar239 = fVar239 - fVar210;
        fVar240 = fVar240 - fVar211;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + lVar112 * 0x10);
        *(float *)*pauVar1 = fVar115 + fVar175;
        *(float *)(*pauVar1 + 4) = fVar335 + fVar347;
        *(float *)(*pauVar1 + 8) = fVar174 + fVar176;
        *(float *)(*pauVar1 + 0xc) = fVar345 + fVar349;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 2) * 0x10);
        *(float *)*pauVar1 = fVar212 + fVar259;
        *(float *)(*pauVar1 + 4) = fVar226 + fVar264;
        *(float *)(*pauVar1 + 8) = fVar227 + fVar265;
        *(float *)(*pauVar1 + 0xc) = fVar228 + fVar266;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 4) * 0x10);
        *(float *)*pauVar1 = in_ZMM7._0_4_ + fVar241;
        *(float *)(*pauVar1 + 4) = in_ZMM7._4_4_ + fVar256;
        *(float *)(*pauVar1 + 8) = in_ZMM7._8_4_ + fVar257;
        *(float *)(*pauVar1 + 0xc) = in_ZMM7._12_4_ + fVar258;
        auVar220._0_4_ = fVar177 + fVar229;
        auVar220._4_4_ = fVar197 + fVar238;
        auVar220._8_4_ = fVar198 + fVar239;
        auVar220._12_4_ = fVar199 + fVar240;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 6) * 0x10) = auVar220;
        auVar249._0_4_ = fVar229 - fVar177;
        auVar249._4_4_ = fVar238 - fVar197;
        auVar249._8_4_ = fVar239 - fVar198;
        auVar249._12_4_ = fVar240 - fVar199;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 8) * 0x10) = auVar249;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 10) * 0x10);
        *(float *)*pauVar1 = fVar241 - in_ZMM7._0_4_;
        *(float *)(*pauVar1 + 4) = fVar256 - in_ZMM7._4_4_;
        *(float *)(*pauVar1 + 8) = fVar257 - in_ZMM7._8_4_;
        *(float *)(*pauVar1 + 0xc) = fVar258 - in_ZMM7._12_4_;
        auVar296._0_4_ = fVar259 - fVar212;
        auVar296._4_4_ = fVar264 - fVar226;
        auVar296._8_4_ = fVar265 - fVar227;
        auVar296._12_4_ = fVar266 - fVar228;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xc) * 0x10) = auVar296;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar175 - fVar115;
        *(float *)(*pauVar1 + 4) = fVar347 - fVar335;
        *(float *)(*pauVar1 + 8) = fVar176 - fVar174;
        *(float *)(*pauVar1 + 0xc) = fVar349 - fVar345;
        pauVar107 = pauVar107 + 1;
      }
      auVar159._0_12_ = ZEXT812(0x3c23d70a);
      auVar159._12_4_ = 0;
      compareBufferRelative(&local_f8,&local_108,auVar159._0_4_,1e-06);
    }
  }
  if (local_5a == '\x01') {
    poVar106 = std::operator<<((ostream *)&std::cout,"      Inverse, AVX: ");
    std::endl<char,std::char_traits<char>>(poVar106);
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"8x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      for (lVar112 = 0; lVar112 != 0x40; lVar112 = lVar112 + 1) {
        dVar116 = (double)Imath_3_2::erand48(local_e6);
        *(float *)((undefined1 *)local_108._buffer + lVar112 * 4) = (float)dVar116;
        local_f8._buffer[lVar112] = (float)dVar116;
      }
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      puVar109 = &DAT_001a4be0;
      pfVar110 = &local_e0;
      for (lVar112 = 0x10; lVar112 != 0; lVar112 = lVar112 + -1) {
        *(undefined8 *)pfVar110 = *puVar109;
        puVar109 = puVar109 + (ulong)bVar114 * -2 + 1;
        pfVar110 = pfVar110 + ((ulong)bVar114 * -2 + 1) * 2;
      }
      auVar371._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      auVar371._0_16_ = *(undefined1 (*) [16])local_108._buffer;
      auVar388._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      auVar388._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      auVar10 = vunpcklpd_avx(auVar371,auVar388);
      auVar9 = vunpckhpd_avx(auVar371,auVar388);
      auVar180 = vunpcklps_avx(auVar10,auVar9);
      auVar9 = vunpckhps_avx(auVar10,auVar9);
      auVar222 = vunpcklpd_avx(auVar180,auVar9);
      auVar9 = vunpckhpd_avx(auVar180,auVar9);
      auVar354._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x60);
      auVar354._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x40);
      auVar365._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x70);
      auVar365._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x50);
      auVar180 = vunpcklpd_avx(auVar354,auVar365);
      auVar10 = vunpckhpd_avx(auVar354,auVar365);
      auVar297 = vunpcklps_avx(auVar180,auVar10);
      auVar10 = vunpckhps_avx(auVar180,auVar10);
      auVar11 = vunpcklpd_avx(auVar297,auVar10);
      auVar10 = vunpckhpd_avx(auVar297,auVar10);
      auVar327._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xa0);
      auVar327._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x80);
      auVar337._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xb0);
      auVar337._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x90);
      auVar297 = vunpcklpd_avx(auVar327,auVar337);
      auVar180 = vunpckhpd_avx(auVar327,auVar337);
      auVar179 = vunpcklps_avx(auVar297,auVar180);
      auVar180 = vunpckhps_avx(auVar297,auVar180);
      auVar12 = vunpcklpd_avx(auVar179,auVar180);
      auVar180 = vunpckhpd_avx(auVar179,auVar180);
      auVar297._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xe0);
      auVar297._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xc0);
      auVar316._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xf0);
      auVar316._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xd0);
      auVar179 = vunpcklpd_avx(auVar297,auVar316);
      auVar297 = vunpckhpd_avx(auVar297,auVar316);
      auVar13 = vunpcklps_avx(auVar179,auVar297);
      auVar297 = vunpckhps_avx(auVar179,auVar297);
      auVar179 = vunpcklpd_avx(auVar13,auVar297);
      auVar297 = vunpckhpd_avx(auVar13,auVar297);
      auVar13 = vpermilps_avx(auVar222,0);
      auVar14 = vpermilps_avx(auVar222,0x55);
      auVar15 = vpermilps_avx(auVar222,0xaa);
      auVar222 = vpermilps_avx(auVar222,0xff);
      auVar125._0_4_ =
           local_e0 * auVar13._0_4_ + local_d0 * auVar14._0_4_ +
           local_c0 * auVar15._0_4_ + local_b0 * auVar222._0_4_;
      auVar125._4_4_ =
           fStack_dc * auVar13._4_4_ + fStack_cc * auVar14._4_4_ +
           fStack_bc * auVar15._4_4_ + fStack_ac * auVar222._4_4_;
      auVar125._8_4_ =
           fStack_d8 * auVar13._8_4_ + fStack_c8 * auVar14._8_4_ +
           fStack_b8 * auVar15._8_4_ + fStack_a8 * auVar222._8_4_;
      auVar125._12_4_ =
           fStack_d4 * auVar13._12_4_ + fStack_c4 * auVar14._12_4_ +
           fStack_b4 * auVar15._12_4_ + fStack_a4 * auVar222._12_4_;
      auVar125._16_4_ =
           local_e0 * auVar13._16_4_ + local_d0 * auVar14._16_4_ +
           local_c0 * auVar15._16_4_ + local_b0 * auVar222._16_4_;
      auVar125._20_4_ =
           fStack_dc * auVar13._20_4_ + fStack_cc * auVar14._20_4_ +
           fStack_bc * auVar15._20_4_ + fStack_ac * auVar222._20_4_;
      auVar125._24_4_ =
           fStack_d8 * auVar13._24_4_ + fStack_c8 * auVar14._24_4_ +
           fStack_b8 * auVar15._24_4_ + fStack_a8 * auVar222._24_4_;
      auVar125._28_4_ = auVar13._28_4_ + auVar14._28_4_ + auVar15._28_4_ + auVar222._28_4_;
      auVar222 = vpermilps_avx(auVar11,0);
      auVar13 = vpermilps_avx(auVar11,0x55);
      auVar14 = vpermilps_avx(auVar11,0xaa);
      auVar11 = vpermilps_avx(auVar11,0xff);
      auVar178._0_4_ =
           local_e0 * auVar222._0_4_ + local_d0 * auVar13._0_4_ +
           local_c0 * auVar14._0_4_ + local_b0 * auVar11._0_4_;
      auVar178._4_4_ =
           fStack_dc * auVar222._4_4_ + fStack_cc * auVar13._4_4_ +
           fStack_bc * auVar14._4_4_ + fStack_ac * auVar11._4_4_;
      auVar178._8_4_ =
           fStack_d8 * auVar222._8_4_ + fStack_c8 * auVar13._8_4_ +
           fStack_b8 * auVar14._8_4_ + fStack_a8 * auVar11._8_4_;
      auVar178._12_4_ =
           fStack_d4 * auVar222._12_4_ + fStack_c4 * auVar13._12_4_ +
           fStack_b4 * auVar14._12_4_ + fStack_a4 * auVar11._12_4_;
      auVar178._16_4_ =
           local_e0 * auVar222._16_4_ + local_d0 * auVar13._16_4_ +
           local_c0 * auVar14._16_4_ + local_b0 * auVar11._16_4_;
      auVar178._20_4_ =
           fStack_dc * auVar222._20_4_ + fStack_cc * auVar13._20_4_ +
           fStack_bc * auVar14._20_4_ + fStack_ac * auVar11._20_4_;
      auVar178._24_4_ =
           fStack_d8 * auVar222._24_4_ + fStack_c8 * auVar13._24_4_ +
           fStack_b8 * auVar14._24_4_ + fStack_a8 * auVar11._24_4_;
      auVar178._28_4_ = auVar222._28_4_ + auVar13._28_4_ + auVar14._28_4_ + auVar11._28_4_;
      auVar222 = vpermilps_avx(auVar12,0);
      auVar11 = vpermilps_avx(auVar12,0x55);
      auVar13 = vpermilps_avx(auVar12,0xaa);
      auVar12 = vpermilps_avx(auVar12,0xff);
      auVar201._0_4_ =
           local_e0 * auVar222._0_4_ + local_d0 * auVar11._0_4_ +
           local_c0 * auVar13._0_4_ + local_b0 * auVar12._0_4_;
      auVar201._4_4_ =
           fStack_dc * auVar222._4_4_ + fStack_cc * auVar11._4_4_ +
           fStack_bc * auVar13._4_4_ + fStack_ac * auVar12._4_4_;
      auVar201._8_4_ =
           fStack_d8 * auVar222._8_4_ + fStack_c8 * auVar11._8_4_ +
           fStack_b8 * auVar13._8_4_ + fStack_a8 * auVar12._8_4_;
      auVar201._12_4_ =
           fStack_d4 * auVar222._12_4_ + fStack_c4 * auVar11._12_4_ +
           fStack_b4 * auVar13._12_4_ + fStack_a4 * auVar12._12_4_;
      auVar201._16_4_ =
           local_e0 * auVar222._16_4_ + local_d0 * auVar11._16_4_ +
           local_c0 * auVar13._16_4_ + local_b0 * auVar12._16_4_;
      auVar201._20_4_ =
           fStack_dc * auVar222._20_4_ + fStack_cc * auVar11._20_4_ +
           fStack_bc * auVar13._20_4_ + fStack_ac * auVar12._20_4_;
      auVar201._24_4_ =
           fStack_d8 * auVar222._24_4_ + fStack_c8 * auVar11._24_4_ +
           fStack_b8 * auVar13._24_4_ + fStack_a8 * auVar12._24_4_;
      auVar201._28_4_ = auVar222._28_4_ + auVar11._28_4_ + auVar13._28_4_ + auVar12._28_4_;
      auVar222 = vpermilps_avx(auVar179,0);
      auVar11 = vpermilps_avx(auVar179,0x55);
      auVar12 = vpermilps_avx(auVar179,0xaa);
      auVar179 = vpermilps_avx(auVar179,0xff);
      auVar221._0_4_ =
           local_e0 * auVar222._0_4_ + local_d0 * auVar11._0_4_ +
           local_c0 * auVar12._0_4_ + local_b0 * auVar179._0_4_;
      auVar221._4_4_ =
           fStack_dc * auVar222._4_4_ + fStack_cc * auVar11._4_4_ +
           fStack_bc * auVar12._4_4_ + fStack_ac * auVar179._4_4_;
      auVar221._8_4_ =
           fStack_d8 * auVar222._8_4_ + fStack_c8 * auVar11._8_4_ +
           fStack_b8 * auVar12._8_4_ + fStack_a8 * auVar179._8_4_;
      auVar221._12_4_ =
           fStack_d4 * auVar222._12_4_ + fStack_c4 * auVar11._12_4_ +
           fStack_b4 * auVar12._12_4_ + fStack_a4 * auVar179._12_4_;
      auVar221._16_4_ =
           local_e0 * auVar222._16_4_ + local_d0 * auVar11._16_4_ +
           local_c0 * auVar12._16_4_ + local_b0 * auVar179._16_4_;
      auVar221._20_4_ =
           fStack_dc * auVar222._20_4_ + fStack_cc * auVar11._20_4_ +
           fStack_bc * auVar12._20_4_ + fStack_ac * auVar179._20_4_;
      auVar221._24_4_ =
           fStack_d8 * auVar222._24_4_ + fStack_c8 * auVar11._24_4_ +
           fStack_b8 * auVar12._24_4_ + fStack_a8 * auVar179._24_4_;
      auVar221._28_4_ = auVar222._28_4_ + auVar11._28_4_ + auVar12._28_4_ + auVar179._28_4_;
      auVar98._4_4_ = fStack_9c;
      auVar98._0_4_ = local_a0;
      auVar98._8_4_ = fStack_98;
      auVar98._12_4_ = fStack_94;
      auVar298._16_16_ = auVar98;
      auVar298._0_16_ = auVar98;
      auVar222 = vpermilps_avx(auVar9,0);
      auVar11 = vpermilps_avx(auVar9,0x55);
      auVar12 = vpermilps_avx(auVar9,0xaa);
      auVar9 = vpermilps_avx(auVar9,0xff);
      auVar230._0_4_ =
           local_a0 * auVar222._0_4_ + local_90 * auVar11._0_4_ +
           local_80 * auVar12._0_4_ + local_70 * auVar9._0_4_;
      auVar230._4_4_ =
           fStack_9c * auVar222._4_4_ + fStack_8c * auVar11._4_4_ +
           fStack_7c * auVar12._4_4_ + fStack_6c * auVar9._4_4_;
      auVar230._8_4_ =
           fStack_98 * auVar222._8_4_ + fStack_88 * auVar11._8_4_ +
           fStack_78 * auVar12._8_4_ + fStack_68 * auVar9._8_4_;
      auVar230._12_4_ =
           fStack_94 * auVar222._12_4_ + fStack_84 * auVar11._12_4_ +
           fStack_74 * auVar12._12_4_ + fStack_64 * auVar9._12_4_;
      auVar230._16_4_ =
           local_a0 * auVar222._16_4_ + local_90 * auVar11._16_4_ +
           local_80 * auVar12._16_4_ + local_70 * auVar9._16_4_;
      auVar230._20_4_ =
           fStack_9c * auVar222._20_4_ + fStack_8c * auVar11._20_4_ +
           fStack_7c * auVar12._20_4_ + fStack_6c * auVar9._20_4_;
      auVar230._24_4_ =
           fStack_98 * auVar222._24_4_ + fStack_88 * auVar11._24_4_ +
           fStack_78 * auVar12._24_4_ + fStack_68 * auVar9._24_4_;
      auVar230._28_4_ = auVar222._28_4_ + auVar11._28_4_ + auVar12._28_4_ + auVar9._28_4_;
      auVar9 = vpermilps_avx(auVar10,0);
      auVar222 = vpermilps_avx(auVar10,0x55);
      auVar11 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      auVar250._0_4_ =
           local_a0 * auVar9._0_4_ + local_90 * auVar222._0_4_ +
           local_80 * auVar11._0_4_ + local_70 * auVar10._0_4_;
      auVar250._4_4_ =
           fStack_9c * auVar9._4_4_ + fStack_8c * auVar222._4_4_ +
           fStack_7c * auVar11._4_4_ + fStack_6c * auVar10._4_4_;
      auVar250._8_4_ =
           fStack_98 * auVar9._8_4_ + fStack_88 * auVar222._8_4_ +
           fStack_78 * auVar11._8_4_ + fStack_68 * auVar10._8_4_;
      auVar250._12_4_ =
           fStack_94 * auVar9._12_4_ + fStack_84 * auVar222._12_4_ +
           fStack_74 * auVar11._12_4_ + fStack_64 * auVar10._12_4_;
      auVar250._16_4_ =
           local_a0 * auVar9._16_4_ + local_90 * auVar222._16_4_ +
           local_80 * auVar11._16_4_ + local_70 * auVar10._16_4_;
      auVar250._20_4_ =
           fStack_9c * auVar9._20_4_ + fStack_8c * auVar222._20_4_ +
           fStack_7c * auVar11._20_4_ + fStack_6c * auVar10._20_4_;
      auVar250._24_4_ =
           fStack_98 * auVar9._24_4_ + fStack_88 * auVar222._24_4_ +
           fStack_78 * auVar11._24_4_ + fStack_68 * auVar10._24_4_;
      auVar250._28_4_ = auVar9._28_4_ + auVar222._28_4_ + auVar11._28_4_ + auVar10._28_4_;
      auVar9 = vpermilps_avx(auVar180,0);
      auVar10 = vpermilps_avx(auVar180,0x55);
      auVar222 = vpermilps_avx(auVar180,0xaa);
      auVar180 = vpermilps_avx(auVar180,0xff);
      auVar260._0_4_ =
           local_a0 * auVar9._0_4_ + local_90 * auVar10._0_4_ +
           local_80 * auVar222._0_4_ + local_70 * auVar180._0_4_;
      auVar260._4_4_ =
           fStack_9c * auVar9._4_4_ + fStack_8c * auVar10._4_4_ +
           fStack_7c * auVar222._4_4_ + fStack_6c * auVar180._4_4_;
      auVar260._8_4_ =
           fStack_98 * auVar9._8_4_ + fStack_88 * auVar10._8_4_ +
           fStack_78 * auVar222._8_4_ + fStack_68 * auVar180._8_4_;
      auVar260._12_4_ =
           fStack_94 * auVar9._12_4_ + fStack_84 * auVar10._12_4_ +
           fStack_74 * auVar222._12_4_ + fStack_64 * auVar180._12_4_;
      auVar260._16_4_ =
           local_a0 * auVar9._16_4_ + local_90 * auVar10._16_4_ +
           local_80 * auVar222._16_4_ + local_70 * auVar180._16_4_;
      auVar260._20_4_ =
           fStack_9c * auVar9._20_4_ + fStack_8c * auVar10._20_4_ +
           fStack_7c * auVar222._20_4_ + fStack_6c * auVar180._20_4_;
      auVar260._24_4_ =
           fStack_98 * auVar9._24_4_ + fStack_88 * auVar10._24_4_ +
           fStack_78 * auVar222._24_4_ + fStack_68 * auVar180._24_4_;
      auVar260._28_4_ = auVar9._28_4_ + auVar10._28_4_ + auVar222._28_4_ + auVar180._28_4_;
      auVar9 = vpermilps_avx(auVar297,0);
      auVar10 = vpermilps_avx(auVar297,0x55);
      auVar180 = vpermilps_avx(auVar297,0xaa);
      auVar297 = vpermilps_avx(auVar297,0xff);
      auVar268._0_4_ =
           local_a0 * auVar9._0_4_ + local_90 * auVar10._0_4_ +
           local_80 * auVar180._0_4_ + local_70 * auVar297._0_4_;
      auVar268._4_4_ =
           fStack_9c * auVar9._4_4_ + fStack_8c * auVar10._4_4_ +
           fStack_7c * auVar180._4_4_ + fStack_6c * auVar297._4_4_;
      auVar268._8_4_ =
           fStack_98 * auVar9._8_4_ + fStack_88 * auVar10._8_4_ +
           fStack_78 * auVar180._8_4_ + fStack_68 * auVar297._8_4_;
      auVar268._12_4_ =
           fStack_94 * auVar9._12_4_ + fStack_84 * auVar10._12_4_ +
           fStack_74 * auVar180._12_4_ + fStack_64 * auVar297._12_4_;
      auVar268._16_4_ =
           local_a0 * auVar9._16_4_ + local_90 * auVar10._16_4_ +
           local_80 * auVar180._16_4_ + local_70 * auVar297._16_4_;
      auVar268._20_4_ =
           fStack_9c * auVar9._20_4_ + fStack_8c * auVar10._20_4_ +
           fStack_7c * auVar180._20_4_ + fStack_6c * auVar297._20_4_;
      auVar268._24_4_ =
           fStack_98 * auVar9._24_4_ + fStack_88 * auVar10._24_4_ +
           fStack_78 * auVar180._24_4_ + fStack_68 * auVar297._24_4_;
      auVar268._28_4_ = auVar9._28_4_ + auVar10._28_4_ + auVar180._28_4_ + auVar297._28_4_;
      auVar9 = vsubps_avx(auVar125,auVar230);
      auVar126._0_4_ = auVar125._0_4_ + auVar230._0_4_;
      auVar126._4_4_ = auVar125._4_4_ + auVar230._4_4_;
      auVar126._8_4_ = auVar125._8_4_ + auVar230._8_4_;
      auVar126._12_4_ = auVar125._12_4_ + auVar230._12_4_;
      auVar126._16_4_ = auVar125._16_4_ + auVar230._16_4_;
      auVar126._20_4_ = auVar125._20_4_ + auVar230._20_4_;
      auVar126._24_4_ = auVar125._24_4_ + auVar230._24_4_;
      auVar126._28_4_ = auVar125._28_4_ + auVar230._28_4_;
      auVar10 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar178,auVar250);
      auVar179._0_4_ = auVar178._0_4_ + auVar250._0_4_;
      auVar179._4_4_ = auVar178._4_4_ + auVar250._4_4_;
      auVar179._8_4_ = auVar178._8_4_ + auVar250._8_4_;
      auVar179._12_4_ = auVar178._12_4_ + auVar250._12_4_;
      auVar179._16_4_ = auVar178._16_4_ + auVar250._16_4_;
      auVar179._20_4_ = auVar178._20_4_ + auVar250._20_4_;
      auVar179._24_4_ = auVar178._24_4_ + auVar250._24_4_;
      auVar179._28_4_ = auVar178._28_4_ + auVar250._28_4_;
      auVar14 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar201,auVar260);
      auVar202._0_4_ = auVar201._0_4_ + auVar260._0_4_;
      auVar202._4_4_ = auVar201._4_4_ + auVar260._4_4_;
      auVar202._8_4_ = auVar201._8_4_ + auVar260._8_4_;
      auVar202._12_4_ = auVar201._12_4_ + auVar260._12_4_;
      auVar202._16_4_ = auVar201._16_4_ + auVar260._16_4_;
      auVar202._20_4_ = auVar201._20_4_ + auVar260._20_4_;
      auVar202._24_4_ = auVar201._24_4_ + auVar260._24_4_;
      auVar202._28_4_ = auVar201._28_4_ + auVar260._28_4_;
      auVar15 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar221,auVar268);
      auVar222._0_4_ = auVar221._0_4_ + auVar268._0_4_;
      auVar222._4_4_ = auVar221._4_4_ + auVar268._4_4_;
      auVar222._8_4_ = auVar221._8_4_ + auVar268._8_4_;
      auVar222._12_4_ = auVar221._12_4_ + auVar268._12_4_;
      auVar222._16_4_ = auVar221._16_4_ + auVar268._16_4_;
      auVar222._20_4_ = auVar221._20_4_ + auVar268._20_4_;
      auVar222._24_4_ = auVar221._24_4_ + auVar268._24_4_;
      auVar222._28_4_ = auVar221._28_4_ + auVar268._28_4_;
      auVar16 = vpermilps_avx(auVar9,0x1b);
      auVar297 = vperm2f128_avx(auVar16,auVar222,0x13);
      auVar222 = vperm2f128_avx(auVar16,auVar222,2);
      auVar180 = vperm2f128_avx(auVar15,auVar202,0x13);
      auVar11 = vperm2f128_avx(auVar15,auVar202,2);
      auVar12 = vperm2f128_avx(auVar14,auVar179,0x13);
      auVar179 = vperm2f128_avx(auVar14,auVar179,2);
      auVar9 = vperm2f128_avx(auVar10,auVar126,0x13);
      auVar13 = vperm2f128_avx(auVar10,auVar126,2);
      auVar125 = vpermilps_avx(auVar298,0xff);
      auVar126 = vpermilps_avx(auVar298,0xaa);
      auVar178 = vpermilps_avx(auVar298,0x55);
      auVar201 = vpermilps_avx(auVar298,0);
      fVar115 = auVar9._0_4_;
      fVar264 = auVar201._0_4_;
      fVar175 = auVar9._4_4_;
      fVar265 = auVar201._4_4_;
      fVar177 = auVar9._8_4_;
      fVar266 = auVar201._8_4_;
      fVar200 = auVar9._12_4_;
      fVar267 = auVar201._12_4_;
      fVar212 = auVar9._16_4_;
      fVar283 = auVar201._16_4_;
      fVar229 = auVar9._20_4_;
      fVar284 = auVar201._20_4_;
      fVar241 = auVar9._24_4_;
      fVar285 = auVar201._24_4_;
      fVar335 = auVar12._0_4_;
      fVar288 = auVar178._0_4_;
      fVar347 = auVar12._4_4_;
      fVar312 = auVar178._4_4_;
      fVar197 = auVar12._8_4_;
      fVar313 = auVar178._8_4_;
      fVar209 = auVar12._12_4_;
      fVar314 = auVar178._12_4_;
      fVar226 = auVar12._16_4_;
      fVar315 = auVar178._16_4_;
      fVar238 = auVar12._20_4_;
      fVar324 = auVar178._20_4_;
      fVar256 = auVar12._24_4_;
      fVar325 = auVar178._24_4_;
      fVar174 = auVar180._0_4_;
      fVar326 = auVar126._0_4_;
      fVar176 = auVar180._4_4_;
      fVar385 = auVar126._4_4_;
      fVar198 = auVar180._8_4_;
      fVar387 = auVar126._8_4_;
      fVar210 = auVar180._12_4_;
      fVar331 = auVar126._12_4_;
      fVar227 = auVar180._16_4_;
      fVar332 = auVar126._16_4_;
      fVar239 = auVar180._20_4_;
      fVar333 = auVar126._20_4_;
      fVar257 = auVar180._24_4_;
      fVar334 = auVar126._24_4_;
      fVar345 = auVar297._0_4_;
      fVar336 = auVar125._0_4_;
      fVar349 = auVar297._4_4_;
      fVar346 = auVar125._4_4_;
      fVar199 = auVar297._8_4_;
      fVar348 = auVar125._8_4_;
      fVar211 = auVar297._12_4_;
      fVar350 = auVar125._12_4_;
      fVar228 = auVar297._16_4_;
      fVar351 = auVar125._16_4_;
      fVar240 = auVar297._20_4_;
      fVar352 = auVar125._20_4_;
      fVar258 = auVar297._24_4_;
      fVar353 = auVar125._24_4_;
      fVar259 = auVar16._28_4_;
      fVar386 = fVar259 + auVar15._28_4_;
      auVar355._0_4_ = fVar336 * fVar345 + fVar326 * fVar174 + fVar288 * fVar335 + fVar264 * fVar115
      ;
      auVar355._4_4_ = fVar346 * fVar349 + fVar385 * fVar176 + fVar312 * fVar347 + fVar265 * fVar175
      ;
      auVar355._8_4_ = fVar348 * fVar199 + fVar387 * fVar198 + fVar313 * fVar197 + fVar266 * fVar177
      ;
      auVar355._12_4_ =
           fVar350 * fVar211 + fVar331 * fVar210 + fVar314 * fVar209 + fVar267 * fVar200;
      auVar355._16_4_ =
           fVar351 * fVar228 + fVar332 * fVar227 + fVar315 * fVar226 + fVar283 * fVar212;
      auVar355._20_4_ =
           fVar352 * fVar240 + fVar333 * fVar239 + fVar324 * fVar238 + fVar284 * fVar229;
      auVar355._24_4_ =
           fVar353 * fVar258 + fVar334 * fVar257 + fVar325 * fVar256 + fVar285 * fVar241;
      auVar355._28_4_ = fVar386 + auVar14._28_4_ + auVar10._28_4_;
      auVar9._4_4_ = fVar312 * fVar175;
      auVar9._0_4_ = fVar288 * fVar115;
      auVar9._8_4_ = fVar313 * fVar177;
      auVar9._12_4_ = fVar314 * fVar200;
      auVar9._16_4_ = fVar315 * fVar212;
      auVar9._20_4_ = fVar324 * fVar229;
      auVar9._24_4_ = fVar325 * fVar241;
      auVar9._28_4_ = auVar14._28_4_;
      auVar372._0_4_ = fVar264 * fVar174 + fVar336 * fVar335;
      auVar372._4_4_ = fVar265 * fVar176 + fVar346 * fVar347;
      auVar372._8_4_ = fVar266 * fVar198 + fVar348 * fVar197;
      auVar372._12_4_ = fVar267 * fVar210 + fVar350 * fVar209;
      auVar372._16_4_ = fVar283 * fVar227 + fVar351 * fVar226;
      auVar372._20_4_ = fVar284 * fVar239 + fVar352 * fVar238;
      auVar372._24_4_ = fVar285 * fVar257 + fVar353 * fVar256;
      auVar372._28_4_ = fVar259 + fVar386;
      auVar9 = vsubps_avx(auVar9,auVar372);
      auVar10._4_4_ = fVar385 * fVar349;
      auVar10._0_4_ = fVar326 * fVar345;
      auVar10._8_4_ = fVar387 * fVar199;
      auVar10._12_4_ = fVar331 * fVar211;
      auVar10._16_4_ = fVar332 * fVar228;
      auVar10._20_4_ = fVar333 * fVar240;
      auVar10._24_4_ = fVar334 * fVar258;
      auVar10._28_4_ = fVar259;
      auVar9 = vsubps_avx(auVar9,auVar10);
      auVar14._4_4_ = fVar385 * fVar175;
      auVar14._0_4_ = fVar326 * fVar115;
      auVar14._8_4_ = fVar387 * fVar177;
      auVar14._12_4_ = fVar331 * fVar200;
      auVar14._16_4_ = fVar332 * fVar212;
      auVar14._20_4_ = fVar333 * fVar229;
      auVar14._24_4_ = fVar334 * fVar241;
      auVar14._28_4_ = auVar372._28_4_;
      auVar15._4_4_ = fVar265 * fVar347;
      auVar15._0_4_ = fVar264 * fVar335;
      auVar15._8_4_ = fVar266 * fVar197;
      auVar15._12_4_ = fVar267 * fVar209;
      auVar15._16_4_ = fVar283 * fVar226;
      auVar15._20_4_ = fVar284 * fVar238;
      auVar15._24_4_ = fVar285 * fVar256;
      auVar15._28_4_ = fVar259;
      auVar10 = vsubps_avx(auVar14,auVar15);
      auVar373._0_4_ = auVar10._0_4_ + fVar336 * fVar174 + fVar288 * fVar345;
      auVar373._4_4_ = auVar10._4_4_ + fVar346 * fVar176 + fVar312 * fVar349;
      auVar373._8_4_ = auVar10._8_4_ + fVar348 * fVar198 + fVar313 * fVar199;
      auVar373._12_4_ = auVar10._12_4_ + fVar350 * fVar210 + fVar314 * fVar211;
      auVar373._16_4_ = auVar10._16_4_ + fVar351 * fVar227 + fVar315 * fVar228;
      auVar373._20_4_ = auVar10._20_4_ + fVar352 * fVar239 + fVar324 * fVar240;
      auVar373._24_4_ = auVar10._24_4_ + fVar353 * fVar257 + fVar325 * fVar258;
      auVar373._28_4_ = auVar10._28_4_ + fVar259 + fVar259;
      auVar389._0_4_ = fVar336 * fVar115 + fVar288 * fVar174;
      auVar389._4_4_ = fVar346 * fVar175 + fVar312 * fVar176;
      auVar389._8_4_ = fVar348 * fVar177 + fVar313 * fVar198;
      auVar389._12_4_ = fVar350 * fVar200 + fVar314 * fVar210;
      auVar389._16_4_ = fVar351 * fVar212 + fVar315 * fVar227;
      auVar389._20_4_ = fVar352 * fVar229 + fVar324 * fVar239;
      auVar389._24_4_ = fVar353 * fVar241 + fVar325 * fVar257;
      auVar389._28_4_ = fVar259 + auVar180._28_4_;
      auVar223._0_4_ = fVar264 * fVar345 + fVar326 * fVar335;
      auVar223._4_4_ = fVar265 * fVar349 + fVar385 * fVar347;
      auVar223._8_4_ = fVar266 * fVar199 + fVar387 * fVar197;
      auVar223._12_4_ = fVar267 * fVar211 + fVar331 * fVar209;
      auVar223._16_4_ = fVar283 * fVar228 + fVar332 * fVar226;
      auVar223._20_4_ = fVar284 * fVar240 + fVar333 * fVar238;
      auVar223._24_4_ = fVar285 * fVar258 + fVar334 * fVar256;
      auVar223._28_4_ = auVar297._28_4_ + auVar12._28_4_;
      auVar10 = vsubps_avx(auVar389,auVar223);
      auVar91._4_4_ = fStack_d4;
      auVar91._0_4_ = fStack_d8;
      auVar91._8_4_ = local_d0;
      auVar91._12_4_ = fStack_cc;
      auVar180._16_16_ = auVar91;
      auVar180._0_16_ = auVar91;
      auVar12 = vpermilps_avx(auVar180,0xff);
      auVar14 = vpermilps_avx(auVar180,0xaa);
      auVar180 = vpermilps_avx(auVar180,0);
      fVar349 = auVar13._0_4_ * auVar180._0_4_;
      fVar177 = auVar13._4_4_ * auVar180._4_4_;
      auVar16._4_4_ = fVar177;
      auVar16._0_4_ = fVar349;
      fVar197 = auVar13._8_4_ * auVar180._8_4_;
      auVar16._8_4_ = fVar197;
      fVar198 = auVar13._12_4_ * auVar180._12_4_;
      auVar16._12_4_ = fVar198;
      fVar199 = auVar13._16_4_ * auVar180._16_4_;
      auVar16._16_4_ = fVar199;
      fVar200 = auVar13._20_4_ * auVar180._20_4_;
      auVar16._20_4_ = fVar200;
      fVar209 = auVar13._24_4_ * auVar180._24_4_;
      auVar16._24_4_ = fVar209;
      auVar16._28_4_ = auVar125._28_4_;
      fVar115 = auVar11._0_4_ * auVar180._0_4_;
      fVar335 = auVar11._4_4_ * auVar180._4_4_;
      auVar13._4_4_ = fVar335;
      auVar13._0_4_ = fVar115;
      fVar174 = auVar11._8_4_ * auVar180._8_4_;
      auVar13._8_4_ = fVar174;
      fVar345 = auVar11._12_4_ * auVar180._12_4_;
      auVar13._12_4_ = fVar345;
      fVar175 = auVar11._16_4_ * auVar180._16_4_;
      auVar13._16_4_ = fVar175;
      fVar347 = auVar11._20_4_ * auVar180._20_4_;
      auVar13._20_4_ = fVar347;
      fVar176 = auVar11._24_4_ * auVar180._24_4_;
      auVar13._24_4_ = fVar176;
      auVar13._28_4_ = auVar11._28_4_;
      auVar338._0_4_ = fVar349 + fVar115;
      auVar338._4_4_ = fVar177 + fVar335;
      auVar338._8_4_ = fVar197 + fVar174;
      auVar338._12_4_ = fVar198 + fVar345;
      auVar338._16_4_ = fVar199 + fVar175;
      auVar338._20_4_ = fVar200 + fVar347;
      auVar338._24_4_ = fVar209 + fVar176;
      auVar338._28_4_ = auVar125._28_4_ + auVar11._28_4_;
      auVar180 = vsubps_avx(auVar16,auVar13);
      auVar269._0_4_ = auVar222._0_4_ * auVar12._0_4_ + auVar179._0_4_ * auVar14._0_4_;
      auVar269._4_4_ = auVar222._4_4_ * auVar12._4_4_ + auVar179._4_4_ * auVar14._4_4_;
      auVar269._8_4_ = auVar222._8_4_ * auVar12._8_4_ + auVar179._8_4_ * auVar14._8_4_;
      auVar269._12_4_ = auVar222._12_4_ * auVar12._12_4_ + auVar179._12_4_ * auVar14._12_4_;
      auVar269._16_4_ = auVar222._16_4_ * auVar12._16_4_ + auVar179._16_4_ * auVar14._16_4_;
      auVar269._20_4_ = auVar222._20_4_ * auVar12._20_4_ + auVar179._20_4_ * auVar14._20_4_;
      auVar269._24_4_ = auVar222._24_4_ * auVar12._24_4_ + auVar179._24_4_ * auVar14._24_4_;
      auVar269._28_4_ = auVar178._28_4_ + auVar297._28_4_;
      auVar299._0_4_ = auVar338._0_4_ + auVar269._0_4_;
      auVar299._4_4_ = auVar338._4_4_ + auVar269._4_4_;
      auVar299._8_4_ = auVar338._8_4_ + auVar269._8_4_;
      auVar299._12_4_ = auVar338._12_4_ + auVar269._12_4_;
      auVar299._16_4_ = auVar338._16_4_ + auVar269._16_4_;
      auVar299._20_4_ = auVar338._20_4_ + auVar269._20_4_;
      auVar299._24_4_ = auVar338._24_4_ + auVar269._24_4_;
      auVar299._28_4_ = auVar338._28_4_ + auVar269._28_4_;
      auVar297 = vsubps_avx(auVar338,auVar269);
      auVar11._4_4_ = auVar179._4_4_ * auVar12._4_4_;
      auVar11._0_4_ = auVar179._0_4_ * auVar12._0_4_;
      auVar11._8_4_ = auVar179._8_4_ * auVar12._8_4_;
      auVar11._12_4_ = auVar179._12_4_ * auVar12._12_4_;
      auVar11._16_4_ = auVar179._16_4_ * auVar12._16_4_;
      auVar11._20_4_ = auVar179._20_4_ * auVar12._20_4_;
      auVar11._24_4_ = auVar179._24_4_ * auVar12._24_4_;
      auVar11._28_4_ = auVar269._28_4_;
      auVar12._4_4_ = auVar222._4_4_ * auVar14._4_4_;
      auVar12._0_4_ = auVar222._0_4_ * auVar14._0_4_;
      auVar12._8_4_ = auVar222._8_4_ * auVar14._8_4_;
      auVar12._12_4_ = auVar222._12_4_ * auVar14._12_4_;
      auVar12._16_4_ = auVar222._16_4_ * auVar14._16_4_;
      auVar12._20_4_ = auVar222._20_4_ * auVar14._20_4_;
      auVar12._24_4_ = auVar222._24_4_ * auVar14._24_4_;
      auVar12._28_4_ = auVar178._28_4_;
      auVar222 = vsubps_avx(auVar11,auVar12);
      auVar317._0_4_ = auVar180._0_4_ + auVar222._0_4_;
      auVar317._4_4_ = auVar180._4_4_ + auVar222._4_4_;
      auVar317._8_4_ = auVar180._8_4_ + auVar222._8_4_;
      auVar317._12_4_ = auVar180._12_4_ + auVar222._12_4_;
      auVar317._16_4_ = auVar180._16_4_ + auVar222._16_4_;
      auVar317._20_4_ = auVar180._20_4_ + auVar222._20_4_;
      auVar317._24_4_ = auVar180._24_4_ + auVar222._24_4_;
      auVar317._28_4_ = auVar180._28_4_ + auVar222._28_4_;
      auVar180 = vsubps_avx(auVar180,auVar222);
      auVar222 = vsubps_avx(auVar299,auVar355);
      auVar11 = vsubps_avx(auVar317,auVar9);
      auVar12 = vsubps_avx(auVar180,auVar373);
      auVar179 = vsubps_avx(auVar297,auVar10);
      *(float *)(undefined1 *)local_108._buffer = auVar299._0_4_ + auVar355._0_4_;
      *(float *)((undefined1 *)local_108._buffer + 4) = auVar299._4_4_ + auVar355._4_4_;
      *(float *)((undefined1 *)local_108._buffer + 8) = auVar299._8_4_ + auVar355._8_4_;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = auVar299._12_4_ + auVar355._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) =
           auVar299._16_4_ + auVar355._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) =
           auVar299._20_4_ + auVar355._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) =
           auVar299._24_4_ + auVar355._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) =
           auVar299._28_4_ + auVar355._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) =
           auVar317._0_4_ + auVar9._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) =
           auVar317._4_4_ + auVar9._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) =
           auVar317._8_4_ + auVar9._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) =
           auVar317._12_4_ + auVar9._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) =
           auVar317._16_4_ + auVar9._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) =
           auVar317._20_4_ + auVar9._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) =
           auVar317._24_4_ + auVar9._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) =
           auVar317._28_4_ + auVar9._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) =
           auVar180._0_4_ + auVar373._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) =
           auVar180._4_4_ + auVar373._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) =
           auVar180._8_4_ + auVar373._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) =
           auVar180._12_4_ + auVar373._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) =
           auVar180._16_4_ + auVar373._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) =
           auVar180._20_4_ + auVar373._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) =
           auVar180._24_4_ + auVar373._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) =
           auVar180._28_4_ + auVar373._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) =
           auVar297._0_4_ + auVar10._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) =
           auVar297._4_4_ + auVar10._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) =
           auVar297._8_4_ + auVar10._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) =
           auVar297._12_4_ + auVar10._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) =
           auVar297._16_4_ + auVar10._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) =
           auVar297._20_4_ + auVar10._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) =
           auVar297._24_4_ + auVar10._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) =
           auVar297._28_4_ + auVar10._28_4_;
      *(undefined1 (*) [32])((long)local_108._buffer + 0x80) = auVar179;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xa0) = auVar12;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xc0) = auVar11;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xe0) = auVar222;
      in_ZMM7 = ZEXT1664(auVar222._0_16_);
      auVar159 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_f8,&local_108,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"7x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      for (uVar113 = 0; uVar113 != 0x40; uVar113 = uVar113 + 1) {
        auVar159._0_16_ = ZEXT816(0);
        if (uVar113 < 0x38) {
          auVar167._0_8_ = (double)Imath_3_2::erand48(local_e6);
          auVar167._8_56_ = extraout_var_17;
          auVar159._4_60_ = auVar167._4_60_;
          auVar159._0_4_ = (float)auVar167._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = auVar159._0_4_;
        local_f8._buffer[uVar113] = auVar159._0_4_;
      }
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      puVar109 = &DAT_001a4be0;
      pfVar110 = &local_e0;
      for (lVar112 = 0x10; lVar112 != 0; lVar112 = lVar112 + -1) {
        *(undefined8 *)pfVar110 = *puVar109;
        puVar109 = puVar109 + (ulong)bVar114 * -2 + 1;
        pfVar110 = pfVar110 + ((ulong)bVar114 * -2 + 1) * 2;
      }
      auVar374._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      auVar374._0_16_ = *(undefined1 (*) [16])local_108._buffer;
      auVar390._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      auVar390._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      auVar10 = vunpcklpd_avx(auVar374,auVar390);
      auVar9 = vunpckhpd_avx(auVar374,auVar390);
      auVar180 = vunpcklps_avx(auVar10,auVar9);
      auVar9 = vunpckhps_avx(auVar10,auVar9);
      auVar222 = vunpcklpd_avx(auVar180,auVar9);
      auVar9 = vunpckhpd_avx(auVar180,auVar9);
      auVar356._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x60);
      auVar356._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x40);
      auVar366._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x70);
      auVar366._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x50);
      auVar180 = vunpcklpd_avx(auVar356,auVar366);
      auVar10 = vunpckhpd_avx(auVar356,auVar366);
      auVar297 = vunpcklps_avx(auVar180,auVar10);
      auVar10 = vunpckhps_avx(auVar180,auVar10);
      auVar11 = vunpcklpd_avx(auVar297,auVar10);
      auVar10 = vunpckhpd_avx(auVar297,auVar10);
      auVar328._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xa0);
      auVar328._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x80);
      auVar339._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xb0);
      auVar339._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x90);
      auVar297 = vunpcklpd_avx(auVar328,auVar339);
      auVar180 = vunpckhpd_avx(auVar328,auVar339);
      auVar179 = vunpcklps_avx(auVar297,auVar180);
      auVar180 = vunpckhps_avx(auVar297,auVar180);
      auVar12 = vunpcklpd_avx(auVar179,auVar180);
      auVar180 = vunpckhpd_avx(auVar179,auVar180);
      auVar300._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xe0);
      auVar300._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xc0);
      auVar318._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xf0);
      auVar318._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xd0);
      auVar179 = vunpcklpd_avx(auVar300,auVar318);
      auVar297 = vunpckhpd_avx(auVar300,auVar318);
      auVar13 = vunpcklps_avx(auVar179,auVar297);
      auVar297 = vunpckhps_avx(auVar179,auVar297);
      auVar179 = vunpcklpd_avx(auVar13,auVar297);
      auVar297 = vunpckhpd_avx(auVar13,auVar297);
      auVar13 = vpermilps_avx(auVar222,0);
      auVar14 = vpermilps_avx(auVar222,0x55);
      auVar15 = vpermilps_avx(auVar222,0xaa);
      auVar222 = vpermilps_avx(auVar222,0xff);
      auVar127._0_4_ =
           local_e0 * auVar13._0_4_ + local_d0 * auVar14._0_4_ +
           local_c0 * auVar15._0_4_ + local_b0 * auVar222._0_4_;
      auVar127._4_4_ =
           fStack_dc * auVar13._4_4_ + fStack_cc * auVar14._4_4_ +
           fStack_bc * auVar15._4_4_ + fStack_ac * auVar222._4_4_;
      auVar127._8_4_ =
           fStack_d8 * auVar13._8_4_ + fStack_c8 * auVar14._8_4_ +
           fStack_b8 * auVar15._8_4_ + fStack_a8 * auVar222._8_4_;
      auVar127._12_4_ =
           fStack_d4 * auVar13._12_4_ + fStack_c4 * auVar14._12_4_ +
           fStack_b4 * auVar15._12_4_ + fStack_a4 * auVar222._12_4_;
      auVar127._16_4_ =
           local_e0 * auVar13._16_4_ + local_d0 * auVar14._16_4_ +
           local_c0 * auVar15._16_4_ + local_b0 * auVar222._16_4_;
      auVar127._20_4_ =
           fStack_dc * auVar13._20_4_ + fStack_cc * auVar14._20_4_ +
           fStack_bc * auVar15._20_4_ + fStack_ac * auVar222._20_4_;
      auVar127._24_4_ =
           fStack_d8 * auVar13._24_4_ + fStack_c8 * auVar14._24_4_ +
           fStack_b8 * auVar15._24_4_ + fStack_a8 * auVar222._24_4_;
      auVar127._28_4_ = auVar13._28_4_ + auVar14._28_4_ + auVar15._28_4_ + auVar222._28_4_;
      auVar222 = vpermilps_avx(auVar11,0);
      auVar13 = vpermilps_avx(auVar11,0x55);
      auVar14 = vpermilps_avx(auVar11,0xaa);
      auVar11 = vpermilps_avx(auVar11,0xff);
      auVar181._0_4_ =
           local_e0 * auVar222._0_4_ + local_d0 * auVar13._0_4_ +
           local_c0 * auVar14._0_4_ + local_b0 * auVar11._0_4_;
      auVar181._4_4_ =
           fStack_dc * auVar222._4_4_ + fStack_cc * auVar13._4_4_ +
           fStack_bc * auVar14._4_4_ + fStack_ac * auVar11._4_4_;
      auVar181._8_4_ =
           fStack_d8 * auVar222._8_4_ + fStack_c8 * auVar13._8_4_ +
           fStack_b8 * auVar14._8_4_ + fStack_a8 * auVar11._8_4_;
      auVar181._12_4_ =
           fStack_d4 * auVar222._12_4_ + fStack_c4 * auVar13._12_4_ +
           fStack_b4 * auVar14._12_4_ + fStack_a4 * auVar11._12_4_;
      auVar181._16_4_ =
           local_e0 * auVar222._16_4_ + local_d0 * auVar13._16_4_ +
           local_c0 * auVar14._16_4_ + local_b0 * auVar11._16_4_;
      auVar181._20_4_ =
           fStack_dc * auVar222._20_4_ + fStack_cc * auVar13._20_4_ +
           fStack_bc * auVar14._20_4_ + fStack_ac * auVar11._20_4_;
      auVar181._24_4_ =
           fStack_d8 * auVar222._24_4_ + fStack_c8 * auVar13._24_4_ +
           fStack_b8 * auVar14._24_4_ + fStack_a8 * auVar11._24_4_;
      auVar181._28_4_ = auVar222._28_4_ + auVar13._28_4_ + auVar14._28_4_ + auVar11._28_4_;
      auVar222 = vpermilps_avx(auVar12,0);
      auVar11 = vpermilps_avx(auVar12,0x55);
      auVar13 = vpermilps_avx(auVar12,0xaa);
      auVar12 = vpermilps_avx(auVar12,0xff);
      auVar203._0_4_ =
           local_e0 * auVar222._0_4_ + local_d0 * auVar11._0_4_ +
           local_c0 * auVar13._0_4_ + local_b0 * auVar12._0_4_;
      auVar203._4_4_ =
           fStack_dc * auVar222._4_4_ + fStack_cc * auVar11._4_4_ +
           fStack_bc * auVar13._4_4_ + fStack_ac * auVar12._4_4_;
      auVar203._8_4_ =
           fStack_d8 * auVar222._8_4_ + fStack_c8 * auVar11._8_4_ +
           fStack_b8 * auVar13._8_4_ + fStack_a8 * auVar12._8_4_;
      auVar203._12_4_ =
           fStack_d4 * auVar222._12_4_ + fStack_c4 * auVar11._12_4_ +
           fStack_b4 * auVar13._12_4_ + fStack_a4 * auVar12._12_4_;
      auVar203._16_4_ =
           local_e0 * auVar222._16_4_ + local_d0 * auVar11._16_4_ +
           local_c0 * auVar13._16_4_ + local_b0 * auVar12._16_4_;
      auVar203._20_4_ =
           fStack_dc * auVar222._20_4_ + fStack_cc * auVar11._20_4_ +
           fStack_bc * auVar13._20_4_ + fStack_ac * auVar12._20_4_;
      auVar203._24_4_ =
           fStack_d8 * auVar222._24_4_ + fStack_c8 * auVar11._24_4_ +
           fStack_b8 * auVar13._24_4_ + fStack_a8 * auVar12._24_4_;
      auVar203._28_4_ = auVar222._28_4_ + auVar11._28_4_ + auVar13._28_4_ + auVar12._28_4_;
      auVar222 = vpermilps_avx(auVar179,0);
      auVar11 = vpermilps_avx(auVar179,0x55);
      auVar12 = vpermilps_avx(auVar179,0xaa);
      auVar179 = vpermilps_avx(auVar179,0xff);
      auVar224._0_4_ =
           local_e0 * auVar222._0_4_ + local_d0 * auVar11._0_4_ +
           local_c0 * auVar12._0_4_ + local_b0 * auVar179._0_4_;
      auVar224._4_4_ =
           fStack_dc * auVar222._4_4_ + fStack_cc * auVar11._4_4_ +
           fStack_bc * auVar12._4_4_ + fStack_ac * auVar179._4_4_;
      auVar224._8_4_ =
           fStack_d8 * auVar222._8_4_ + fStack_c8 * auVar11._8_4_ +
           fStack_b8 * auVar12._8_4_ + fStack_a8 * auVar179._8_4_;
      auVar224._12_4_ =
           fStack_d4 * auVar222._12_4_ + fStack_c4 * auVar11._12_4_ +
           fStack_b4 * auVar12._12_4_ + fStack_a4 * auVar179._12_4_;
      auVar224._16_4_ =
           local_e0 * auVar222._16_4_ + local_d0 * auVar11._16_4_ +
           local_c0 * auVar12._16_4_ + local_b0 * auVar179._16_4_;
      auVar224._20_4_ =
           fStack_dc * auVar222._20_4_ + fStack_cc * auVar11._20_4_ +
           fStack_bc * auVar12._20_4_ + fStack_ac * auVar179._20_4_;
      auVar224._24_4_ =
           fStack_d8 * auVar222._24_4_ + fStack_c8 * auVar11._24_4_ +
           fStack_b8 * auVar12._24_4_ + fStack_a8 * auVar179._24_4_;
      auVar224._28_4_ = auVar222._28_4_ + auVar11._28_4_ + auVar12._28_4_ + auVar179._28_4_;
      auVar99._4_4_ = fStack_9c;
      auVar99._0_4_ = local_a0;
      auVar99._8_4_ = fStack_98;
      auVar99._12_4_ = fStack_94;
      auVar301._16_16_ = auVar99;
      auVar301._0_16_ = auVar99;
      auVar222 = vpermilps_avx(auVar9,0);
      auVar11 = vpermilps_avx(auVar9,0x55);
      auVar12 = vpermilps_avx(auVar9,0xaa);
      auVar9 = vpermilps_avx(auVar9,0xff);
      auVar231._0_4_ =
           local_a0 * auVar222._0_4_ + local_90 * auVar11._0_4_ +
           local_80 * auVar12._0_4_ + local_70 * auVar9._0_4_;
      auVar231._4_4_ =
           fStack_9c * auVar222._4_4_ + fStack_8c * auVar11._4_4_ +
           fStack_7c * auVar12._4_4_ + fStack_6c * auVar9._4_4_;
      auVar231._8_4_ =
           fStack_98 * auVar222._8_4_ + fStack_88 * auVar11._8_4_ +
           fStack_78 * auVar12._8_4_ + fStack_68 * auVar9._8_4_;
      auVar231._12_4_ =
           fStack_94 * auVar222._12_4_ + fStack_84 * auVar11._12_4_ +
           fStack_74 * auVar12._12_4_ + fStack_64 * auVar9._12_4_;
      auVar231._16_4_ =
           local_a0 * auVar222._16_4_ + local_90 * auVar11._16_4_ +
           local_80 * auVar12._16_4_ + local_70 * auVar9._16_4_;
      auVar231._20_4_ =
           fStack_9c * auVar222._20_4_ + fStack_8c * auVar11._20_4_ +
           fStack_7c * auVar12._20_4_ + fStack_6c * auVar9._20_4_;
      auVar231._24_4_ =
           fStack_98 * auVar222._24_4_ + fStack_88 * auVar11._24_4_ +
           fStack_78 * auVar12._24_4_ + fStack_68 * auVar9._24_4_;
      auVar231._28_4_ = auVar222._28_4_ + auVar11._28_4_ + auVar12._28_4_ + auVar9._28_4_;
      auVar9 = vpermilps_avx(auVar10,0);
      auVar222 = vpermilps_avx(auVar10,0x55);
      auVar11 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      auVar251._0_4_ =
           local_a0 * auVar9._0_4_ + local_90 * auVar222._0_4_ +
           local_80 * auVar11._0_4_ + local_70 * auVar10._0_4_;
      auVar251._4_4_ =
           fStack_9c * auVar9._4_4_ + fStack_8c * auVar222._4_4_ +
           fStack_7c * auVar11._4_4_ + fStack_6c * auVar10._4_4_;
      auVar251._8_4_ =
           fStack_98 * auVar9._8_4_ + fStack_88 * auVar222._8_4_ +
           fStack_78 * auVar11._8_4_ + fStack_68 * auVar10._8_4_;
      auVar251._12_4_ =
           fStack_94 * auVar9._12_4_ + fStack_84 * auVar222._12_4_ +
           fStack_74 * auVar11._12_4_ + fStack_64 * auVar10._12_4_;
      auVar251._16_4_ =
           local_a0 * auVar9._16_4_ + local_90 * auVar222._16_4_ +
           local_80 * auVar11._16_4_ + local_70 * auVar10._16_4_;
      auVar251._20_4_ =
           fStack_9c * auVar9._20_4_ + fStack_8c * auVar222._20_4_ +
           fStack_7c * auVar11._20_4_ + fStack_6c * auVar10._20_4_;
      auVar251._24_4_ =
           fStack_98 * auVar9._24_4_ + fStack_88 * auVar222._24_4_ +
           fStack_78 * auVar11._24_4_ + fStack_68 * auVar10._24_4_;
      auVar251._28_4_ = auVar9._28_4_ + auVar222._28_4_ + auVar11._28_4_ + auVar10._28_4_;
      auVar9 = vpermilps_avx(auVar180,0);
      auVar10 = vpermilps_avx(auVar180,0x55);
      auVar222 = vpermilps_avx(auVar180,0xaa);
      auVar180 = vpermilps_avx(auVar180,0xff);
      auVar261._0_4_ =
           local_a0 * auVar9._0_4_ + local_90 * auVar10._0_4_ +
           local_80 * auVar222._0_4_ + local_70 * auVar180._0_4_;
      auVar261._4_4_ =
           fStack_9c * auVar9._4_4_ + fStack_8c * auVar10._4_4_ +
           fStack_7c * auVar222._4_4_ + fStack_6c * auVar180._4_4_;
      auVar261._8_4_ =
           fStack_98 * auVar9._8_4_ + fStack_88 * auVar10._8_4_ +
           fStack_78 * auVar222._8_4_ + fStack_68 * auVar180._8_4_;
      auVar261._12_4_ =
           fStack_94 * auVar9._12_4_ + fStack_84 * auVar10._12_4_ +
           fStack_74 * auVar222._12_4_ + fStack_64 * auVar180._12_4_;
      auVar261._16_4_ =
           local_a0 * auVar9._16_4_ + local_90 * auVar10._16_4_ +
           local_80 * auVar222._16_4_ + local_70 * auVar180._16_4_;
      auVar261._20_4_ =
           fStack_9c * auVar9._20_4_ + fStack_8c * auVar10._20_4_ +
           fStack_7c * auVar222._20_4_ + fStack_6c * auVar180._20_4_;
      auVar261._24_4_ =
           fStack_98 * auVar9._24_4_ + fStack_88 * auVar10._24_4_ +
           fStack_78 * auVar222._24_4_ + fStack_68 * auVar180._24_4_;
      auVar261._28_4_ = auVar9._28_4_ + auVar10._28_4_ + auVar222._28_4_ + auVar180._28_4_;
      auVar9 = vpermilps_avx(auVar297,0);
      auVar10 = vpermilps_avx(auVar297,0x55);
      auVar180 = vpermilps_avx(auVar297,0xaa);
      auVar297 = vpermilps_avx(auVar297,0xff);
      auVar270._0_4_ =
           local_a0 * auVar9._0_4_ + local_90 * auVar10._0_4_ +
           local_80 * auVar180._0_4_ + local_70 * auVar297._0_4_;
      auVar270._4_4_ =
           fStack_9c * auVar9._4_4_ + fStack_8c * auVar10._4_4_ +
           fStack_7c * auVar180._4_4_ + fStack_6c * auVar297._4_4_;
      auVar270._8_4_ =
           fStack_98 * auVar9._8_4_ + fStack_88 * auVar10._8_4_ +
           fStack_78 * auVar180._8_4_ + fStack_68 * auVar297._8_4_;
      auVar270._12_4_ =
           fStack_94 * auVar9._12_4_ + fStack_84 * auVar10._12_4_ +
           fStack_74 * auVar180._12_4_ + fStack_64 * auVar297._12_4_;
      auVar270._16_4_ =
           local_a0 * auVar9._16_4_ + local_90 * auVar10._16_4_ +
           local_80 * auVar180._16_4_ + local_70 * auVar297._16_4_;
      auVar270._20_4_ =
           fStack_9c * auVar9._20_4_ + fStack_8c * auVar10._20_4_ +
           fStack_7c * auVar180._20_4_ + fStack_6c * auVar297._20_4_;
      auVar270._24_4_ =
           fStack_98 * auVar9._24_4_ + fStack_88 * auVar10._24_4_ +
           fStack_78 * auVar180._24_4_ + fStack_68 * auVar297._24_4_;
      auVar270._28_4_ = auVar9._28_4_ + auVar10._28_4_ + auVar180._28_4_ + auVar297._28_4_;
      auVar9 = vsubps_avx(auVar127,auVar231);
      auVar128._0_4_ = auVar127._0_4_ + auVar231._0_4_;
      auVar128._4_4_ = auVar127._4_4_ + auVar231._4_4_;
      auVar128._8_4_ = auVar127._8_4_ + auVar231._8_4_;
      auVar128._12_4_ = auVar127._12_4_ + auVar231._12_4_;
      auVar128._16_4_ = auVar127._16_4_ + auVar231._16_4_;
      auVar128._20_4_ = auVar127._20_4_ + auVar231._20_4_;
      auVar128._24_4_ = auVar127._24_4_ + auVar231._24_4_;
      auVar128._28_4_ = auVar127._28_4_ + auVar231._28_4_;
      auVar10 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar181,auVar251);
      auVar182._0_4_ = auVar181._0_4_ + auVar251._0_4_;
      auVar182._4_4_ = auVar181._4_4_ + auVar251._4_4_;
      auVar182._8_4_ = auVar181._8_4_ + auVar251._8_4_;
      auVar182._12_4_ = auVar181._12_4_ + auVar251._12_4_;
      auVar182._16_4_ = auVar181._16_4_ + auVar251._16_4_;
      auVar182._20_4_ = auVar181._20_4_ + auVar251._20_4_;
      auVar182._24_4_ = auVar181._24_4_ + auVar251._24_4_;
      auVar182._28_4_ = auVar181._28_4_ + auVar251._28_4_;
      auVar13 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar203,auVar261);
      auVar204._0_4_ = auVar203._0_4_ + auVar261._0_4_;
      auVar204._4_4_ = auVar203._4_4_ + auVar261._4_4_;
      auVar204._8_4_ = auVar203._8_4_ + auVar261._8_4_;
      auVar204._12_4_ = auVar203._12_4_ + auVar261._12_4_;
      auVar204._16_4_ = auVar203._16_4_ + auVar261._16_4_;
      auVar204._20_4_ = auVar203._20_4_ + auVar261._20_4_;
      auVar204._24_4_ = auVar203._24_4_ + auVar261._24_4_;
      auVar204._28_4_ = auVar203._28_4_ + auVar261._28_4_;
      auVar14 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar224,auVar270);
      auVar225._0_4_ = auVar224._0_4_ + auVar270._0_4_;
      auVar225._4_4_ = auVar224._4_4_ + auVar270._4_4_;
      auVar225._8_4_ = auVar224._8_4_ + auVar270._8_4_;
      auVar225._12_4_ = auVar224._12_4_ + auVar270._12_4_;
      auVar225._16_4_ = auVar224._16_4_ + auVar270._16_4_;
      auVar225._20_4_ = auVar224._20_4_ + auVar270._20_4_;
      auVar225._24_4_ = auVar224._24_4_ + auVar270._24_4_;
      auVar225._28_4_ = auVar224._28_4_ + auVar270._28_4_;
      auVar15 = vpermilps_avx(auVar9,0x1b);
      auVar222 = vperm2f128_avx(auVar15,auVar225,2);
      auVar180 = vperm2f128_avx(auVar14,auVar204,0x13);
      auVar297 = vperm2f128_avx(auVar14,auVar204,2);
      auVar11 = vperm2f128_avx(auVar13,auVar182,0x13);
      auVar12 = vperm2f128_avx(auVar13,auVar182,2);
      auVar9 = vperm2f128_avx(auVar10,auVar128,0x13);
      auVar179 = vperm2f128_avx(auVar10,auVar128,2);
      auVar16 = vpermilps_avx(auVar301,0xff);
      auVar125 = vpermilps_avx(auVar301,0xaa);
      auVar126 = vpermilps_avx(auVar301,0x55);
      auVar178 = vpermilps_avx(auVar301,0);
      fVar115 = auVar9._0_4_;
      fVar239 = auVar178._0_4_;
      fVar345 = auVar9._4_4_;
      fVar240 = auVar178._4_4_;
      fVar176 = auVar9._8_4_;
      fVar241 = auVar178._8_4_;
      fVar197 = auVar9._12_4_;
      fVar256 = auVar178._12_4_;
      fVar200 = auVar9._16_4_;
      fVar257 = auVar178._16_4_;
      fVar211 = auVar9._20_4_;
      fVar258 = auVar178._20_4_;
      fVar227 = auVar9._24_4_;
      fVar259 = auVar178._24_4_;
      fVar335 = auVar11._0_4_;
      fVar264 = auVar126._0_4_;
      fVar175 = auVar11._4_4_;
      fVar265 = auVar126._4_4_;
      fVar349 = auVar11._8_4_;
      fVar266 = auVar126._8_4_;
      fVar198 = auVar11._12_4_;
      fVar267 = auVar126._12_4_;
      fVar209 = auVar11._16_4_;
      fVar283 = auVar126._16_4_;
      fVar212 = auVar11._20_4_;
      fVar284 = auVar126._20_4_;
      fVar228 = auVar11._24_4_;
      fVar285 = auVar126._24_4_;
      fVar174 = auVar180._0_4_;
      fVar288 = auVar125._0_4_;
      fVar347 = auVar180._4_4_;
      fVar312 = auVar125._4_4_;
      fVar177 = auVar180._8_4_;
      fVar313 = auVar125._8_4_;
      fVar199 = auVar180._12_4_;
      fVar314 = auVar125._12_4_;
      fVar210 = auVar180._16_4_;
      fVar315 = auVar125._16_4_;
      fVar226 = auVar180._20_4_;
      fVar324 = auVar125._20_4_;
      fVar229 = auVar180._24_4_;
      fVar325 = auVar125._24_4_;
      auVar357._0_4_ = fVar288 * fVar174 + fVar264 * fVar335 + fVar239 * fVar115;
      auVar357._4_4_ = fVar312 * fVar347 + fVar265 * fVar175 + fVar240 * fVar345;
      auVar357._8_4_ = fVar313 * fVar177 + fVar266 * fVar349 + fVar241 * fVar176;
      auVar357._12_4_ = fVar314 * fVar199 + fVar267 * fVar198 + fVar256 * fVar197;
      auVar357._16_4_ = fVar315 * fVar210 + fVar283 * fVar209 + fVar257 * fVar200;
      auVar357._20_4_ = fVar324 * fVar226 + fVar284 * fVar212 + fVar258 * fVar211;
      auVar357._24_4_ = fVar325 * fVar229 + fVar285 * fVar228 + fVar259 * fVar227;
      auVar357._28_4_ = auVar14._28_4_ + auVar13._28_4_ + auVar10._28_4_;
      auVar17._4_4_ = fVar265 * fVar345;
      auVar17._0_4_ = fVar264 * fVar115;
      auVar17._8_4_ = fVar266 * fVar176;
      auVar17._12_4_ = fVar267 * fVar197;
      auVar17._16_4_ = fVar283 * fVar200;
      auVar17._20_4_ = fVar284 * fVar211;
      auVar17._24_4_ = fVar285 * fVar227;
      auVar17._28_4_ = auVar13._28_4_;
      fVar326 = auVar16._0_4_;
      fVar385 = auVar16._4_4_;
      fVar387 = auVar16._8_4_;
      fVar331 = auVar16._12_4_;
      fVar332 = auVar16._16_4_;
      fVar333 = auVar16._20_4_;
      fVar334 = auVar16._24_4_;
      fVar238 = auVar15._28_4_;
      auVar375._0_4_ = fVar239 * fVar174 + fVar326 * fVar335;
      auVar375._4_4_ = fVar240 * fVar347 + fVar385 * fVar175;
      auVar375._8_4_ = fVar241 * fVar177 + fVar387 * fVar349;
      auVar375._12_4_ = fVar256 * fVar199 + fVar331 * fVar198;
      auVar375._16_4_ = fVar257 * fVar210 + fVar332 * fVar209;
      auVar375._20_4_ = fVar258 * fVar226 + fVar333 * fVar212;
      auVar375._24_4_ = fVar259 * fVar229 + fVar334 * fVar228;
      auVar375._28_4_ = fVar238 + auVar14._28_4_;
      auVar9 = vsubps_avx(auVar17,auVar375);
      auVar18._4_4_ = fVar312 * fVar345;
      auVar18._0_4_ = fVar288 * fVar115;
      auVar18._8_4_ = fVar313 * fVar176;
      auVar18._12_4_ = fVar314 * fVar197;
      auVar18._16_4_ = fVar315 * fVar200;
      auVar18._20_4_ = fVar324 * fVar211;
      auVar18._24_4_ = fVar325 * fVar227;
      auVar18._28_4_ = auVar375._28_4_;
      auVar19._4_4_ = fVar240 * fVar175;
      auVar19._0_4_ = fVar239 * fVar335;
      auVar19._8_4_ = fVar241 * fVar349;
      auVar19._12_4_ = fVar256 * fVar198;
      auVar19._16_4_ = fVar257 * fVar209;
      auVar19._20_4_ = fVar258 * fVar212;
      auVar19._24_4_ = fVar259 * fVar228;
      auVar19._28_4_ = fVar238;
      auVar10 = vsubps_avx(auVar18,auVar19);
      auVar376._0_4_ = auVar10._0_4_ + fVar326 * fVar174;
      auVar376._4_4_ = auVar10._4_4_ + fVar385 * fVar347;
      auVar376._8_4_ = auVar10._8_4_ + fVar387 * fVar177;
      auVar376._12_4_ = auVar10._12_4_ + fVar331 * fVar199;
      auVar376._16_4_ = auVar10._16_4_ + fVar332 * fVar210;
      auVar376._20_4_ = auVar10._20_4_ + fVar333 * fVar226;
      auVar376._24_4_ = auVar10._24_4_ + fVar334 * fVar229;
      auVar376._28_4_ = auVar10._28_4_ + fVar238;
      auVar20._4_4_ = fVar312 * fVar175;
      auVar20._0_4_ = fVar288 * fVar335;
      auVar20._8_4_ = fVar313 * fVar349;
      auVar20._12_4_ = fVar314 * fVar198;
      auVar20._16_4_ = fVar315 * fVar209;
      auVar20._20_4_ = fVar324 * fVar212;
      auVar20._24_4_ = fVar325 * fVar228;
      auVar20._28_4_ = auVar11._28_4_;
      auVar391._0_4_ = fVar326 * fVar115 + fVar264 * fVar174;
      auVar391._4_4_ = fVar385 * fVar345 + fVar265 * fVar347;
      auVar391._8_4_ = fVar387 * fVar176 + fVar266 * fVar177;
      auVar391._12_4_ = fVar331 * fVar197 + fVar267 * fVar199;
      auVar391._16_4_ = fVar332 * fVar200 + fVar283 * fVar210;
      auVar391._20_4_ = fVar333 * fVar211 + fVar284 * fVar226;
      auVar391._24_4_ = fVar334 * fVar227 + fVar285 * fVar229;
      auVar391._28_4_ = fVar238 + auVar180._28_4_;
      auVar10 = vsubps_avx(auVar391,auVar20);
      auVar92._4_4_ = fStack_d4;
      auVar92._0_4_ = fStack_d8;
      auVar92._8_4_ = local_d0;
      auVar92._12_4_ = fStack_cc;
      auVar183._16_16_ = auVar92;
      auVar183._0_16_ = auVar92;
      auVar11 = vpermilps_avx(auVar183,0xff);
      auVar13 = vpermilps_avx(auVar183,0xaa);
      auVar180 = vpermilps_avx(auVar183,0);
      fVar349 = auVar179._0_4_ * auVar180._0_4_;
      fVar177 = auVar179._4_4_ * auVar180._4_4_;
      auVar21._4_4_ = fVar177;
      auVar21._0_4_ = fVar349;
      fVar197 = auVar179._8_4_ * auVar180._8_4_;
      auVar21._8_4_ = fVar197;
      fVar198 = auVar179._12_4_ * auVar180._12_4_;
      auVar21._12_4_ = fVar198;
      fVar199 = auVar179._16_4_ * auVar180._16_4_;
      auVar21._16_4_ = fVar199;
      fVar200 = auVar179._20_4_ * auVar180._20_4_;
      auVar21._20_4_ = fVar200;
      fVar209 = auVar179._24_4_ * auVar180._24_4_;
      auVar21._24_4_ = fVar209;
      auVar21._28_4_ = auVar16._28_4_;
      fVar115 = auVar297._0_4_ * auVar180._0_4_;
      fVar335 = auVar297._4_4_ * auVar180._4_4_;
      auVar22._4_4_ = fVar335;
      auVar22._0_4_ = fVar115;
      fVar174 = auVar297._8_4_ * auVar180._8_4_;
      auVar22._8_4_ = fVar174;
      fVar345 = auVar297._12_4_ * auVar180._12_4_;
      auVar22._12_4_ = fVar345;
      fVar175 = auVar297._16_4_ * auVar180._16_4_;
      auVar22._16_4_ = fVar175;
      fVar347 = auVar297._20_4_ * auVar180._20_4_;
      auVar22._20_4_ = fVar347;
      fVar176 = auVar297._24_4_ * auVar180._24_4_;
      auVar22._24_4_ = fVar176;
      auVar22._28_4_ = auVar297._28_4_;
      auVar340._0_4_ = fVar349 + fVar115;
      auVar340._4_4_ = fVar177 + fVar335;
      auVar340._8_4_ = fVar197 + fVar174;
      auVar340._12_4_ = fVar198 + fVar345;
      auVar340._16_4_ = fVar199 + fVar175;
      auVar340._20_4_ = fVar200 + fVar347;
      auVar340._24_4_ = fVar209 + fVar176;
      auVar340._28_4_ = auVar16._28_4_ + auVar297._28_4_;
      auVar180 = vsubps_avx(auVar21,auVar22);
      auVar271._0_4_ = auVar222._0_4_ * auVar11._0_4_ + auVar12._0_4_ * auVar13._0_4_;
      auVar271._4_4_ = auVar222._4_4_ * auVar11._4_4_ + auVar12._4_4_ * auVar13._4_4_;
      auVar271._8_4_ = auVar222._8_4_ * auVar11._8_4_ + auVar12._8_4_ * auVar13._8_4_;
      auVar271._12_4_ = auVar222._12_4_ * auVar11._12_4_ + auVar12._12_4_ * auVar13._12_4_;
      auVar271._16_4_ = auVar222._16_4_ * auVar11._16_4_ + auVar12._16_4_ * auVar13._16_4_;
      auVar271._20_4_ = auVar222._20_4_ * auVar11._20_4_ + auVar12._20_4_ * auVar13._20_4_;
      auVar271._24_4_ = auVar222._24_4_ * auVar11._24_4_ + auVar12._24_4_ * auVar13._24_4_;
      auVar271._28_4_ = auVar126._28_4_ + auVar270._28_4_;
      auVar302._0_4_ = auVar340._0_4_ + auVar271._0_4_;
      auVar302._4_4_ = auVar340._4_4_ + auVar271._4_4_;
      auVar302._8_4_ = auVar340._8_4_ + auVar271._8_4_;
      auVar302._12_4_ = auVar340._12_4_ + auVar271._12_4_;
      auVar302._16_4_ = auVar340._16_4_ + auVar271._16_4_;
      auVar302._20_4_ = auVar340._20_4_ + auVar271._20_4_;
      auVar302._24_4_ = auVar340._24_4_ + auVar271._24_4_;
      auVar302._28_4_ = auVar340._28_4_ + auVar271._28_4_;
      auVar297 = vsubps_avx(auVar340,auVar271);
      auVar23._4_4_ = auVar12._4_4_ * auVar11._4_4_;
      auVar23._0_4_ = auVar12._0_4_ * auVar11._0_4_;
      auVar23._8_4_ = auVar12._8_4_ * auVar11._8_4_;
      auVar23._12_4_ = auVar12._12_4_ * auVar11._12_4_;
      auVar23._16_4_ = auVar12._16_4_ * auVar11._16_4_;
      auVar23._20_4_ = auVar12._20_4_ * auVar11._20_4_;
      auVar23._24_4_ = auVar12._24_4_ * auVar11._24_4_;
      auVar23._28_4_ = auVar271._28_4_;
      auVar24._4_4_ = auVar222._4_4_ * auVar13._4_4_;
      auVar24._0_4_ = auVar222._0_4_ * auVar13._0_4_;
      auVar24._8_4_ = auVar222._8_4_ * auVar13._8_4_;
      auVar24._12_4_ = auVar222._12_4_ * auVar13._12_4_;
      auVar24._16_4_ = auVar222._16_4_ * auVar13._16_4_;
      auVar24._20_4_ = auVar222._20_4_ * auVar13._20_4_;
      auVar24._24_4_ = auVar222._24_4_ * auVar13._24_4_;
      auVar24._28_4_ = auVar126._28_4_;
      auVar222 = vsubps_avx(auVar23,auVar24);
      auVar319._0_4_ = auVar180._0_4_ + auVar222._0_4_;
      auVar319._4_4_ = auVar180._4_4_ + auVar222._4_4_;
      auVar319._8_4_ = auVar180._8_4_ + auVar222._8_4_;
      auVar319._12_4_ = auVar180._12_4_ + auVar222._12_4_;
      auVar319._16_4_ = auVar180._16_4_ + auVar222._16_4_;
      auVar319._20_4_ = auVar180._20_4_ + auVar222._20_4_;
      auVar319._24_4_ = auVar180._24_4_ + auVar222._24_4_;
      auVar319._28_4_ = auVar180._28_4_ + auVar222._28_4_;
      auVar180 = vsubps_avx(auVar180,auVar222);
      auVar222 = vsubps_avx(auVar302,auVar357);
      auVar11 = vsubps_avx(auVar319,auVar9);
      auVar12 = vsubps_avx(auVar180,auVar376);
      auVar179 = vsubps_avx(auVar297,auVar10);
      *(float *)(undefined1 *)local_108._buffer = auVar302._0_4_ + auVar357._0_4_;
      *(float *)((undefined1 *)local_108._buffer + 4) = auVar302._4_4_ + auVar357._4_4_;
      *(float *)((undefined1 *)local_108._buffer + 8) = auVar302._8_4_ + auVar357._8_4_;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = auVar302._12_4_ + auVar357._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) =
           auVar302._16_4_ + auVar357._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) =
           auVar302._20_4_ + auVar357._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) =
           auVar302._24_4_ + auVar357._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) =
           auVar302._28_4_ + auVar357._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) =
           auVar319._0_4_ + auVar9._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) =
           auVar319._4_4_ + auVar9._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) =
           auVar319._8_4_ + auVar9._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) =
           auVar319._12_4_ + auVar9._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) =
           auVar319._16_4_ + auVar9._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) =
           auVar319._20_4_ + auVar9._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) =
           auVar319._24_4_ + auVar9._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) =
           auVar319._28_4_ + auVar9._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) =
           auVar180._0_4_ + auVar376._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) =
           auVar180._4_4_ + auVar376._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) =
           auVar180._8_4_ + auVar376._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) =
           auVar180._12_4_ + auVar376._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) =
           auVar180._16_4_ + auVar376._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) =
           auVar180._20_4_ + auVar376._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) =
           auVar180._24_4_ + auVar376._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) =
           auVar180._28_4_ + auVar376._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) =
           auVar297._0_4_ + auVar10._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) =
           auVar297._4_4_ + auVar10._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) =
           auVar297._8_4_ + auVar10._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) =
           auVar297._12_4_ + auVar10._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) =
           auVar297._16_4_ + auVar10._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) =
           auVar297._20_4_ + auVar10._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) =
           auVar297._24_4_ + auVar10._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) =
           auVar297._28_4_ + auVar10._28_4_;
      *(undefined1 (*) [32])((long)local_108._buffer + 0x80) = auVar179;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xa0) = auVar12;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xc0) = auVar11;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xe0) = auVar222;
      in_ZMM7 = ZEXT1664(auVar222._0_16_);
      auVar159 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_f8,&local_108,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"6x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      for (uVar113 = 0; auVar287 = in_ZMM7._28_36_, uVar113 != 0x40; uVar113 = uVar113 + 1) {
        auVar159._0_16_ = ZEXT816(0);
        if (uVar113 < 0x30) {
          auVar168._0_8_ = (double)Imath_3_2::erand48(local_e6);
          auVar168._8_56_ = extraout_var_18;
          auVar159._4_60_ = auVar168._4_60_;
          auVar159._0_4_ = (float)auVar168._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = auVar159._0_4_;
        local_f8._buffer[uVar113] = auVar159._0_4_;
      }
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      puVar109 = &DAT_001a4be0;
      pfVar110 = &local_e0;
      for (lVar112 = 0x10; lVar112 != 0; lVar112 = lVar112 + -1) {
        *(undefined8 *)pfVar110 = *puVar109;
        puVar109 = puVar109 + (ulong)bVar114 * -2 + 1;
        pfVar110 = pfVar110 + ((ulong)bVar114 * -2 + 1) * 2;
      }
      auVar377._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      auVar377._0_16_ = *(undefined1 (*) [16])local_108._buffer;
      auVar392._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      auVar392._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      auVar10 = vunpcklpd_avx(auVar377,auVar392);
      auVar9 = vunpckhpd_avx(auVar377,auVar392);
      auVar180 = vunpcklps_avx(auVar10,auVar9);
      auVar9 = vunpckhps_avx(auVar10,auVar9);
      auVar297 = vunpcklpd_avx(auVar180,auVar9);
      auVar9 = vunpckhpd_avx(auVar180,auVar9);
      auVar358._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x60);
      auVar358._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x40);
      auVar367._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x70);
      auVar367._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x50);
      auVar180 = vunpcklpd_avx(auVar358,auVar367);
      auVar10 = vunpckhpd_avx(auVar358,auVar367);
      auVar11 = vunpcklps_avx(auVar180,auVar10);
      auVar10 = vunpckhps_avx(auVar180,auVar10);
      auVar222 = vunpcklpd_avx(auVar11,auVar10);
      auVar10 = vunpckhpd_avx(auVar11,auVar10);
      auVar329._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xa0);
      auVar329._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x80);
      auVar341._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xb0);
      auVar341._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x90);
      auVar11 = vunpcklpd_avx(auVar329,auVar341);
      auVar180 = vunpckhpd_avx(auVar329,auVar341);
      auVar12 = vunpcklps_avx(auVar11,auVar180);
      auVar180 = vunpckhps_avx(auVar11,auVar180);
      auVar11 = vunpcklpd_avx(auVar12,auVar180);
      auVar180 = vunpckhpd_avx(auVar12,auVar180);
      auVar12 = vpermilps_avx(auVar297,0);
      auVar179 = vpermilps_avx(auVar297,0x55);
      auVar13 = vpermilps_avx(auVar297,0xaa);
      auVar297 = vpermilps_avx(auVar297,0xff);
      auVar129._0_4_ =
           local_e0 * auVar12._0_4_ + local_d0 * auVar179._0_4_ +
           local_c0 * auVar13._0_4_ + local_b0 * auVar297._0_4_;
      auVar129._4_4_ =
           fStack_dc * auVar12._4_4_ + fStack_cc * auVar179._4_4_ +
           fStack_bc * auVar13._4_4_ + fStack_ac * auVar297._4_4_;
      auVar129._8_4_ =
           fStack_d8 * auVar12._8_4_ + fStack_c8 * auVar179._8_4_ +
           fStack_b8 * auVar13._8_4_ + fStack_a8 * auVar297._8_4_;
      auVar129._12_4_ =
           fStack_d4 * auVar12._12_4_ + fStack_c4 * auVar179._12_4_ +
           fStack_b4 * auVar13._12_4_ + fStack_a4 * auVar297._12_4_;
      auVar129._16_4_ =
           local_e0 * auVar12._16_4_ + local_d0 * auVar179._16_4_ +
           local_c0 * auVar13._16_4_ + local_b0 * auVar297._16_4_;
      auVar129._20_4_ =
           fStack_dc * auVar12._20_4_ + fStack_cc * auVar179._20_4_ +
           fStack_bc * auVar13._20_4_ + fStack_ac * auVar297._20_4_;
      auVar129._24_4_ =
           fStack_d8 * auVar12._24_4_ + fStack_c8 * auVar179._24_4_ +
           fStack_b8 * auVar13._24_4_ + fStack_a8 * auVar297._24_4_;
      auVar129._28_4_ = auVar12._28_4_ + auVar179._28_4_ + auVar13._28_4_ + auVar297._28_4_;
      auVar297 = vpermilps_avx(auVar222,0);
      auVar12 = vpermilps_avx(auVar222,0x55);
      auVar179 = vpermilps_avx(auVar222,0xaa);
      auVar222 = vpermilps_avx(auVar222,0xff);
      auVar184._0_4_ =
           local_e0 * auVar297._0_4_ + local_d0 * auVar12._0_4_ +
           local_c0 * auVar179._0_4_ + local_b0 * auVar222._0_4_;
      auVar184._4_4_ =
           fStack_dc * auVar297._4_4_ + fStack_cc * auVar12._4_4_ +
           fStack_bc * auVar179._4_4_ + fStack_ac * auVar222._4_4_;
      auVar184._8_4_ =
           fStack_d8 * auVar297._8_4_ + fStack_c8 * auVar12._8_4_ +
           fStack_b8 * auVar179._8_4_ + fStack_a8 * auVar222._8_4_;
      auVar184._12_4_ =
           fStack_d4 * auVar297._12_4_ + fStack_c4 * auVar12._12_4_ +
           fStack_b4 * auVar179._12_4_ + fStack_a4 * auVar222._12_4_;
      auVar184._16_4_ =
           local_e0 * auVar297._16_4_ + local_d0 * auVar12._16_4_ +
           local_c0 * auVar179._16_4_ + local_b0 * auVar222._16_4_;
      auVar184._20_4_ =
           fStack_dc * auVar297._20_4_ + fStack_cc * auVar12._20_4_ +
           fStack_bc * auVar179._20_4_ + fStack_ac * auVar222._20_4_;
      auVar184._24_4_ =
           fStack_d8 * auVar297._24_4_ + fStack_c8 * auVar12._24_4_ +
           fStack_b8 * auVar179._24_4_ + fStack_a8 * auVar222._24_4_;
      auVar184._28_4_ = auVar297._28_4_ + auVar12._28_4_ + auVar179._28_4_ + auVar222._28_4_;
      auVar297 = vpermilps_avx(auVar11,0);
      auVar222 = vpermilps_avx(auVar11,0x55);
      auVar12 = vpermilps_avx(auVar11,0xaa);
      auVar11 = vpermilps_avx(auVar11,0xff);
      auVar205._0_4_ =
           local_e0 * auVar297._0_4_ + local_d0 * auVar222._0_4_ +
           local_c0 * auVar12._0_4_ + local_b0 * auVar11._0_4_;
      auVar205._4_4_ =
           fStack_dc * auVar297._4_4_ + fStack_cc * auVar222._4_4_ +
           fStack_bc * auVar12._4_4_ + fStack_ac * auVar11._4_4_;
      auVar205._8_4_ =
           fStack_d8 * auVar297._8_4_ + fStack_c8 * auVar222._8_4_ +
           fStack_b8 * auVar12._8_4_ + fStack_a8 * auVar11._8_4_;
      auVar205._12_4_ =
           fStack_d4 * auVar297._12_4_ + fStack_c4 * auVar222._12_4_ +
           fStack_b4 * auVar12._12_4_ + fStack_a4 * auVar11._12_4_;
      auVar205._16_4_ =
           local_e0 * auVar297._16_4_ + local_d0 * auVar222._16_4_ +
           local_c0 * auVar12._16_4_ + local_b0 * auVar11._16_4_;
      auVar205._20_4_ =
           fStack_dc * auVar297._20_4_ + fStack_cc * auVar222._20_4_ +
           fStack_bc * auVar12._20_4_ + fStack_ac * auVar11._20_4_;
      auVar205._24_4_ =
           fStack_d8 * auVar297._24_4_ + fStack_c8 * auVar222._24_4_ +
           fStack_b8 * auVar12._24_4_ + fStack_a8 * auVar11._24_4_;
      auVar205._28_4_ = auVar297._28_4_ + auVar222._28_4_ + auVar12._28_4_ + auVar11._28_4_;
      auVar100._4_4_ = fStack_9c;
      auVar100._0_4_ = local_a0;
      auVar100._8_4_ = fStack_98;
      auVar100._12_4_ = fStack_94;
      auVar303._16_16_ = auVar100;
      auVar303._0_16_ = auVar100;
      auVar297 = vpermilps_avx(auVar9,0);
      auVar222 = vpermilps_avx(auVar9,0x55);
      auVar11 = vpermilps_avx(auVar9,0xaa);
      auVar9 = vpermilps_avx(auVar9,0xff);
      auVar232._0_4_ =
           local_a0 * auVar297._0_4_ + local_90 * auVar222._0_4_ +
           local_80 * auVar11._0_4_ + local_70 * auVar9._0_4_;
      auVar232._4_4_ =
           fStack_9c * auVar297._4_4_ + fStack_8c * auVar222._4_4_ +
           fStack_7c * auVar11._4_4_ + fStack_6c * auVar9._4_4_;
      auVar232._8_4_ =
           fStack_98 * auVar297._8_4_ + fStack_88 * auVar222._8_4_ +
           fStack_78 * auVar11._8_4_ + fStack_68 * auVar9._8_4_;
      auVar232._12_4_ =
           fStack_94 * auVar297._12_4_ + fStack_84 * auVar222._12_4_ +
           fStack_74 * auVar11._12_4_ + fStack_64 * auVar9._12_4_;
      auVar232._16_4_ =
           local_a0 * auVar297._16_4_ + local_90 * auVar222._16_4_ +
           local_80 * auVar11._16_4_ + local_70 * auVar9._16_4_;
      auVar232._20_4_ =
           fStack_9c * auVar297._20_4_ + fStack_8c * auVar222._20_4_ +
           fStack_7c * auVar11._20_4_ + fStack_6c * auVar9._20_4_;
      auVar232._24_4_ =
           fStack_98 * auVar297._24_4_ + fStack_88 * auVar222._24_4_ +
           fStack_78 * auVar11._24_4_ + fStack_68 * auVar9._24_4_;
      auVar232._28_4_ = auVar297._28_4_ + auVar222._28_4_ + auVar11._28_4_ + auVar9._28_4_;
      auVar9 = vpermilps_avx(auVar10,0);
      auVar297 = vpermilps_avx(auVar10,0x55);
      auVar222 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      auVar252._0_4_ =
           local_a0 * auVar9._0_4_ + local_90 * auVar297._0_4_ +
           local_80 * auVar222._0_4_ + local_70 * auVar10._0_4_;
      auVar252._4_4_ =
           fStack_9c * auVar9._4_4_ + fStack_8c * auVar297._4_4_ +
           fStack_7c * auVar222._4_4_ + fStack_6c * auVar10._4_4_;
      auVar252._8_4_ =
           fStack_98 * auVar9._8_4_ + fStack_88 * auVar297._8_4_ +
           fStack_78 * auVar222._8_4_ + fStack_68 * auVar10._8_4_;
      auVar252._12_4_ =
           fStack_94 * auVar9._12_4_ + fStack_84 * auVar297._12_4_ +
           fStack_74 * auVar222._12_4_ + fStack_64 * auVar10._12_4_;
      auVar252._16_4_ =
           local_a0 * auVar9._16_4_ + local_90 * auVar297._16_4_ +
           local_80 * auVar222._16_4_ + local_70 * auVar10._16_4_;
      auVar252._20_4_ =
           fStack_9c * auVar9._20_4_ + fStack_8c * auVar297._20_4_ +
           fStack_7c * auVar222._20_4_ + fStack_6c * auVar10._20_4_;
      auVar252._24_4_ =
           fStack_98 * auVar9._24_4_ + fStack_88 * auVar297._24_4_ +
           fStack_78 * auVar222._24_4_ + fStack_68 * auVar10._24_4_;
      auVar252._28_4_ = auVar9._28_4_ + auVar297._28_4_ + auVar222._28_4_ + auVar10._28_4_;
      auVar9 = vpermilps_avx(auVar180,0);
      auVar10 = vpermilps_avx(auVar180,0x55);
      auVar297 = vpermilps_avx(auVar180,0xaa);
      auVar180 = vpermilps_avx(auVar180,0xff);
      fVar238 = auVar180._28_4_;
      auVar262._0_4_ =
           local_a0 * auVar9._0_4_ + local_90 * auVar10._0_4_ +
           local_80 * auVar297._0_4_ + local_70 * auVar180._0_4_;
      auVar262._4_4_ =
           fStack_9c * auVar9._4_4_ + fStack_8c * auVar10._4_4_ +
           fStack_7c * auVar297._4_4_ + fStack_6c * auVar180._4_4_;
      auVar262._8_4_ =
           fStack_98 * auVar9._8_4_ + fStack_88 * auVar10._8_4_ +
           fStack_78 * auVar297._8_4_ + fStack_68 * auVar180._8_4_;
      auVar262._12_4_ =
           fStack_94 * auVar9._12_4_ + fStack_84 * auVar10._12_4_ +
           fStack_74 * auVar297._12_4_ + fStack_64 * auVar180._12_4_;
      auVar262._16_4_ =
           local_a0 * auVar9._16_4_ + local_90 * auVar10._16_4_ +
           local_80 * auVar297._16_4_ + local_70 * auVar180._16_4_;
      auVar262._20_4_ =
           fStack_9c * auVar9._20_4_ + fStack_8c * auVar10._20_4_ +
           fStack_7c * auVar297._20_4_ + fStack_6c * auVar180._20_4_;
      auVar262._24_4_ =
           fStack_98 * auVar9._24_4_ + fStack_88 * auVar10._24_4_ +
           fStack_78 * auVar297._24_4_ + fStack_68 * auVar180._24_4_;
      auVar262._28_4_ = auVar9._28_4_ + auVar10._28_4_ + auVar297._28_4_ + fVar238;
      auVar9 = vsubps_avx(auVar129,auVar232);
      auVar130._0_4_ = auVar129._0_4_ + auVar232._0_4_;
      auVar130._4_4_ = auVar129._4_4_ + auVar232._4_4_;
      auVar130._8_4_ = auVar129._8_4_ + auVar232._8_4_;
      auVar130._12_4_ = auVar129._12_4_ + auVar232._12_4_;
      auVar130._16_4_ = auVar129._16_4_ + auVar232._16_4_;
      auVar130._20_4_ = auVar129._20_4_ + auVar232._20_4_;
      auVar130._24_4_ = auVar129._24_4_ + auVar232._24_4_;
      auVar130._28_4_ = auVar129._28_4_ + auVar232._28_4_;
      auVar10 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar184,auVar252);
      auVar185._0_4_ = auVar184._0_4_ + auVar252._0_4_;
      auVar185._4_4_ = auVar184._4_4_ + auVar252._4_4_;
      auVar185._8_4_ = auVar184._8_4_ + auVar252._8_4_;
      auVar185._12_4_ = auVar184._12_4_ + auVar252._12_4_;
      auVar185._16_4_ = auVar184._16_4_ + auVar252._16_4_;
      auVar185._20_4_ = auVar184._20_4_ + auVar252._20_4_;
      auVar185._24_4_ = auVar184._24_4_ + auVar252._24_4_;
      auVar185._28_4_ = auVar184._28_4_ + auVar252._28_4_;
      auVar179 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar205,auVar262);
      auVar206._0_4_ = auVar205._0_4_ + auVar262._0_4_;
      auVar206._4_4_ = auVar205._4_4_ + auVar262._4_4_;
      auVar206._8_4_ = auVar205._8_4_ + auVar262._8_4_;
      auVar206._12_4_ = auVar205._12_4_ + auVar262._12_4_;
      auVar206._16_4_ = auVar205._16_4_ + auVar262._16_4_;
      auVar206._20_4_ = auVar205._20_4_ + auVar262._20_4_;
      auVar206._24_4_ = auVar205._24_4_ + auVar262._24_4_;
      auVar206._28_4_ = auVar205._28_4_ + auVar262._28_4_;
      auVar13 = vpermilps_avx(auVar9,0x1b);
      auVar180 = vperm2f128_avx(auVar13,auVar206,0x13);
      auVar297 = vperm2f128_avx(auVar13,auVar206,2);
      auVar222 = vperm2f128_avx(auVar179,auVar185,0x13);
      auVar11 = vperm2f128_avx(auVar179,auVar185,2);
      auVar9 = vperm2f128_avx(auVar10,auVar130,0x13);
      auVar12 = vperm2f128_avx(auVar10,auVar130,2);
      auVar14 = vpermilps_avx(auVar303,0xff);
      auVar15 = vpermilps_avx(auVar303,0xaa);
      auVar16 = vpermilps_avx(auVar303,0x55);
      auVar125 = vpermilps_avx(auVar303,0);
      fVar115 = auVar9._0_4_;
      fVar239 = auVar125._0_4_;
      fVar345 = auVar9._4_4_;
      fVar240 = auVar125._4_4_;
      fVar176 = auVar9._8_4_;
      fVar241 = auVar125._8_4_;
      fVar197 = auVar9._12_4_;
      fVar256 = auVar125._12_4_;
      fVar200 = auVar9._16_4_;
      fVar257 = auVar125._16_4_;
      fVar211 = auVar9._20_4_;
      fVar258 = auVar125._20_4_;
      fVar227 = auVar9._24_4_;
      fVar259 = auVar125._24_4_;
      fVar335 = auVar222._0_4_;
      fVar264 = auVar16._0_4_;
      fVar175 = auVar222._4_4_;
      fVar265 = auVar16._4_4_;
      fVar349 = auVar222._8_4_;
      fVar266 = auVar16._8_4_;
      fVar198 = auVar222._12_4_;
      fVar267 = auVar16._12_4_;
      fVar209 = auVar222._16_4_;
      fVar283 = auVar16._16_4_;
      fVar212 = auVar222._20_4_;
      fVar284 = auVar16._20_4_;
      fVar228 = auVar222._24_4_;
      fVar285 = auVar16._24_4_;
      fVar174 = auVar180._0_4_;
      fVar288 = auVar15._0_4_;
      fVar347 = auVar180._4_4_;
      fVar312 = auVar15._4_4_;
      fVar177 = auVar180._8_4_;
      fVar313 = auVar15._8_4_;
      fVar199 = auVar180._12_4_;
      fVar314 = auVar15._12_4_;
      fVar210 = auVar180._16_4_;
      fVar315 = auVar15._16_4_;
      fVar226 = auVar180._20_4_;
      fVar324 = auVar15._20_4_;
      fVar229 = auVar180._24_4_;
      fVar325 = auVar15._24_4_;
      auVar359._0_4_ = fVar288 * fVar174 + fVar264 * fVar335 + fVar239 * fVar115;
      auVar359._4_4_ = fVar312 * fVar347 + fVar265 * fVar175 + fVar240 * fVar345;
      auVar359._8_4_ = fVar313 * fVar177 + fVar266 * fVar349 + fVar241 * fVar176;
      auVar359._12_4_ = fVar314 * fVar199 + fVar267 * fVar198 + fVar256 * fVar197;
      auVar359._16_4_ = fVar315 * fVar210 + fVar283 * fVar209 + fVar257 * fVar200;
      auVar359._20_4_ = fVar324 * fVar226 + fVar284 * fVar212 + fVar258 * fVar211;
      auVar359._24_4_ = fVar325 * fVar229 + fVar285 * fVar228 + fVar259 * fVar227;
      auVar359._28_4_ = auVar13._28_4_ + auVar179._28_4_ + auVar10._28_4_;
      auVar25._4_4_ = fVar265 * fVar345;
      auVar25._0_4_ = fVar264 * fVar115;
      auVar25._8_4_ = fVar266 * fVar176;
      auVar25._12_4_ = fVar267 * fVar197;
      auVar25._16_4_ = fVar283 * fVar200;
      auVar25._20_4_ = fVar284 * fVar211;
      auVar25._24_4_ = fVar285 * fVar227;
      auVar25._28_4_ = auVar179._28_4_;
      fVar326 = auVar14._0_4_;
      fVar385 = auVar14._4_4_;
      fVar387 = auVar14._8_4_;
      fVar331 = auVar14._12_4_;
      fVar332 = auVar14._16_4_;
      fVar333 = auVar14._20_4_;
      fVar334 = auVar14._24_4_;
      auVar378._0_4_ = fVar239 * fVar174 + fVar326 * fVar335;
      auVar378._4_4_ = fVar240 * fVar347 + fVar385 * fVar175;
      auVar378._8_4_ = fVar241 * fVar177 + fVar387 * fVar349;
      auVar378._12_4_ = fVar256 * fVar199 + fVar331 * fVar198;
      auVar378._16_4_ = fVar257 * fVar210 + fVar332 * fVar209;
      auVar378._20_4_ = fVar258 * fVar226 + fVar333 * fVar212;
      auVar378._24_4_ = fVar259 * fVar229 + fVar334 * fVar228;
      auVar378._28_4_ = fVar238 + auVar13._28_4_;
      auVar9 = vsubps_avx(auVar25,auVar378);
      auVar26._4_4_ = fVar312 * fVar345;
      auVar26._0_4_ = fVar288 * fVar115;
      auVar26._8_4_ = fVar313 * fVar176;
      auVar26._12_4_ = fVar314 * fVar197;
      auVar26._16_4_ = fVar315 * fVar200;
      auVar26._20_4_ = fVar324 * fVar211;
      auVar26._24_4_ = fVar325 * fVar227;
      auVar26._28_4_ = auVar378._28_4_;
      auVar27._4_4_ = fVar240 * fVar175;
      auVar27._0_4_ = fVar239 * fVar335;
      auVar27._8_4_ = fVar241 * fVar349;
      auVar27._12_4_ = fVar256 * fVar198;
      auVar27._16_4_ = fVar257 * fVar209;
      auVar27._20_4_ = fVar258 * fVar212;
      auVar27._24_4_ = fVar259 * fVar228;
      auVar27._28_4_ = fVar238;
      auVar10 = vsubps_avx(auVar26,auVar27);
      auVar379._0_4_ = auVar10._0_4_ + fVar326 * fVar174;
      auVar379._4_4_ = auVar10._4_4_ + fVar385 * fVar347;
      auVar379._8_4_ = auVar10._8_4_ + fVar387 * fVar177;
      auVar379._12_4_ = auVar10._12_4_ + fVar331 * fVar199;
      auVar379._16_4_ = auVar10._16_4_ + fVar332 * fVar210;
      auVar379._20_4_ = auVar10._20_4_ + fVar333 * fVar226;
      auVar379._24_4_ = auVar10._24_4_ + fVar334 * fVar229;
      auVar379._28_4_ = auVar10._28_4_ + fVar238;
      auVar28._4_4_ = fVar312 * fVar175;
      auVar28._0_4_ = fVar288 * fVar335;
      auVar28._8_4_ = fVar313 * fVar349;
      auVar28._12_4_ = fVar314 * fVar198;
      auVar28._16_4_ = fVar315 * fVar209;
      auVar28._20_4_ = fVar324 * fVar212;
      auVar28._24_4_ = fVar325 * fVar228;
      auVar28._28_4_ = auVar222._28_4_;
      auVar393._0_4_ = fVar326 * fVar115 + fVar264 * fVar174;
      auVar393._4_4_ = fVar385 * fVar345 + fVar265 * fVar347;
      auVar393._8_4_ = fVar387 * fVar176 + fVar266 * fVar177;
      auVar393._12_4_ = fVar331 * fVar197 + fVar267 * fVar199;
      auVar393._16_4_ = fVar332 * fVar200 + fVar283 * fVar210;
      auVar393._20_4_ = fVar333 * fVar211 + fVar284 * fVar226;
      auVar393._24_4_ = fVar334 * fVar227 + fVar285 * fVar229;
      auVar393._28_4_ = fVar238 + auVar180._28_4_;
      auVar10 = vsubps_avx(auVar393,auVar28);
      auVar93._4_4_ = fStack_d4;
      auVar93._0_4_ = fStack_d8;
      auVar93._8_4_ = local_d0;
      auVar93._12_4_ = fStack_cc;
      auVar186._16_16_ = auVar93;
      auVar186._0_16_ = auVar93;
      auVar222 = vpermilps_avx(auVar186,0xff);
      auVar179 = vpermilps_avx(auVar186,0xaa);
      auVar180 = vpermilps_avx(auVar186,0);
      fVar349 = auVar12._0_4_ * auVar180._0_4_;
      fVar177 = auVar12._4_4_ * auVar180._4_4_;
      auVar29._4_4_ = fVar177;
      auVar29._0_4_ = fVar349;
      fVar197 = auVar12._8_4_ * auVar180._8_4_;
      auVar29._8_4_ = fVar197;
      fVar198 = auVar12._12_4_ * auVar180._12_4_;
      auVar29._12_4_ = fVar198;
      fVar199 = auVar12._16_4_ * auVar180._16_4_;
      auVar29._16_4_ = fVar199;
      fVar200 = auVar12._20_4_ * auVar180._20_4_;
      auVar29._20_4_ = fVar200;
      fVar209 = auVar12._24_4_ * auVar180._24_4_;
      auVar29._24_4_ = fVar209;
      auVar29._28_4_ = auVar14._28_4_;
      fVar115 = auVar297._0_4_ * auVar180._0_4_;
      fVar335 = auVar297._4_4_ * auVar180._4_4_;
      auVar30._4_4_ = fVar335;
      auVar30._0_4_ = fVar115;
      fVar174 = auVar297._8_4_ * auVar180._8_4_;
      auVar30._8_4_ = fVar174;
      fVar345 = auVar297._12_4_ * auVar180._12_4_;
      auVar30._12_4_ = fVar345;
      fVar175 = auVar297._16_4_ * auVar180._16_4_;
      auVar30._16_4_ = fVar175;
      fVar347 = auVar297._20_4_ * auVar180._20_4_;
      auVar30._20_4_ = fVar347;
      fVar176 = auVar297._24_4_ * auVar180._24_4_;
      auVar30._24_4_ = fVar176;
      auVar30._28_4_ = auVar297._28_4_;
      auVar342._0_4_ = fVar349 + fVar115;
      auVar342._4_4_ = fVar177 + fVar335;
      auVar342._8_4_ = fVar197 + fVar174;
      auVar342._12_4_ = fVar198 + fVar345;
      auVar342._16_4_ = fVar199 + fVar175;
      auVar342._20_4_ = fVar200 + fVar347;
      auVar342._24_4_ = fVar209 + fVar176;
      auVar342._28_4_ = auVar14._28_4_ + auVar297._28_4_;
      auVar180 = vsubps_avx(auVar29,auVar30);
      auVar279._0_4_ = auVar11._0_4_ * auVar179._0_4_;
      auVar279._4_4_ = auVar11._4_4_ * auVar179._4_4_;
      auVar279._8_4_ = auVar11._8_4_ * auVar179._8_4_;
      auVar279._12_4_ = auVar11._12_4_ * auVar179._12_4_;
      auVar279._16_4_ = auVar11._16_4_ * auVar179._16_4_;
      auVar279._20_4_ = auVar11._20_4_ * auVar179._20_4_;
      auVar279._24_4_ = auVar11._24_4_ * auVar179._24_4_;
      auVar279._28_36_ = auVar287;
      auVar304._0_4_ = auVar342._0_4_ + auVar279._0_4_;
      auVar304._4_4_ = auVar342._4_4_ + auVar279._4_4_;
      auVar304._8_4_ = auVar342._8_4_ + auVar279._8_4_;
      auVar304._12_4_ = auVar342._12_4_ + auVar279._12_4_;
      auVar304._16_4_ = auVar342._16_4_ + auVar279._16_4_;
      auVar304._20_4_ = auVar342._20_4_ + auVar279._20_4_;
      auVar304._24_4_ = auVar342._24_4_ + auVar279._24_4_;
      fVar115 = auVar287._0_4_;
      auVar304._28_4_ = auVar342._28_4_ + fVar115;
      auVar297 = vsubps_avx(auVar342,auVar279._0_32_);
      fVar335 = auVar11._0_4_ * auVar222._0_4_;
      fVar174 = auVar11._4_4_ * auVar222._4_4_;
      auVar31._4_4_ = fVar174;
      auVar31._0_4_ = fVar335;
      fVar345 = auVar11._8_4_ * auVar222._8_4_;
      auVar31._8_4_ = fVar345;
      fVar175 = auVar11._12_4_ * auVar222._12_4_;
      auVar31._12_4_ = fVar175;
      fVar347 = auVar11._16_4_ * auVar222._16_4_;
      auVar31._16_4_ = fVar347;
      fVar176 = auVar11._20_4_ * auVar222._20_4_;
      auVar31._20_4_ = fVar176;
      fVar349 = auVar11._24_4_ * auVar222._24_4_;
      auVar31._24_4_ = fVar349;
      auVar31._28_4_ = fVar115;
      auVar320._0_4_ = auVar180._0_4_ + fVar335;
      auVar320._4_4_ = auVar180._4_4_ + fVar174;
      auVar320._8_4_ = auVar180._8_4_ + fVar345;
      auVar320._12_4_ = auVar180._12_4_ + fVar175;
      auVar320._16_4_ = auVar180._16_4_ + fVar347;
      auVar320._20_4_ = auVar180._20_4_ + fVar176;
      auVar320._24_4_ = auVar180._24_4_ + fVar349;
      auVar320._28_4_ = auVar180._28_4_ + fVar115;
      auVar180 = vsubps_avx(auVar180,auVar31);
      auVar222 = vsubps_avx(auVar304,auVar359);
      auVar11 = vsubps_avx(auVar320,auVar9);
      auVar12 = vsubps_avx(auVar180,auVar379);
      auVar179 = vsubps_avx(auVar297,auVar10);
      *(float *)(undefined1 *)local_108._buffer = auVar304._0_4_ + auVar359._0_4_;
      *(float *)((undefined1 *)local_108._buffer + 4) = auVar304._4_4_ + auVar359._4_4_;
      *(float *)((undefined1 *)local_108._buffer + 8) = auVar304._8_4_ + auVar359._8_4_;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = auVar304._12_4_ + auVar359._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) =
           auVar304._16_4_ + auVar359._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) =
           auVar304._20_4_ + auVar359._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) =
           auVar304._24_4_ + auVar359._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) =
           auVar304._28_4_ + auVar359._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) =
           auVar320._0_4_ + auVar9._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) =
           auVar320._4_4_ + auVar9._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) =
           auVar320._8_4_ + auVar9._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) =
           auVar320._12_4_ + auVar9._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) =
           auVar320._16_4_ + auVar9._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) =
           auVar320._20_4_ + auVar9._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) =
           auVar320._24_4_ + auVar9._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) =
           auVar320._28_4_ + auVar9._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) =
           auVar180._0_4_ + auVar379._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) =
           auVar180._4_4_ + auVar379._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) =
           auVar180._8_4_ + auVar379._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) =
           auVar180._12_4_ + auVar379._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) =
           auVar180._16_4_ + auVar379._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) =
           auVar180._20_4_ + auVar379._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) =
           auVar180._24_4_ + auVar379._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) =
           auVar180._28_4_ + auVar379._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) =
           auVar297._0_4_ + auVar10._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) =
           auVar297._4_4_ + auVar10._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) =
           auVar297._8_4_ + auVar10._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) =
           auVar297._12_4_ + auVar10._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) =
           auVar297._16_4_ + auVar10._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) =
           auVar297._20_4_ + auVar10._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) =
           auVar297._24_4_ + auVar10._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) =
           auVar297._28_4_ + auVar10._28_4_;
      *(undefined1 (*) [32])((long)local_108._buffer + 0x80) = auVar179;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xa0) = auVar12;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xc0) = auVar11;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xe0) = auVar222;
      in_ZMM7 = ZEXT1664(auVar222._0_16_);
      auVar159 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_f8,&local_108,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"5x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      for (uVar113 = 0; auVar287 = in_ZMM7._28_36_, uVar113 != 0x40; uVar113 = uVar113 + 1) {
        auVar159._0_16_ = ZEXT816(0);
        if (uVar113 < 0x28) {
          auVar169._0_8_ = (double)Imath_3_2::erand48(local_e6);
          auVar169._8_56_ = extraout_var_19;
          auVar159._4_60_ = auVar169._4_60_;
          auVar159._0_4_ = (float)auVar169._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = auVar159._0_4_;
        local_f8._buffer[uVar113] = auVar159._0_4_;
      }
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      puVar109 = &DAT_001a4be0;
      pfVar110 = &local_e0;
      for (lVar112 = 0x10; lVar112 != 0; lVar112 = lVar112 + -1) {
        *(undefined8 *)pfVar110 = *puVar109;
        puVar109 = puVar109 + (ulong)bVar114 * -2 + 1;
        pfVar110 = pfVar110 + ((ulong)bVar114 * -2 + 1) * 2;
      }
      auVar380._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      auVar380._0_16_ = *(undefined1 (*) [16])local_108._buffer;
      auVar394._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      auVar394._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      auVar10 = vunpcklpd_avx(auVar380,auVar394);
      auVar9 = vunpckhpd_avx(auVar380,auVar394);
      auVar180 = vunpcklps_avx(auVar10,auVar9);
      auVar9 = vunpckhps_avx(auVar10,auVar9);
      auVar297 = vunpcklpd_avx(auVar180,auVar9);
      auVar9 = vunpckhpd_avx(auVar180,auVar9);
      auVar360._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x60);
      auVar360._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x40);
      auVar368._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x70);
      auVar368._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x50);
      auVar180 = vunpcklpd_avx(auVar360,auVar368);
      auVar10 = vunpckhpd_avx(auVar360,auVar368);
      auVar11 = vunpcklps_avx(auVar180,auVar10);
      auVar10 = vunpckhps_avx(auVar180,auVar10);
      auVar222 = vunpcklpd_avx(auVar11,auVar10);
      auVar10 = vunpckhpd_avx(auVar11,auVar10);
      auVar330._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xa0);
      auVar330._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x80);
      auVar343._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xb0);
      auVar343._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x90);
      auVar11 = vunpcklpd_avx(auVar330,auVar343);
      auVar180 = vunpckhpd_avx(auVar330,auVar343);
      auVar12 = vunpcklps_avx(auVar11,auVar180);
      auVar180 = vunpckhps_avx(auVar11,auVar180);
      auVar11 = vunpcklpd_avx(auVar12,auVar180);
      auVar180 = vunpckhpd_avx(auVar12,auVar180);
      auVar12 = vpermilps_avx(auVar297,0);
      auVar179 = vpermilps_avx(auVar297,0x55);
      auVar13 = vpermilps_avx(auVar297,0xaa);
      auVar297 = vpermilps_avx(auVar297,0xff);
      auVar131._0_4_ =
           local_e0 * auVar12._0_4_ + local_d0 * auVar179._0_4_ +
           local_c0 * auVar13._0_4_ + local_b0 * auVar297._0_4_;
      auVar131._4_4_ =
           fStack_dc * auVar12._4_4_ + fStack_cc * auVar179._4_4_ +
           fStack_bc * auVar13._4_4_ + fStack_ac * auVar297._4_4_;
      auVar131._8_4_ =
           fStack_d8 * auVar12._8_4_ + fStack_c8 * auVar179._8_4_ +
           fStack_b8 * auVar13._8_4_ + fStack_a8 * auVar297._8_4_;
      auVar131._12_4_ =
           fStack_d4 * auVar12._12_4_ + fStack_c4 * auVar179._12_4_ +
           fStack_b4 * auVar13._12_4_ + fStack_a4 * auVar297._12_4_;
      auVar131._16_4_ =
           local_e0 * auVar12._16_4_ + local_d0 * auVar179._16_4_ +
           local_c0 * auVar13._16_4_ + local_b0 * auVar297._16_4_;
      auVar131._20_4_ =
           fStack_dc * auVar12._20_4_ + fStack_cc * auVar179._20_4_ +
           fStack_bc * auVar13._20_4_ + fStack_ac * auVar297._20_4_;
      auVar131._24_4_ =
           fStack_d8 * auVar12._24_4_ + fStack_c8 * auVar179._24_4_ +
           fStack_b8 * auVar13._24_4_ + fStack_a8 * auVar297._24_4_;
      auVar131._28_4_ = auVar12._28_4_ + auVar179._28_4_ + auVar13._28_4_ + auVar297._28_4_;
      auVar297 = vpermilps_avx(auVar222,0);
      auVar12 = vpermilps_avx(auVar222,0x55);
      auVar179 = vpermilps_avx(auVar222,0xaa);
      auVar222 = vpermilps_avx(auVar222,0xff);
      auVar187._0_4_ =
           local_e0 * auVar297._0_4_ + local_d0 * auVar12._0_4_ +
           local_c0 * auVar179._0_4_ + local_b0 * auVar222._0_4_;
      auVar187._4_4_ =
           fStack_dc * auVar297._4_4_ + fStack_cc * auVar12._4_4_ +
           fStack_bc * auVar179._4_4_ + fStack_ac * auVar222._4_4_;
      auVar187._8_4_ =
           fStack_d8 * auVar297._8_4_ + fStack_c8 * auVar12._8_4_ +
           fStack_b8 * auVar179._8_4_ + fStack_a8 * auVar222._8_4_;
      auVar187._12_4_ =
           fStack_d4 * auVar297._12_4_ + fStack_c4 * auVar12._12_4_ +
           fStack_b4 * auVar179._12_4_ + fStack_a4 * auVar222._12_4_;
      auVar187._16_4_ =
           local_e0 * auVar297._16_4_ + local_d0 * auVar12._16_4_ +
           local_c0 * auVar179._16_4_ + local_b0 * auVar222._16_4_;
      auVar187._20_4_ =
           fStack_dc * auVar297._20_4_ + fStack_cc * auVar12._20_4_ +
           fStack_bc * auVar179._20_4_ + fStack_ac * auVar222._20_4_;
      auVar187._24_4_ =
           fStack_d8 * auVar297._24_4_ + fStack_c8 * auVar12._24_4_ +
           fStack_b8 * auVar179._24_4_ + fStack_a8 * auVar222._24_4_;
      auVar187._28_4_ = auVar297._28_4_ + auVar12._28_4_ + auVar179._28_4_ + auVar222._28_4_;
      auVar297 = vpermilps_avx(auVar11,0);
      auVar222 = vpermilps_avx(auVar11,0x55);
      auVar12 = vpermilps_avx(auVar11,0xaa);
      auVar11 = vpermilps_avx(auVar11,0xff);
      auVar207._0_4_ =
           local_e0 * auVar297._0_4_ + local_d0 * auVar222._0_4_ +
           local_c0 * auVar12._0_4_ + local_b0 * auVar11._0_4_;
      auVar207._4_4_ =
           fStack_dc * auVar297._4_4_ + fStack_cc * auVar222._4_4_ +
           fStack_bc * auVar12._4_4_ + fStack_ac * auVar11._4_4_;
      auVar207._8_4_ =
           fStack_d8 * auVar297._8_4_ + fStack_c8 * auVar222._8_4_ +
           fStack_b8 * auVar12._8_4_ + fStack_a8 * auVar11._8_4_;
      auVar207._12_4_ =
           fStack_d4 * auVar297._12_4_ + fStack_c4 * auVar222._12_4_ +
           fStack_b4 * auVar12._12_4_ + fStack_a4 * auVar11._12_4_;
      auVar207._16_4_ =
           local_e0 * auVar297._16_4_ + local_d0 * auVar222._16_4_ +
           local_c0 * auVar12._16_4_ + local_b0 * auVar11._16_4_;
      auVar207._20_4_ =
           fStack_dc * auVar297._20_4_ + fStack_cc * auVar222._20_4_ +
           fStack_bc * auVar12._20_4_ + fStack_ac * auVar11._20_4_;
      auVar207._24_4_ =
           fStack_d8 * auVar297._24_4_ + fStack_c8 * auVar222._24_4_ +
           fStack_b8 * auVar12._24_4_ + fStack_a8 * auVar11._24_4_;
      auVar207._28_4_ = auVar297._28_4_ + auVar222._28_4_ + auVar12._28_4_ + auVar11._28_4_;
      auVar101._4_4_ = fStack_9c;
      auVar101._0_4_ = local_a0;
      auVar101._8_4_ = fStack_98;
      auVar101._12_4_ = fStack_94;
      auVar305._16_16_ = auVar101;
      auVar305._0_16_ = auVar101;
      auVar297 = vpermilps_avx(auVar9,0);
      auVar222 = vpermilps_avx(auVar9,0x55);
      auVar11 = vpermilps_avx(auVar9,0xaa);
      auVar9 = vpermilps_avx(auVar9,0xff);
      auVar233._0_4_ =
           local_a0 * auVar297._0_4_ + local_90 * auVar222._0_4_ +
           local_80 * auVar11._0_4_ + local_70 * auVar9._0_4_;
      auVar233._4_4_ =
           fStack_9c * auVar297._4_4_ + fStack_8c * auVar222._4_4_ +
           fStack_7c * auVar11._4_4_ + fStack_6c * auVar9._4_4_;
      auVar233._8_4_ =
           fStack_98 * auVar297._8_4_ + fStack_88 * auVar222._8_4_ +
           fStack_78 * auVar11._8_4_ + fStack_68 * auVar9._8_4_;
      auVar233._12_4_ =
           fStack_94 * auVar297._12_4_ + fStack_84 * auVar222._12_4_ +
           fStack_74 * auVar11._12_4_ + fStack_64 * auVar9._12_4_;
      auVar233._16_4_ =
           local_a0 * auVar297._16_4_ + local_90 * auVar222._16_4_ +
           local_80 * auVar11._16_4_ + local_70 * auVar9._16_4_;
      auVar233._20_4_ =
           fStack_9c * auVar297._20_4_ + fStack_8c * auVar222._20_4_ +
           fStack_7c * auVar11._20_4_ + fStack_6c * auVar9._20_4_;
      auVar233._24_4_ =
           fStack_98 * auVar297._24_4_ + fStack_88 * auVar222._24_4_ +
           fStack_78 * auVar11._24_4_ + fStack_68 * auVar9._24_4_;
      auVar233._28_4_ = auVar297._28_4_ + auVar222._28_4_ + auVar11._28_4_ + auVar9._28_4_;
      auVar9 = vpermilps_avx(auVar10,0);
      auVar297 = vpermilps_avx(auVar10,0x55);
      auVar222 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      auVar253._0_4_ =
           local_a0 * auVar9._0_4_ + local_90 * auVar297._0_4_ +
           local_80 * auVar222._0_4_ + local_70 * auVar10._0_4_;
      auVar253._4_4_ =
           fStack_9c * auVar9._4_4_ + fStack_8c * auVar297._4_4_ +
           fStack_7c * auVar222._4_4_ + fStack_6c * auVar10._4_4_;
      auVar253._8_4_ =
           fStack_98 * auVar9._8_4_ + fStack_88 * auVar297._8_4_ +
           fStack_78 * auVar222._8_4_ + fStack_68 * auVar10._8_4_;
      auVar253._12_4_ =
           fStack_94 * auVar9._12_4_ + fStack_84 * auVar297._12_4_ +
           fStack_74 * auVar222._12_4_ + fStack_64 * auVar10._12_4_;
      auVar253._16_4_ =
           local_a0 * auVar9._16_4_ + local_90 * auVar297._16_4_ +
           local_80 * auVar222._16_4_ + local_70 * auVar10._16_4_;
      auVar253._20_4_ =
           fStack_9c * auVar9._20_4_ + fStack_8c * auVar297._20_4_ +
           fStack_7c * auVar222._20_4_ + fStack_6c * auVar10._20_4_;
      auVar253._24_4_ =
           fStack_98 * auVar9._24_4_ + fStack_88 * auVar297._24_4_ +
           fStack_78 * auVar222._24_4_ + fStack_68 * auVar10._24_4_;
      auVar253._28_4_ = auVar9._28_4_ + auVar297._28_4_ + auVar222._28_4_ + auVar10._28_4_;
      auVar9 = vpermilps_avx(auVar180,0);
      auVar10 = vpermilps_avx(auVar180,0x55);
      auVar297 = vpermilps_avx(auVar180,0xaa);
      auVar180 = vpermilps_avx(auVar180,0xff);
      fVar210 = auVar180._28_4_;
      auVar263._0_4_ =
           local_a0 * auVar9._0_4_ + local_90 * auVar10._0_4_ +
           local_80 * auVar297._0_4_ + local_70 * auVar180._0_4_;
      auVar263._4_4_ =
           fStack_9c * auVar9._4_4_ + fStack_8c * auVar10._4_4_ +
           fStack_7c * auVar297._4_4_ + fStack_6c * auVar180._4_4_;
      auVar263._8_4_ =
           fStack_98 * auVar9._8_4_ + fStack_88 * auVar10._8_4_ +
           fStack_78 * auVar297._8_4_ + fStack_68 * auVar180._8_4_;
      auVar263._12_4_ =
           fStack_94 * auVar9._12_4_ + fStack_84 * auVar10._12_4_ +
           fStack_74 * auVar297._12_4_ + fStack_64 * auVar180._12_4_;
      auVar263._16_4_ =
           local_a0 * auVar9._16_4_ + local_90 * auVar10._16_4_ +
           local_80 * auVar297._16_4_ + local_70 * auVar180._16_4_;
      auVar263._20_4_ =
           fStack_9c * auVar9._20_4_ + fStack_8c * auVar10._20_4_ +
           fStack_7c * auVar297._20_4_ + fStack_6c * auVar180._20_4_;
      auVar263._24_4_ =
           fStack_98 * auVar9._24_4_ + fStack_88 * auVar10._24_4_ +
           fStack_78 * auVar297._24_4_ + fStack_68 * auVar180._24_4_;
      auVar263._28_4_ = auVar9._28_4_ + auVar10._28_4_ + auVar297._28_4_ + fVar210;
      auVar9 = vsubps_avx(auVar131,auVar233);
      auVar132._0_4_ = auVar131._0_4_ + auVar233._0_4_;
      auVar132._4_4_ = auVar131._4_4_ + auVar233._4_4_;
      auVar132._8_4_ = auVar131._8_4_ + auVar233._8_4_;
      auVar132._12_4_ = auVar131._12_4_ + auVar233._12_4_;
      auVar132._16_4_ = auVar131._16_4_ + auVar233._16_4_;
      auVar132._20_4_ = auVar131._20_4_ + auVar233._20_4_;
      auVar132._24_4_ = auVar131._24_4_ + auVar233._24_4_;
      auVar132._28_4_ = auVar131._28_4_ + auVar233._28_4_;
      auVar10 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar187,auVar253);
      auVar188._0_4_ = auVar187._0_4_ + auVar253._0_4_;
      auVar188._4_4_ = auVar187._4_4_ + auVar253._4_4_;
      auVar188._8_4_ = auVar187._8_4_ + auVar253._8_4_;
      auVar188._12_4_ = auVar187._12_4_ + auVar253._12_4_;
      auVar188._16_4_ = auVar187._16_4_ + auVar253._16_4_;
      auVar188._20_4_ = auVar187._20_4_ + auVar253._20_4_;
      auVar188._24_4_ = auVar187._24_4_ + auVar253._24_4_;
      auVar188._28_4_ = auVar187._28_4_ + auVar253._28_4_;
      auVar12 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar207,auVar263);
      auVar208._0_4_ = auVar207._0_4_ + auVar263._0_4_;
      auVar208._4_4_ = auVar207._4_4_ + auVar263._4_4_;
      auVar208._8_4_ = auVar207._8_4_ + auVar263._8_4_;
      auVar208._12_4_ = auVar207._12_4_ + auVar263._12_4_;
      auVar208._16_4_ = auVar207._16_4_ + auVar263._16_4_;
      auVar208._20_4_ = auVar207._20_4_ + auVar263._20_4_;
      auVar208._24_4_ = auVar207._24_4_ + auVar263._24_4_;
      auVar208._28_4_ = auVar207._28_4_ + auVar263._28_4_;
      auVar179 = vpermilps_avx(auVar9,0x1b);
      auVar297 = vperm2f128_avx(auVar179,auVar208,2);
      auVar180 = vperm2f128_avx(auVar12,auVar188,0x13);
      auVar11 = vperm2f128_avx(auVar12,auVar188,2);
      auVar9 = vperm2f128_avx(auVar10,auVar132,0x13);
      auVar222 = vperm2f128_avx(auVar10,auVar132,2);
      auVar13 = vpermilps_avx(auVar305,0xff);
      auVar14 = vpermilps_avx(auVar305,0xaa);
      auVar15 = vpermilps_avx(auVar305,0x55);
      auVar16 = vpermilps_avx(auVar305,0);
      fVar115 = auVar9._0_4_;
      fVar174 = auVar9._4_4_;
      fVar175 = auVar9._8_4_;
      fVar176 = auVar9._12_4_;
      fVar177 = auVar9._16_4_;
      fVar198 = auVar9._20_4_;
      fVar200 = auVar9._24_4_;
      fVar335 = auVar180._0_4_;
      fVar345 = auVar180._4_4_;
      fVar347 = auVar180._8_4_;
      fVar349 = auVar180._12_4_;
      fVar197 = auVar180._16_4_;
      fVar199 = auVar180._20_4_;
      fVar209 = auVar180._24_4_;
      auVar361._0_4_ = auVar15._0_4_ * fVar335 + auVar16._0_4_ * fVar115;
      auVar361._4_4_ = auVar15._4_4_ * fVar345 + auVar16._4_4_ * fVar174;
      auVar361._8_4_ = auVar15._8_4_ * fVar347 + auVar16._8_4_ * fVar175;
      auVar361._12_4_ = auVar15._12_4_ * fVar349 + auVar16._12_4_ * fVar176;
      auVar361._16_4_ = auVar15._16_4_ * fVar197 + auVar16._16_4_ * fVar177;
      auVar361._20_4_ = auVar15._20_4_ * fVar199 + auVar16._20_4_ * fVar198;
      auVar361._24_4_ = auVar15._24_4_ * fVar209 + auVar16._24_4_ * fVar200;
      auVar361._28_4_ = auVar12._28_4_ + auVar10._28_4_;
      auVar32._4_4_ = auVar15._4_4_ * fVar174;
      auVar32._0_4_ = auVar15._0_4_ * fVar115;
      auVar32._8_4_ = auVar15._8_4_ * fVar175;
      auVar32._12_4_ = auVar15._12_4_ * fVar176;
      auVar32._16_4_ = auVar15._16_4_ * fVar177;
      auVar32._20_4_ = auVar15._20_4_ * fVar198;
      auVar32._24_4_ = auVar15._24_4_ * fVar200;
      auVar32._28_4_ = auVar12._28_4_;
      auVar33._4_4_ = auVar13._4_4_ * fVar345;
      auVar33._0_4_ = auVar13._0_4_ * fVar335;
      auVar33._8_4_ = auVar13._8_4_ * fVar347;
      auVar33._12_4_ = auVar13._12_4_ * fVar349;
      auVar33._16_4_ = auVar13._16_4_ * fVar197;
      auVar33._20_4_ = auVar13._20_4_ * fVar199;
      auVar33._24_4_ = auVar13._24_4_ * fVar209;
      auVar33._28_4_ = auVar179._28_4_;
      auVar9 = vsubps_avx(auVar32,auVar33);
      auVar34._4_4_ = auVar14._4_4_ * fVar174;
      auVar34._0_4_ = auVar14._0_4_ * fVar115;
      auVar34._8_4_ = auVar14._8_4_ * fVar175;
      auVar34._12_4_ = auVar14._12_4_ * fVar176;
      auVar34._16_4_ = auVar14._16_4_ * fVar177;
      auVar34._20_4_ = auVar14._20_4_ * fVar198;
      auVar34._24_4_ = auVar14._24_4_ * fVar200;
      auVar34._28_4_ = auVar179._28_4_;
      auVar35._4_4_ = auVar16._4_4_ * fVar345;
      auVar35._0_4_ = auVar16._0_4_ * fVar335;
      auVar35._8_4_ = auVar16._8_4_ * fVar347;
      auVar35._12_4_ = auVar16._12_4_ * fVar349;
      auVar35._16_4_ = auVar16._16_4_ * fVar197;
      auVar35._20_4_ = auVar16._20_4_ * fVar199;
      auVar35._24_4_ = auVar16._24_4_ * fVar209;
      auVar35._28_4_ = fVar210;
      auVar10 = vsubps_avx(auVar34,auVar35);
      auVar36._4_4_ = auVar13._4_4_ * fVar174;
      auVar36._0_4_ = auVar13._0_4_ * fVar115;
      auVar36._8_4_ = auVar13._8_4_ * fVar175;
      auVar36._12_4_ = auVar13._12_4_ * fVar176;
      auVar36._16_4_ = auVar13._16_4_ * fVar177;
      auVar36._20_4_ = auVar13._20_4_ * fVar198;
      auVar36._24_4_ = auVar13._24_4_ * fVar200;
      auVar36._28_4_ = fVar210;
      auVar37._4_4_ = auVar14._4_4_ * fVar345;
      auVar37._0_4_ = auVar14._0_4_ * fVar335;
      auVar37._8_4_ = auVar14._8_4_ * fVar347;
      auVar37._12_4_ = auVar14._12_4_ * fVar349;
      auVar37._16_4_ = auVar14._16_4_ * fVar197;
      auVar37._20_4_ = auVar14._20_4_ * fVar199;
      auVar37._24_4_ = auVar14._24_4_ * fVar209;
      auVar37._28_4_ = auVar180._28_4_;
      auVar180 = vsubps_avx(auVar36,auVar37);
      auVar94._4_4_ = fStack_d4;
      auVar94._0_4_ = fStack_d8;
      auVar94._8_4_ = local_d0;
      auVar94._12_4_ = fStack_cc;
      auVar189._16_16_ = auVar94;
      auVar189._0_16_ = auVar94;
      auVar12 = vpermilps_avx(auVar189,0xff);
      auVar179 = vpermilps_avx(auVar189,0xaa);
      auVar14 = vpermilps_avx(auVar189,0);
      fVar349 = auVar222._0_4_ * auVar14._0_4_;
      fVar177 = auVar222._4_4_ * auVar14._4_4_;
      auVar38._4_4_ = fVar177;
      auVar38._0_4_ = fVar349;
      fVar197 = auVar222._8_4_ * auVar14._8_4_;
      auVar38._8_4_ = fVar197;
      fVar198 = auVar222._12_4_ * auVar14._12_4_;
      auVar38._12_4_ = fVar198;
      fVar199 = auVar222._16_4_ * auVar14._16_4_;
      auVar38._16_4_ = fVar199;
      fVar200 = auVar222._20_4_ * auVar14._20_4_;
      auVar38._20_4_ = fVar200;
      fVar209 = auVar222._24_4_ * auVar14._24_4_;
      auVar38._24_4_ = fVar209;
      auVar38._28_4_ = auVar13._28_4_;
      fVar115 = auVar297._0_4_ * auVar14._0_4_;
      fVar335 = auVar297._4_4_ * auVar14._4_4_;
      auVar39._4_4_ = fVar335;
      auVar39._0_4_ = fVar115;
      fVar174 = auVar297._8_4_ * auVar14._8_4_;
      auVar39._8_4_ = fVar174;
      fVar345 = auVar297._12_4_ * auVar14._12_4_;
      auVar39._12_4_ = fVar345;
      fVar175 = auVar297._16_4_ * auVar14._16_4_;
      auVar39._16_4_ = fVar175;
      fVar347 = auVar297._20_4_ * auVar14._20_4_;
      auVar39._20_4_ = fVar347;
      fVar176 = auVar297._24_4_ * auVar14._24_4_;
      auVar39._24_4_ = fVar176;
      auVar39._28_4_ = auVar297._28_4_;
      auVar344._0_4_ = fVar349 + fVar115;
      auVar344._4_4_ = fVar177 + fVar335;
      auVar344._8_4_ = fVar197 + fVar174;
      auVar344._12_4_ = fVar198 + fVar345;
      auVar344._16_4_ = fVar199 + fVar175;
      auVar344._20_4_ = fVar200 + fVar347;
      auVar344._24_4_ = fVar209 + fVar176;
      auVar344._28_4_ = auVar13._28_4_ + auVar297._28_4_;
      auVar297 = vsubps_avx(auVar38,auVar39);
      auVar280._0_4_ = auVar11._0_4_ * auVar179._0_4_;
      auVar280._4_4_ = auVar11._4_4_ * auVar179._4_4_;
      auVar280._8_4_ = auVar11._8_4_ * auVar179._8_4_;
      auVar280._12_4_ = auVar11._12_4_ * auVar179._12_4_;
      auVar280._16_4_ = auVar11._16_4_ * auVar179._16_4_;
      auVar280._20_4_ = auVar11._20_4_ * auVar179._20_4_;
      auVar280._24_4_ = auVar11._24_4_ * auVar179._24_4_;
      auVar280._28_36_ = auVar287;
      auVar306._0_4_ = auVar344._0_4_ + auVar280._0_4_;
      auVar306._4_4_ = auVar344._4_4_ + auVar280._4_4_;
      auVar306._8_4_ = auVar344._8_4_ + auVar280._8_4_;
      auVar306._12_4_ = auVar344._12_4_ + auVar280._12_4_;
      auVar306._16_4_ = auVar344._16_4_ + auVar280._16_4_;
      auVar306._20_4_ = auVar344._20_4_ + auVar280._20_4_;
      auVar306._24_4_ = auVar344._24_4_ + auVar280._24_4_;
      fVar115 = auVar287._0_4_;
      auVar306._28_4_ = auVar344._28_4_ + fVar115;
      auVar222 = vsubps_avx(auVar344,auVar280._0_32_);
      fVar335 = auVar11._0_4_ * auVar12._0_4_;
      fVar174 = auVar11._4_4_ * auVar12._4_4_;
      auVar40._4_4_ = fVar174;
      auVar40._0_4_ = fVar335;
      fVar345 = auVar11._8_4_ * auVar12._8_4_;
      auVar40._8_4_ = fVar345;
      fVar175 = auVar11._12_4_ * auVar12._12_4_;
      auVar40._12_4_ = fVar175;
      fVar347 = auVar11._16_4_ * auVar12._16_4_;
      auVar40._16_4_ = fVar347;
      fVar176 = auVar11._20_4_ * auVar12._20_4_;
      auVar40._20_4_ = fVar176;
      fVar349 = auVar11._24_4_ * auVar12._24_4_;
      auVar40._24_4_ = fVar349;
      auVar40._28_4_ = fVar115;
      auVar321._0_4_ = auVar297._0_4_ + fVar335;
      auVar321._4_4_ = auVar297._4_4_ + fVar174;
      auVar321._8_4_ = auVar297._8_4_ + fVar345;
      auVar321._12_4_ = auVar297._12_4_ + fVar175;
      auVar321._16_4_ = auVar297._16_4_ + fVar347;
      auVar321._20_4_ = auVar297._20_4_ + fVar176;
      auVar321._24_4_ = auVar297._24_4_ + fVar349;
      auVar321._28_4_ = auVar297._28_4_ + fVar115;
      auVar297 = vsubps_avx(auVar297,auVar40);
      auVar11 = vsubps_avx(auVar306,auVar361);
      auVar12 = vsubps_avx(auVar321,auVar9);
      auVar179 = vsubps_avx(auVar297,auVar10);
      auVar13 = vsubps_avx(auVar222,auVar180);
      *(float *)(undefined1 *)local_108._buffer = auVar306._0_4_ + auVar361._0_4_;
      *(float *)((undefined1 *)local_108._buffer + 4) = auVar306._4_4_ + auVar361._4_4_;
      *(float *)((undefined1 *)local_108._buffer + 8) = auVar306._8_4_ + auVar361._8_4_;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = auVar306._12_4_ + auVar361._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) =
           auVar306._16_4_ + auVar361._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) =
           auVar306._20_4_ + auVar361._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) =
           auVar306._24_4_ + auVar361._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) =
           auVar306._28_4_ + auVar361._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) =
           auVar321._0_4_ + auVar9._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) =
           auVar321._4_4_ + auVar9._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) =
           auVar321._8_4_ + auVar9._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) =
           auVar321._12_4_ + auVar9._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) =
           auVar321._16_4_ + auVar9._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) =
           auVar321._20_4_ + auVar9._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) =
           auVar321._24_4_ + auVar9._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) =
           auVar321._28_4_ + auVar9._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) =
           auVar297._0_4_ + auVar10._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) =
           auVar297._4_4_ + auVar10._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) =
           auVar297._8_4_ + auVar10._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) =
           auVar297._12_4_ + auVar10._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) =
           auVar297._16_4_ + auVar10._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) =
           auVar297._20_4_ + auVar10._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) =
           auVar297._24_4_ + auVar10._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) =
           auVar297._28_4_ + auVar10._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) =
           auVar222._0_4_ + auVar180._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) =
           auVar222._4_4_ + auVar180._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) =
           auVar222._8_4_ + auVar180._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) =
           auVar222._12_4_ + auVar180._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) =
           auVar222._16_4_ + auVar180._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) =
           auVar222._20_4_ + auVar180._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) =
           auVar222._24_4_ + auVar180._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) =
           auVar222._28_4_ + auVar180._28_4_;
      *(undefined1 (*) [32])((long)local_108._buffer + 0x80) = auVar13;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xa0) = auVar179;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xc0) = auVar12;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xe0) = auVar11;
      in_ZMM7 = ZEXT1664(auVar11._0_16_);
      auVar159 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_f8,&local_108,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"4x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      for (uVar113 = 0; auVar287 = in_ZMM7._28_36_, uVar113 != 0x40; uVar113 = uVar113 + 1) {
        auVar159._0_16_ = ZEXT816(0);
        if (uVar113 < 0x20) {
          auVar170._0_8_ = (double)Imath_3_2::erand48(local_e6);
          auVar170._8_56_ = extraout_var_20;
          auVar159._4_60_ = auVar170._4_60_;
          auVar159._0_4_ = (float)auVar170._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = auVar159._0_4_;
        local_f8._buffer[uVar113] = auVar159._0_4_;
      }
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      puVar109 = &DAT_001a4be0;
      pfVar110 = &local_e0;
      for (lVar112 = 0x10; lVar112 != 0; lVar112 = lVar112 + -1) {
        *(undefined8 *)pfVar110 = *puVar109;
        puVar109 = puVar109 + (ulong)bVar114 * -2 + 1;
        pfVar110 = pfVar110 + ((ulong)bVar114 * -2 + 1) * 2;
      }
      auVar381._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      auVar381._0_16_ = *(undefined1 (*) [16])local_108._buffer;
      auVar395._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      auVar395._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      auVar10 = vunpcklpd_avx(auVar381,auVar395);
      auVar9 = vunpckhpd_avx(auVar381,auVar395);
      auVar297 = vunpcklps_avx(auVar10,auVar9);
      auVar9 = vunpckhps_avx(auVar10,auVar9);
      auVar180 = vunpcklpd_avx(auVar297,auVar9);
      auVar9 = vunpckhpd_avx(auVar297,auVar9);
      auVar362._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x60);
      auVar362._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x40);
      auVar369._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x70);
      auVar369._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x50);
      auVar297 = vunpcklpd_avx(auVar362,auVar369);
      auVar10 = vunpckhpd_avx(auVar362,auVar369);
      auVar222 = vunpcklps_avx(auVar297,auVar10);
      auVar10 = vunpckhps_avx(auVar297,auVar10);
      auVar297 = vunpcklpd_avx(auVar222,auVar10);
      auVar10 = vunpckhpd_avx(auVar222,auVar10);
      auVar222 = vpermilps_avx(auVar180,0);
      auVar11 = vpermilps_avx(auVar180,0x55);
      auVar12 = vpermilps_avx(auVar180,0xaa);
      auVar180 = vpermilps_avx(auVar180,0xff);
      auVar133._0_4_ =
           local_e0 * auVar222._0_4_ + local_d0 * auVar11._0_4_ +
           local_c0 * auVar12._0_4_ + local_b0 * auVar180._0_4_;
      auVar133._4_4_ =
           fStack_dc * auVar222._4_4_ + fStack_cc * auVar11._4_4_ +
           fStack_bc * auVar12._4_4_ + fStack_ac * auVar180._4_4_;
      auVar133._8_4_ =
           fStack_d8 * auVar222._8_4_ + fStack_c8 * auVar11._8_4_ +
           fStack_b8 * auVar12._8_4_ + fStack_a8 * auVar180._8_4_;
      auVar133._12_4_ =
           fStack_d4 * auVar222._12_4_ + fStack_c4 * auVar11._12_4_ +
           fStack_b4 * auVar12._12_4_ + fStack_a4 * auVar180._12_4_;
      auVar133._16_4_ =
           local_e0 * auVar222._16_4_ + local_d0 * auVar11._16_4_ +
           local_c0 * auVar12._16_4_ + local_b0 * auVar180._16_4_;
      auVar133._20_4_ =
           fStack_dc * auVar222._20_4_ + fStack_cc * auVar11._20_4_ +
           fStack_bc * auVar12._20_4_ + fStack_ac * auVar180._20_4_;
      auVar133._24_4_ =
           fStack_d8 * auVar222._24_4_ + fStack_c8 * auVar11._24_4_ +
           fStack_b8 * auVar12._24_4_ + fStack_a8 * auVar180._24_4_;
      auVar133._28_4_ = auVar222._28_4_ + auVar11._28_4_ + auVar12._28_4_ + auVar180._28_4_;
      auVar180 = vpermilps_avx(auVar297,0);
      auVar222 = vpermilps_avx(auVar297,0x55);
      auVar11 = vpermilps_avx(auVar297,0xaa);
      auVar297 = vpermilps_avx(auVar297,0xff);
      auVar190._0_4_ =
           local_e0 * auVar180._0_4_ + local_d0 * auVar222._0_4_ +
           local_c0 * auVar11._0_4_ + local_b0 * auVar297._0_4_;
      auVar190._4_4_ =
           fStack_dc * auVar180._4_4_ + fStack_cc * auVar222._4_4_ +
           fStack_bc * auVar11._4_4_ + fStack_ac * auVar297._4_4_;
      auVar190._8_4_ =
           fStack_d8 * auVar180._8_4_ + fStack_c8 * auVar222._8_4_ +
           fStack_b8 * auVar11._8_4_ + fStack_a8 * auVar297._8_4_;
      auVar190._12_4_ =
           fStack_d4 * auVar180._12_4_ + fStack_c4 * auVar222._12_4_ +
           fStack_b4 * auVar11._12_4_ + fStack_a4 * auVar297._12_4_;
      auVar190._16_4_ =
           local_e0 * auVar180._16_4_ + local_d0 * auVar222._16_4_ +
           local_c0 * auVar11._16_4_ + local_b0 * auVar297._16_4_;
      auVar190._20_4_ =
           fStack_dc * auVar180._20_4_ + fStack_cc * auVar222._20_4_ +
           fStack_bc * auVar11._20_4_ + fStack_ac * auVar297._20_4_;
      auVar190._24_4_ =
           fStack_d8 * auVar180._24_4_ + fStack_c8 * auVar222._24_4_ +
           fStack_b8 * auVar11._24_4_ + fStack_a8 * auVar297._24_4_;
      auVar190._28_4_ = auVar180._28_4_ + auVar222._28_4_ + auVar11._28_4_ + auVar297._28_4_;
      auVar102._4_4_ = fStack_9c;
      auVar102._0_4_ = local_a0;
      auVar102._8_4_ = fStack_98;
      auVar102._12_4_ = fStack_94;
      auVar307._16_16_ = auVar102;
      auVar307._0_16_ = auVar102;
      auVar180 = vpermilps_avx(auVar9,0);
      auVar297 = vpermilps_avx(auVar9,0x55);
      auVar222 = vpermilps_avx(auVar9,0xaa);
      auVar9 = vpermilps_avx(auVar9,0xff);
      auVar234._0_4_ =
           local_a0 * auVar180._0_4_ + local_90 * auVar297._0_4_ +
           local_80 * auVar222._0_4_ + local_70 * auVar9._0_4_;
      auVar234._4_4_ =
           fStack_9c * auVar180._4_4_ + fStack_8c * auVar297._4_4_ +
           fStack_7c * auVar222._4_4_ + fStack_6c * auVar9._4_4_;
      auVar234._8_4_ =
           fStack_98 * auVar180._8_4_ + fStack_88 * auVar297._8_4_ +
           fStack_78 * auVar222._8_4_ + fStack_68 * auVar9._8_4_;
      auVar234._12_4_ =
           fStack_94 * auVar180._12_4_ + fStack_84 * auVar297._12_4_ +
           fStack_74 * auVar222._12_4_ + fStack_64 * auVar9._12_4_;
      auVar234._16_4_ =
           local_a0 * auVar180._16_4_ + local_90 * auVar297._16_4_ +
           local_80 * auVar222._16_4_ + local_70 * auVar9._16_4_;
      auVar234._20_4_ =
           fStack_9c * auVar180._20_4_ + fStack_8c * auVar297._20_4_ +
           fStack_7c * auVar222._20_4_ + fStack_6c * auVar9._20_4_;
      auVar234._24_4_ =
           fStack_98 * auVar180._24_4_ + fStack_88 * auVar297._24_4_ +
           fStack_78 * auVar222._24_4_ + fStack_68 * auVar9._24_4_;
      auVar234._28_4_ = auVar180._28_4_ + auVar297._28_4_ + auVar222._28_4_ + auVar9._28_4_;
      auVar9 = vpermilps_avx(auVar10,0);
      auVar180 = vpermilps_avx(auVar10,0x55);
      auVar297 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      fVar210 = auVar10._28_4_;
      fVar211 = auVar297._28_4_ + fVar210;
      auVar254._0_4_ =
           local_a0 * auVar9._0_4_ + local_90 * auVar180._0_4_ +
           local_80 * auVar297._0_4_ + local_70 * auVar10._0_4_;
      auVar254._4_4_ =
           fStack_9c * auVar9._4_4_ + fStack_8c * auVar180._4_4_ +
           fStack_7c * auVar297._4_4_ + fStack_6c * auVar10._4_4_;
      auVar254._8_4_ =
           fStack_98 * auVar9._8_4_ + fStack_88 * auVar180._8_4_ +
           fStack_78 * auVar297._8_4_ + fStack_68 * auVar10._8_4_;
      auVar254._12_4_ =
           fStack_94 * auVar9._12_4_ + fStack_84 * auVar180._12_4_ +
           fStack_74 * auVar297._12_4_ + fStack_64 * auVar10._12_4_;
      auVar254._16_4_ =
           local_a0 * auVar9._16_4_ + local_90 * auVar180._16_4_ +
           local_80 * auVar297._16_4_ + local_70 * auVar10._16_4_;
      auVar254._20_4_ =
           fStack_9c * auVar9._20_4_ + fStack_8c * auVar180._20_4_ +
           fStack_7c * auVar297._20_4_ + fStack_6c * auVar10._20_4_;
      auVar254._24_4_ =
           fStack_98 * auVar9._24_4_ + fStack_88 * auVar180._24_4_ +
           fStack_78 * auVar297._24_4_ + fStack_68 * auVar10._24_4_;
      auVar254._28_4_ = auVar9._28_4_ + auVar180._28_4_ + fVar211;
      auVar9 = vsubps_avx(auVar133,auVar234);
      auVar134._0_4_ = auVar133._0_4_ + auVar234._0_4_;
      auVar134._4_4_ = auVar133._4_4_ + auVar234._4_4_;
      auVar134._8_4_ = auVar133._8_4_ + auVar234._8_4_;
      auVar134._12_4_ = auVar133._12_4_ + auVar234._12_4_;
      auVar134._16_4_ = auVar133._16_4_ + auVar234._16_4_;
      auVar134._20_4_ = auVar133._20_4_ + auVar234._20_4_;
      auVar134._24_4_ = auVar133._24_4_ + auVar234._24_4_;
      auVar134._28_4_ = auVar133._28_4_ + auVar234._28_4_;
      auVar10 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar190,auVar254);
      auVar191._0_4_ = auVar190._0_4_ + auVar254._0_4_;
      auVar191._4_4_ = auVar190._4_4_ + auVar254._4_4_;
      auVar191._8_4_ = auVar190._8_4_ + auVar254._8_4_;
      auVar191._12_4_ = auVar190._12_4_ + auVar254._12_4_;
      auVar191._16_4_ = auVar190._16_4_ + auVar254._16_4_;
      auVar191._20_4_ = auVar190._20_4_ + auVar254._20_4_;
      auVar191._24_4_ = auVar190._24_4_ + auVar254._24_4_;
      auVar191._28_4_ = auVar190._28_4_ + auVar254._28_4_;
      auVar11 = vpermilps_avx(auVar9,0x1b);
      auVar180 = vperm2f128_avx(auVar11,auVar191,0x13);
      auVar222 = vperm2f128_avx(auVar11,auVar191,2);
      auVar9 = vperm2f128_avx(auVar10,auVar134,0x13);
      auVar297 = vperm2f128_avx(auVar10,auVar134,2);
      auVar12 = vpermilps_avx(auVar307,0xff);
      auVar179 = vpermilps_avx(auVar307,0xaa);
      auVar13 = vpermilps_avx(auVar307,0x55);
      auVar14 = vpermilps_avx(auVar307,0);
      fVar115 = auVar9._0_4_;
      fVar174 = auVar9._4_4_;
      fVar175 = auVar9._8_4_;
      fVar176 = auVar9._12_4_;
      fVar177 = auVar9._16_4_;
      fVar198 = auVar9._20_4_;
      fVar200 = auVar9._24_4_;
      fVar335 = auVar180._0_4_;
      fVar345 = auVar180._4_4_;
      fVar347 = auVar180._8_4_;
      fVar349 = auVar180._12_4_;
      fVar197 = auVar180._16_4_;
      fVar199 = auVar180._20_4_;
      fVar209 = auVar180._24_4_;
      auVar363._0_4_ = auVar13._0_4_ * fVar335 + auVar14._0_4_ * fVar115;
      auVar363._4_4_ = auVar13._4_4_ * fVar345 + auVar14._4_4_ * fVar174;
      auVar363._8_4_ = auVar13._8_4_ * fVar347 + auVar14._8_4_ * fVar175;
      auVar363._12_4_ = auVar13._12_4_ * fVar349 + auVar14._12_4_ * fVar176;
      auVar363._16_4_ = auVar13._16_4_ * fVar197 + auVar14._16_4_ * fVar177;
      auVar363._20_4_ = auVar13._20_4_ * fVar199 + auVar14._20_4_ * fVar198;
      auVar363._24_4_ = auVar13._24_4_ * fVar209 + auVar14._24_4_ * fVar200;
      auVar363._28_4_ = auVar11._28_4_ + auVar10._28_4_;
      auVar41._4_4_ = auVar13._4_4_ * fVar174;
      auVar41._0_4_ = auVar13._0_4_ * fVar115;
      auVar41._8_4_ = auVar13._8_4_ * fVar175;
      auVar41._12_4_ = auVar13._12_4_ * fVar176;
      auVar41._16_4_ = auVar13._16_4_ * fVar177;
      auVar41._20_4_ = auVar13._20_4_ * fVar198;
      auVar41._24_4_ = auVar13._24_4_ * fVar200;
      auVar41._28_4_ = auVar11._28_4_;
      auVar42._4_4_ = auVar12._4_4_ * fVar345;
      auVar42._0_4_ = auVar12._0_4_ * fVar335;
      auVar42._8_4_ = auVar12._8_4_ * fVar347;
      auVar42._12_4_ = auVar12._12_4_ * fVar349;
      auVar42._16_4_ = auVar12._16_4_ * fVar197;
      auVar42._20_4_ = auVar12._20_4_ * fVar199;
      auVar42._24_4_ = auVar12._24_4_ * fVar209;
      auVar42._28_4_ = fVar211;
      auVar9 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = auVar179._4_4_ * fVar174;
      auVar43._0_4_ = auVar179._0_4_ * fVar115;
      auVar43._8_4_ = auVar179._8_4_ * fVar175;
      auVar43._12_4_ = auVar179._12_4_ * fVar176;
      auVar43._16_4_ = auVar179._16_4_ * fVar177;
      auVar43._20_4_ = auVar179._20_4_ * fVar198;
      auVar43._24_4_ = auVar179._24_4_ * fVar200;
      auVar43._28_4_ = fVar211;
      auVar44._4_4_ = auVar14._4_4_ * fVar345;
      auVar44._0_4_ = auVar14._0_4_ * fVar335;
      auVar44._8_4_ = auVar14._8_4_ * fVar347;
      auVar44._12_4_ = auVar14._12_4_ * fVar349;
      auVar44._16_4_ = auVar14._16_4_ * fVar197;
      auVar44._20_4_ = auVar14._20_4_ * fVar199;
      auVar44._24_4_ = auVar14._24_4_ * fVar209;
      auVar44._28_4_ = fVar210;
      auVar10 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = auVar12._4_4_ * fVar174;
      auVar45._0_4_ = auVar12._0_4_ * fVar115;
      auVar45._8_4_ = auVar12._8_4_ * fVar175;
      auVar45._12_4_ = auVar12._12_4_ * fVar176;
      auVar45._16_4_ = auVar12._16_4_ * fVar177;
      auVar45._20_4_ = auVar12._20_4_ * fVar198;
      auVar45._24_4_ = auVar12._24_4_ * fVar200;
      auVar45._28_4_ = fVar210;
      auVar46._4_4_ = auVar179._4_4_ * fVar345;
      auVar46._0_4_ = auVar179._0_4_ * fVar335;
      auVar46._8_4_ = auVar179._8_4_ * fVar347;
      auVar46._12_4_ = auVar179._12_4_ * fVar349;
      auVar46._16_4_ = auVar179._16_4_ * fVar197;
      auVar46._20_4_ = auVar179._20_4_ * fVar199;
      auVar46._24_4_ = auVar179._24_4_ * fVar209;
      auVar46._28_4_ = auVar180._28_4_;
      auVar180 = vsubps_avx(auVar45,auVar46);
      auVar95._4_4_ = fStack_d4;
      auVar95._0_4_ = fStack_d8;
      auVar95._8_4_ = local_d0;
      auVar95._12_4_ = fStack_cc;
      auVar192._16_16_ = auVar95;
      auVar192._0_16_ = auVar95;
      auVar11 = vpermilps_avx(auVar192,0xff);
      auVar179 = vpermilps_avx(auVar192,0xaa);
      auVar13 = vpermilps_avx(auVar192,0);
      fVar197 = auVar297._0_4_ * auVar13._0_4_;
      fVar198 = auVar297._4_4_ * auVar13._4_4_;
      auVar47._4_4_ = fVar198;
      auVar47._0_4_ = fVar197;
      fVar199 = auVar297._8_4_ * auVar13._8_4_;
      auVar47._8_4_ = fVar199;
      fVar200 = auVar297._12_4_ * auVar13._12_4_;
      auVar47._12_4_ = fVar200;
      fVar209 = auVar297._16_4_ * auVar13._16_4_;
      auVar47._16_4_ = fVar209;
      fVar210 = auVar297._20_4_ * auVar13._20_4_;
      auVar47._20_4_ = fVar210;
      fVar335 = auVar12._28_4_;
      fVar211 = auVar297._24_4_ * auVar13._24_4_;
      auVar47._24_4_ = fVar211;
      auVar47._28_4_ = fVar335;
      auVar281._0_4_ = auVar222._0_4_ * auVar179._0_4_;
      auVar281._4_4_ = auVar222._4_4_ * auVar179._4_4_;
      auVar281._8_4_ = auVar222._8_4_ * auVar179._8_4_;
      auVar281._12_4_ = auVar222._12_4_ * auVar179._12_4_;
      auVar281._16_4_ = auVar222._16_4_ * auVar179._16_4_;
      auVar281._20_4_ = auVar222._20_4_ * auVar179._20_4_;
      auVar281._24_4_ = auVar222._24_4_ * auVar179._24_4_;
      auVar281._28_36_ = auVar287;
      auVar308._0_4_ = fVar197 + auVar281._0_4_;
      auVar308._4_4_ = fVar198 + auVar281._4_4_;
      auVar308._8_4_ = fVar199 + auVar281._8_4_;
      auVar308._12_4_ = fVar200 + auVar281._12_4_;
      auVar308._16_4_ = fVar209 + auVar281._16_4_;
      auVar308._20_4_ = fVar210 + auVar281._20_4_;
      auVar308._24_4_ = fVar211 + auVar281._24_4_;
      fVar115 = auVar287._0_4_;
      auVar308._28_4_ = fVar335 + fVar115;
      auVar297 = vsubps_avx(auVar47,auVar281._0_32_);
      fVar174 = auVar222._0_4_ * auVar11._0_4_;
      fVar345 = auVar222._4_4_ * auVar11._4_4_;
      auVar48._4_4_ = fVar345;
      auVar48._0_4_ = fVar174;
      fVar175 = auVar222._8_4_ * auVar11._8_4_;
      auVar48._8_4_ = fVar175;
      fVar347 = auVar222._12_4_ * auVar11._12_4_;
      auVar48._12_4_ = fVar347;
      fVar176 = auVar222._16_4_ * auVar11._16_4_;
      auVar48._16_4_ = fVar176;
      fVar349 = auVar222._20_4_ * auVar11._20_4_;
      auVar48._20_4_ = fVar349;
      fVar177 = auVar222._24_4_ * auVar11._24_4_;
      auVar48._24_4_ = fVar177;
      auVar48._28_4_ = fVar115;
      auVar322._0_4_ = fVar197 + fVar174;
      auVar322._4_4_ = fVar198 + fVar345;
      auVar322._8_4_ = fVar199 + fVar175;
      auVar322._12_4_ = fVar200 + fVar347;
      auVar322._16_4_ = fVar209 + fVar176;
      auVar322._20_4_ = fVar210 + fVar349;
      auVar322._24_4_ = fVar211 + fVar177;
      auVar322._28_4_ = fVar335 + fVar115;
      auVar222 = vsubps_avx(auVar47,auVar48);
      auVar11 = vsubps_avx(auVar308,auVar363);
      auVar12 = vsubps_avx(auVar322,auVar9);
      auVar179 = vsubps_avx(auVar222,auVar10);
      auVar13 = vsubps_avx(auVar297,auVar180);
      *(float *)(undefined1 *)local_108._buffer = auVar308._0_4_ + auVar363._0_4_;
      *(float *)((undefined1 *)local_108._buffer + 4) = auVar308._4_4_ + auVar363._4_4_;
      *(float *)((undefined1 *)local_108._buffer + 8) = auVar308._8_4_ + auVar363._8_4_;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = auVar308._12_4_ + auVar363._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) =
           auVar308._16_4_ + auVar363._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) =
           auVar308._20_4_ + auVar363._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) =
           auVar308._24_4_ + auVar363._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) =
           auVar308._28_4_ + auVar363._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) =
           auVar322._0_4_ + auVar9._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) =
           auVar322._4_4_ + auVar9._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) =
           auVar322._8_4_ + auVar9._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) =
           auVar322._12_4_ + auVar9._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) =
           auVar322._16_4_ + auVar9._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) =
           auVar322._20_4_ + auVar9._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) =
           auVar322._24_4_ + auVar9._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) =
           auVar322._28_4_ + auVar9._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) =
           auVar222._0_4_ + auVar10._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) =
           auVar222._4_4_ + auVar10._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) =
           auVar222._8_4_ + auVar10._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) =
           auVar222._12_4_ + auVar10._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) =
           auVar222._16_4_ + auVar10._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) =
           auVar222._20_4_ + auVar10._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) =
           auVar222._24_4_ + auVar10._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) =
           auVar222._28_4_ + auVar10._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) =
           auVar297._0_4_ + auVar180._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) =
           auVar297._4_4_ + auVar180._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) =
           auVar297._8_4_ + auVar180._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) =
           auVar297._12_4_ + auVar180._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) =
           auVar297._16_4_ + auVar180._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) =
           auVar297._20_4_ + auVar180._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) =
           auVar297._24_4_ + auVar180._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) =
           auVar297._28_4_ + auVar180._28_4_;
      *(undefined1 (*) [32])((long)local_108._buffer + 0x80) = auVar13;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xa0) = auVar179;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xc0) = auVar12;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xe0) = auVar11;
      in_ZMM7 = ZEXT1664(auVar11._0_16_);
      auVar159 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_f8,&local_108,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"3x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      for (uVar113 = 0; auVar287 = in_ZMM7._28_36_, uVar113 != 0x40; uVar113 = uVar113 + 1) {
        auVar159._0_16_ = ZEXT816(0);
        if (uVar113 < 0x18) {
          auVar171._0_8_ = (double)Imath_3_2::erand48(local_e6);
          auVar171._8_56_ = extraout_var_21;
          auVar159._4_60_ = auVar171._4_60_;
          auVar159._0_4_ = (float)auVar171._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = auVar159._0_4_;
        local_f8._buffer[uVar113] = auVar159._0_4_;
      }
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      puVar109 = &DAT_001a4be0;
      pfVar110 = &local_e0;
      for (lVar112 = 0x10; lVar112 != 0; lVar112 = lVar112 + -1) {
        *(undefined8 *)pfVar110 = *puVar109;
        puVar109 = puVar109 + (ulong)bVar114 * -2 + 1;
        pfVar110 = pfVar110 + ((ulong)bVar114 * -2 + 1) * 2;
      }
      auVar382._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      auVar382._0_16_ = *(undefined1 (*) [16])local_108._buffer;
      auVar396._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      auVar396._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      auVar10 = vunpcklpd_avx(auVar382,auVar396);
      auVar9 = vunpckhpd_avx(auVar382,auVar396);
      auVar297 = vunpcklps_avx(auVar10,auVar9);
      auVar9 = vunpckhps_avx(auVar10,auVar9);
      auVar180 = vunpcklpd_avx(auVar297,auVar9);
      auVar9 = vunpckhpd_avx(auVar297,auVar9);
      auVar364._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x60);
      auVar364._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x40);
      auVar370._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x70);
      auVar370._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x50);
      auVar297 = vunpcklpd_avx(auVar364,auVar370);
      auVar10 = vunpckhpd_avx(auVar364,auVar370);
      auVar222 = vunpcklps_avx(auVar297,auVar10);
      auVar10 = vunpckhps_avx(auVar297,auVar10);
      auVar297 = vunpcklpd_avx(auVar222,auVar10);
      auVar10 = vunpckhpd_avx(auVar222,auVar10);
      auVar222 = vpermilps_avx(auVar180,0);
      auVar11 = vpermilps_avx(auVar180,0x55);
      auVar12 = vpermilps_avx(auVar180,0xaa);
      auVar180 = vpermilps_avx(auVar180,0xff);
      auVar135._0_4_ =
           local_e0 * auVar222._0_4_ + local_d0 * auVar11._0_4_ +
           local_c0 * auVar12._0_4_ + local_b0 * auVar180._0_4_;
      auVar135._4_4_ =
           fStack_dc * auVar222._4_4_ + fStack_cc * auVar11._4_4_ +
           fStack_bc * auVar12._4_4_ + fStack_ac * auVar180._4_4_;
      auVar135._8_4_ =
           fStack_d8 * auVar222._8_4_ + fStack_c8 * auVar11._8_4_ +
           fStack_b8 * auVar12._8_4_ + fStack_a8 * auVar180._8_4_;
      auVar135._12_4_ =
           fStack_d4 * auVar222._12_4_ + fStack_c4 * auVar11._12_4_ +
           fStack_b4 * auVar12._12_4_ + fStack_a4 * auVar180._12_4_;
      auVar135._16_4_ =
           local_e0 * auVar222._16_4_ + local_d0 * auVar11._16_4_ +
           local_c0 * auVar12._16_4_ + local_b0 * auVar180._16_4_;
      auVar135._20_4_ =
           fStack_dc * auVar222._20_4_ + fStack_cc * auVar11._20_4_ +
           fStack_bc * auVar12._20_4_ + fStack_ac * auVar180._20_4_;
      auVar135._24_4_ =
           fStack_d8 * auVar222._24_4_ + fStack_c8 * auVar11._24_4_ +
           fStack_b8 * auVar12._24_4_ + fStack_a8 * auVar180._24_4_;
      auVar135._28_4_ = auVar222._28_4_ + auVar11._28_4_ + auVar12._28_4_ + auVar180._28_4_;
      auVar180 = vpermilps_avx(auVar297,0);
      auVar222 = vpermilps_avx(auVar297,0x55);
      auVar11 = vpermilps_avx(auVar297,0xaa);
      auVar297 = vpermilps_avx(auVar297,0xff);
      auVar193._0_4_ =
           local_e0 * auVar180._0_4_ + local_d0 * auVar222._0_4_ +
           local_c0 * auVar11._0_4_ + local_b0 * auVar297._0_4_;
      auVar193._4_4_ =
           fStack_dc * auVar180._4_4_ + fStack_cc * auVar222._4_4_ +
           fStack_bc * auVar11._4_4_ + fStack_ac * auVar297._4_4_;
      auVar193._8_4_ =
           fStack_d8 * auVar180._8_4_ + fStack_c8 * auVar222._8_4_ +
           fStack_b8 * auVar11._8_4_ + fStack_a8 * auVar297._8_4_;
      auVar193._12_4_ =
           fStack_d4 * auVar180._12_4_ + fStack_c4 * auVar222._12_4_ +
           fStack_b4 * auVar11._12_4_ + fStack_a4 * auVar297._12_4_;
      auVar193._16_4_ =
           local_e0 * auVar180._16_4_ + local_d0 * auVar222._16_4_ +
           local_c0 * auVar11._16_4_ + local_b0 * auVar297._16_4_;
      auVar193._20_4_ =
           fStack_dc * auVar180._20_4_ + fStack_cc * auVar222._20_4_ +
           fStack_bc * auVar11._20_4_ + fStack_ac * auVar297._20_4_;
      auVar193._24_4_ =
           fStack_d8 * auVar180._24_4_ + fStack_c8 * auVar222._24_4_ +
           fStack_b8 * auVar11._24_4_ + fStack_a8 * auVar297._24_4_;
      auVar193._28_4_ = auVar180._28_4_ + auVar222._28_4_ + auVar11._28_4_ + auVar297._28_4_;
      auVar103._4_4_ = fStack_9c;
      auVar103._0_4_ = local_a0;
      auVar103._8_4_ = fStack_98;
      auVar103._12_4_ = fStack_94;
      auVar309._16_16_ = auVar103;
      auVar309._0_16_ = auVar103;
      auVar180 = vpermilps_avx(auVar9,0);
      auVar297 = vpermilps_avx(auVar9,0x55);
      auVar222 = vpermilps_avx(auVar9,0xaa);
      auVar9 = vpermilps_avx(auVar9,0xff);
      auVar235._0_4_ =
           local_a0 * auVar180._0_4_ + local_90 * auVar297._0_4_ +
           local_80 * auVar222._0_4_ + local_70 * auVar9._0_4_;
      auVar235._4_4_ =
           fStack_9c * auVar180._4_4_ + fStack_8c * auVar297._4_4_ +
           fStack_7c * auVar222._4_4_ + fStack_6c * auVar9._4_4_;
      auVar235._8_4_ =
           fStack_98 * auVar180._8_4_ + fStack_88 * auVar297._8_4_ +
           fStack_78 * auVar222._8_4_ + fStack_68 * auVar9._8_4_;
      auVar235._12_4_ =
           fStack_94 * auVar180._12_4_ + fStack_84 * auVar297._12_4_ +
           fStack_74 * auVar222._12_4_ + fStack_64 * auVar9._12_4_;
      auVar235._16_4_ =
           local_a0 * auVar180._16_4_ + local_90 * auVar297._16_4_ +
           local_80 * auVar222._16_4_ + local_70 * auVar9._16_4_;
      auVar235._20_4_ =
           fStack_9c * auVar180._20_4_ + fStack_8c * auVar297._20_4_ +
           fStack_7c * auVar222._20_4_ + fStack_6c * auVar9._20_4_;
      auVar235._24_4_ =
           fStack_98 * auVar180._24_4_ + fStack_88 * auVar297._24_4_ +
           fStack_78 * auVar222._24_4_ + fStack_68 * auVar9._24_4_;
      auVar235._28_4_ = auVar180._28_4_ + auVar297._28_4_ + auVar222._28_4_ + auVar9._28_4_;
      auVar9 = vpermilps_avx(auVar10,0);
      auVar180 = vpermilps_avx(auVar10,0x55);
      auVar297 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      fVar177 = auVar10._28_4_;
      fVar387 = auVar297._28_4_ + fVar177;
      auVar255._0_4_ =
           local_a0 * auVar9._0_4_ + local_90 * auVar180._0_4_ +
           local_80 * auVar297._0_4_ + local_70 * auVar10._0_4_;
      auVar255._4_4_ =
           fStack_9c * auVar9._4_4_ + fStack_8c * auVar180._4_4_ +
           fStack_7c * auVar297._4_4_ + fStack_6c * auVar10._4_4_;
      auVar255._8_4_ =
           fStack_98 * auVar9._8_4_ + fStack_88 * auVar180._8_4_ +
           fStack_78 * auVar297._8_4_ + fStack_68 * auVar10._8_4_;
      auVar255._12_4_ =
           fStack_94 * auVar9._12_4_ + fStack_84 * auVar180._12_4_ +
           fStack_74 * auVar297._12_4_ + fStack_64 * auVar10._12_4_;
      auVar255._16_4_ =
           local_a0 * auVar9._16_4_ + local_90 * auVar180._16_4_ +
           local_80 * auVar297._16_4_ + local_70 * auVar10._16_4_;
      auVar255._20_4_ =
           fStack_9c * auVar9._20_4_ + fStack_8c * auVar180._20_4_ +
           fStack_7c * auVar297._20_4_ + fStack_6c * auVar10._20_4_;
      auVar255._24_4_ =
           fStack_98 * auVar9._24_4_ + fStack_88 * auVar180._24_4_ +
           fStack_78 * auVar297._24_4_ + fStack_68 * auVar10._24_4_;
      auVar255._28_4_ = auVar9._28_4_ + auVar180._28_4_ + fVar387;
      auVar9 = vsubps_avx(auVar135,auVar235);
      auVar136._0_4_ = auVar135._0_4_ + auVar235._0_4_;
      auVar136._4_4_ = auVar135._4_4_ + auVar235._4_4_;
      auVar136._8_4_ = auVar135._8_4_ + auVar235._8_4_;
      auVar136._12_4_ = auVar135._12_4_ + auVar235._12_4_;
      auVar136._16_4_ = auVar135._16_4_ + auVar235._16_4_;
      auVar136._20_4_ = auVar135._20_4_ + auVar235._20_4_;
      auVar136._24_4_ = auVar135._24_4_ + auVar235._24_4_;
      auVar136._28_4_ = auVar135._28_4_ + auVar235._28_4_;
      auVar12 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar193,auVar255);
      auVar194._0_4_ = auVar193._0_4_ + auVar255._0_4_;
      auVar194._4_4_ = auVar193._4_4_ + auVar255._4_4_;
      auVar194._8_4_ = auVar193._8_4_ + auVar255._8_4_;
      auVar194._12_4_ = auVar193._12_4_ + auVar255._12_4_;
      auVar194._16_4_ = auVar193._16_4_ + auVar255._16_4_;
      auVar194._20_4_ = auVar193._20_4_ + auVar255._20_4_;
      auVar194._24_4_ = auVar193._24_4_ + auVar255._24_4_;
      auVar194._28_4_ = auVar193._28_4_ + auVar255._28_4_;
      auVar179 = vpermilps_avx(auVar9,0x1b);
      auVar10 = vperm2f128_avx(auVar179,auVar194,2);
      auVar9 = vperm2f128_avx(auVar12,auVar136,0x13);
      auVar180 = vperm2f128_avx(auVar12,auVar136,2);
      auVar297 = vpermilps_avx(auVar309,0xff);
      auVar222 = vpermilps_avx(auVar309,0xaa);
      auVar11 = vpermilps_avx(auVar309,0x55);
      auVar13 = vpermilps_avx(auVar309,0);
      fVar335 = auVar9._0_4_;
      fVar241 = auVar13._0_4_ * fVar335;
      fVar174 = auVar9._4_4_;
      fVar256 = auVar13._4_4_ * fVar174;
      auVar49._4_4_ = fVar256;
      auVar49._0_4_ = fVar241;
      fVar345 = auVar9._8_4_;
      fVar257 = auVar13._8_4_ * fVar345;
      auVar49._8_4_ = fVar257;
      fVar175 = auVar9._12_4_;
      fVar258 = auVar13._12_4_ * fVar175;
      auVar49._12_4_ = fVar258;
      fVar347 = auVar9._16_4_;
      fVar259 = auVar13._16_4_ * fVar347;
      auVar49._16_4_ = fVar259;
      fVar176 = auVar9._20_4_;
      fVar264 = auVar13._20_4_ * fVar176;
      auVar49._20_4_ = fVar264;
      fVar349 = auVar9._24_4_;
      fVar265 = auVar13._24_4_ * fVar349;
      auVar49._24_4_ = fVar265;
      auVar49._28_4_ = auVar12._28_4_;
      fVar266 = auVar11._0_4_ * fVar335;
      fVar267 = auVar11._4_4_ * fVar174;
      auVar50._4_4_ = fVar267;
      auVar50._0_4_ = fVar266;
      fVar283 = auVar11._8_4_ * fVar345;
      auVar50._8_4_ = fVar283;
      fVar284 = auVar11._12_4_ * fVar175;
      auVar50._12_4_ = fVar284;
      fVar285 = auVar11._16_4_ * fVar347;
      auVar50._16_4_ = fVar285;
      fVar288 = auVar11._20_4_ * fVar176;
      auVar50._20_4_ = fVar288;
      fVar312 = auVar11._24_4_ * fVar349;
      auVar50._24_4_ = fVar312;
      auVar50._28_4_ = auVar179._28_4_;
      fVar313 = auVar222._0_4_ * fVar335;
      fVar314 = auVar222._4_4_ * fVar174;
      auVar51._4_4_ = fVar314;
      auVar51._0_4_ = fVar313;
      fVar315 = auVar222._8_4_ * fVar345;
      auVar51._8_4_ = fVar315;
      fVar324 = auVar222._12_4_ * fVar175;
      auVar51._12_4_ = fVar324;
      fVar325 = auVar222._16_4_ * fVar347;
      auVar51._16_4_ = fVar325;
      fVar326 = auVar222._20_4_ * fVar176;
      auVar51._20_4_ = fVar326;
      fVar385 = auVar222._24_4_ * fVar349;
      auVar51._24_4_ = fVar385;
      auVar51._28_4_ = fVar387;
      fVar335 = auVar297._0_4_ * fVar335;
      fVar174 = auVar297._4_4_ * fVar174;
      auVar52._4_4_ = fVar174;
      auVar52._0_4_ = fVar335;
      fVar345 = auVar297._8_4_ * fVar345;
      auVar52._8_4_ = fVar345;
      fVar175 = auVar297._12_4_ * fVar175;
      auVar52._12_4_ = fVar175;
      fVar347 = auVar297._16_4_ * fVar347;
      auVar52._16_4_ = fVar347;
      fVar176 = auVar297._20_4_ * fVar176;
      auVar52._20_4_ = fVar176;
      fVar349 = auVar297._24_4_ * fVar349;
      auVar52._24_4_ = fVar349;
      auVar52._28_4_ = fVar177;
      auVar96._4_4_ = fStack_d4;
      auVar96._0_4_ = fStack_d8;
      auVar96._8_4_ = local_d0;
      auVar96._12_4_ = fStack_cc;
      auVar195._16_16_ = auVar96;
      auVar195._0_16_ = auVar96;
      auVar222 = vpermilps_avx(auVar195,0xff);
      auVar9 = vpermilps_avx(auVar195,0xaa);
      auVar11 = vpermilps_avx(auVar195,0);
      fVar226 = auVar180._0_4_ * auVar11._0_4_;
      fVar227 = auVar180._4_4_ * auVar11._4_4_;
      auVar53._4_4_ = fVar227;
      auVar53._0_4_ = fVar226;
      fVar228 = auVar180._8_4_ * auVar11._8_4_;
      auVar53._8_4_ = fVar228;
      fVar229 = auVar180._12_4_ * auVar11._12_4_;
      auVar53._12_4_ = fVar229;
      fVar238 = auVar180._16_4_ * auVar11._16_4_;
      auVar53._16_4_ = fVar238;
      fVar239 = auVar180._20_4_ * auVar11._20_4_;
      auVar53._20_4_ = fVar239;
      fVar197 = auVar297._28_4_;
      fVar240 = auVar180._24_4_ * auVar11._24_4_;
      auVar53._24_4_ = fVar240;
      auVar53._28_4_ = fVar197;
      auVar282._0_4_ = auVar10._0_4_ * auVar9._0_4_;
      auVar282._4_4_ = auVar10._4_4_ * auVar9._4_4_;
      auVar282._8_4_ = auVar10._8_4_ * auVar9._8_4_;
      auVar282._12_4_ = auVar10._12_4_ * auVar9._12_4_;
      auVar282._16_4_ = auVar10._16_4_ * auVar9._16_4_;
      auVar282._20_4_ = auVar10._20_4_ * auVar9._20_4_;
      auVar282._24_4_ = auVar10._24_4_ * auVar9._24_4_;
      auVar282._28_36_ = auVar287;
      auVar310._0_4_ = fVar226 + auVar282._0_4_;
      auVar310._4_4_ = fVar227 + auVar282._4_4_;
      auVar310._8_4_ = fVar228 + auVar282._8_4_;
      auVar310._12_4_ = fVar229 + auVar282._12_4_;
      auVar310._16_4_ = fVar238 + auVar282._16_4_;
      auVar310._20_4_ = fVar239 + auVar282._20_4_;
      auVar310._24_4_ = fVar240 + auVar282._24_4_;
      fVar115 = auVar287._0_4_;
      auVar310._28_4_ = fVar197 + fVar115;
      auVar9 = vsubps_avx(auVar53,auVar282._0_32_);
      fVar198 = auVar10._0_4_ * auVar222._0_4_;
      fVar199 = auVar10._4_4_ * auVar222._4_4_;
      auVar54._4_4_ = fVar199;
      auVar54._0_4_ = fVar198;
      fVar200 = auVar10._8_4_ * auVar222._8_4_;
      auVar54._8_4_ = fVar200;
      fVar209 = auVar10._12_4_ * auVar222._12_4_;
      auVar54._12_4_ = fVar209;
      fVar210 = auVar10._16_4_ * auVar222._16_4_;
      auVar54._16_4_ = fVar210;
      fVar211 = auVar10._20_4_ * auVar222._20_4_;
      auVar54._20_4_ = fVar211;
      fVar212 = auVar10._24_4_ * auVar222._24_4_;
      auVar54._24_4_ = fVar212;
      auVar54._28_4_ = fVar115;
      auVar323._0_4_ = fVar226 + fVar198;
      auVar323._4_4_ = fVar227 + fVar199;
      auVar323._8_4_ = fVar228 + fVar200;
      auVar323._12_4_ = fVar229 + fVar209;
      auVar323._16_4_ = fVar238 + fVar210;
      auVar323._20_4_ = fVar239 + fVar211;
      auVar323._24_4_ = fVar240 + fVar212;
      auVar323._28_4_ = fVar197 + fVar115;
      auVar10 = vsubps_avx(auVar53,auVar54);
      auVar180 = vsubps_avx(auVar310,auVar49);
      auVar297 = vsubps_avx(auVar323,auVar50);
      auVar222 = vsubps_avx(auVar10,auVar51);
      auVar11 = vsubps_avx(auVar9,auVar52);
      *(float *)(undefined1 *)local_108._buffer = auVar310._0_4_ + fVar241;
      *(float *)((undefined1 *)local_108._buffer + 4) = auVar310._4_4_ + fVar256;
      *(float *)((undefined1 *)local_108._buffer + 8) = auVar310._8_4_ + fVar257;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = auVar310._12_4_ + fVar258;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) = auVar310._16_4_ + fVar259;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) =
           auVar310._20_4_ + fVar264;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) =
           auVar310._24_4_ + fVar265;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) =
           auVar310._28_4_ + auVar12._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) = auVar323._0_4_ + fVar266;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) =
           auVar323._4_4_ + fVar267;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) =
           auVar323._8_4_ + fVar283;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) =
           auVar323._12_4_ + fVar284;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) = auVar323._16_4_ + fVar285;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) =
           auVar323._20_4_ + fVar288;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) =
           auVar323._24_4_ + fVar312;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) =
           auVar323._28_4_ + auVar179._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) = auVar10._0_4_ + fVar313;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) =
           auVar10._4_4_ + fVar314;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) =
           auVar10._8_4_ + fVar315;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) =
           auVar10._12_4_ + fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) = auVar10._16_4_ + fVar325;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) =
           auVar10._20_4_ + fVar326;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) =
           auVar10._24_4_ + fVar385;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) =
           auVar10._28_4_ + fVar387;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) = auVar9._0_4_ + fVar335;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) =
           auVar9._4_4_ + fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) =
           auVar9._8_4_ + fVar345;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) =
           auVar9._12_4_ + fVar175;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) = auVar9._16_4_ + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) =
           auVar9._20_4_ + fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) =
           auVar9._24_4_ + fVar349;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) =
           auVar9._28_4_ + fVar177;
      *(undefined1 (*) [32])((long)local_108._buffer + 0x80) = auVar11;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xa0) = auVar222;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xc0) = auVar297;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xe0) = auVar180;
      in_ZMM7 = ZEXT1664(auVar180._0_16_);
      auVar159 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_f8,&local_108,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"2x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      for (uVar113 = 0; uVar113 != 0x40; uVar113 = uVar113 + 1) {
        auVar159._0_16_ = ZEXT816(0);
        if (uVar113 < 0x10) {
          auVar172._0_8_ = (double)Imath_3_2::erand48(local_e6);
          auVar172._8_56_ = extraout_var_22;
          auVar159._4_60_ = auVar172._4_60_;
          auVar159._0_4_ = (float)auVar172._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = auVar159._0_4_;
        local_f8._buffer[uVar113] = auVar159._0_4_;
      }
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      puVar109 = &DAT_001a4be0;
      pfVar110 = &local_e0;
      for (lVar112 = 0x10; lVar112 != 0; lVar112 = lVar112 + -1) {
        *(undefined8 *)pfVar110 = *puVar109;
        puVar109 = puVar109 + (ulong)bVar114 * -2 + 1;
        pfVar110 = pfVar110 + ((ulong)bVar114 * -2 + 1) * 2;
      }
      auVar383._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      auVar383._0_16_ = *(undefined1 (*) [16])local_108._buffer;
      auVar397._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      auVar397._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      auVar10 = vunpcklpd_avx(auVar383,auVar397);
      auVar9 = vunpckhpd_avx(auVar383,auVar397);
      auVar180 = vunpcklps_avx(auVar10,auVar9);
      auVar9 = vunpckhps_avx(auVar10,auVar9);
      auVar10 = vunpcklpd_avx(auVar180,auVar9);
      auVar9 = vunpckhpd_avx(auVar180,auVar9);
      auVar180 = vpermilps_avx(auVar10,0);
      auVar297 = vpermilps_avx(auVar10,0x55);
      auVar222 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      auVar137._0_4_ =
           local_e0 * auVar180._0_4_ + local_d0 * auVar297._0_4_ +
           local_c0 * auVar222._0_4_ + local_b0 * auVar10._0_4_;
      auVar137._4_4_ =
           fStack_dc * auVar180._4_4_ + fStack_cc * auVar297._4_4_ +
           fStack_bc * auVar222._4_4_ + fStack_ac * auVar10._4_4_;
      auVar137._8_4_ =
           fStack_d8 * auVar180._8_4_ + fStack_c8 * auVar297._8_4_ +
           fStack_b8 * auVar222._8_4_ + fStack_a8 * auVar10._8_4_;
      auVar137._12_4_ =
           fStack_d4 * auVar180._12_4_ + fStack_c4 * auVar297._12_4_ +
           fStack_b4 * auVar222._12_4_ + fStack_a4 * auVar10._12_4_;
      auVar137._16_4_ =
           local_e0 * auVar180._16_4_ + local_d0 * auVar297._16_4_ +
           local_c0 * auVar222._16_4_ + local_b0 * auVar10._16_4_;
      auVar137._20_4_ =
           fStack_dc * auVar180._20_4_ + fStack_cc * auVar297._20_4_ +
           fStack_bc * auVar222._20_4_ + fStack_ac * auVar10._20_4_;
      auVar137._24_4_ =
           fStack_d8 * auVar180._24_4_ + fStack_c8 * auVar297._24_4_ +
           fStack_b8 * auVar222._24_4_ + fStack_a8 * auVar10._24_4_;
      auVar137._28_4_ = auVar180._28_4_ + auVar297._28_4_ + auVar222._28_4_ + auVar10._28_4_;
      auVar104._4_4_ = fStack_9c;
      auVar104._0_4_ = local_a0;
      auVar104._8_4_ = fStack_98;
      auVar104._12_4_ = fStack_94;
      auVar311._16_16_ = auVar104;
      auVar311._0_16_ = auVar104;
      auVar10 = vpermilps_avx(auVar9,0);
      auVar180 = vpermilps_avx(auVar9,0x55);
      auVar297 = vpermilps_avx(auVar9,0xaa);
      auVar9 = vpermilps_avx(auVar9,0xff);
      fVar349 = auVar180._28_4_;
      fVar177 = auVar9._28_4_;
      fVar313 = auVar297._28_4_ + fVar177;
      auVar236._0_4_ =
           local_a0 * auVar10._0_4_ + local_90 * auVar180._0_4_ +
           local_80 * auVar297._0_4_ + local_70 * auVar9._0_4_;
      auVar236._4_4_ =
           fStack_9c * auVar10._4_4_ + fStack_8c * auVar180._4_4_ +
           fStack_7c * auVar297._4_4_ + fStack_6c * auVar9._4_4_;
      auVar236._8_4_ =
           fStack_98 * auVar10._8_4_ + fStack_88 * auVar180._8_4_ +
           fStack_78 * auVar297._8_4_ + fStack_68 * auVar9._8_4_;
      auVar236._12_4_ =
           fStack_94 * auVar10._12_4_ + fStack_84 * auVar180._12_4_ +
           fStack_74 * auVar297._12_4_ + fStack_64 * auVar9._12_4_;
      auVar236._16_4_ =
           local_a0 * auVar10._16_4_ + local_90 * auVar180._16_4_ +
           local_80 * auVar297._16_4_ + local_70 * auVar9._16_4_;
      auVar236._20_4_ =
           fStack_9c * auVar10._20_4_ + fStack_8c * auVar180._20_4_ +
           fStack_7c * auVar297._20_4_ + fStack_6c * auVar9._20_4_;
      auVar236._24_4_ =
           fStack_98 * auVar10._24_4_ + fStack_88 * auVar180._24_4_ +
           fStack_78 * auVar297._24_4_ + fStack_68 * auVar9._24_4_;
      auVar236._28_4_ = auVar10._28_4_ + fVar349 + fVar313;
      auVar9 = vsubps_avx(auVar137,auVar236);
      auVar138._0_4_ = auVar137._0_4_ + auVar236._0_4_;
      auVar138._4_4_ = auVar137._4_4_ + auVar236._4_4_;
      auVar138._8_4_ = auVar137._8_4_ + auVar236._8_4_;
      auVar138._12_4_ = auVar137._12_4_ + auVar236._12_4_;
      auVar138._16_4_ = auVar137._16_4_ + auVar236._16_4_;
      auVar138._20_4_ = auVar137._20_4_ + auVar236._20_4_;
      auVar138._24_4_ = auVar137._24_4_ + auVar236._24_4_;
      auVar138._28_4_ = auVar137._28_4_ + auVar236._28_4_;
      auVar222 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vperm2f128_avx(auVar222,auVar138,0x13);
      auVar10 = vperm2f128_avx(auVar222,auVar138,2);
      auVar180 = vpermilps_avx(auVar311,0xff);
      auVar297 = vpermilps_avx(auVar311,0xaa);
      auVar11 = vpermilps_avx(auVar311,0x55);
      auVar12 = vpermilps_avx(auVar311,0);
      fVar115 = auVar9._0_4_;
      fVar226 = auVar12._0_4_ * fVar115;
      fVar335 = auVar9._4_4_;
      fVar227 = auVar12._4_4_ * fVar335;
      auVar55._4_4_ = fVar227;
      auVar55._0_4_ = fVar226;
      fVar174 = auVar9._8_4_;
      fVar228 = auVar12._8_4_ * fVar174;
      auVar55._8_4_ = fVar228;
      fVar345 = auVar9._12_4_;
      fVar229 = auVar12._12_4_ * fVar345;
      auVar55._12_4_ = fVar229;
      fVar175 = auVar9._16_4_;
      fVar238 = auVar12._16_4_ * fVar175;
      auVar55._16_4_ = fVar238;
      fVar347 = auVar9._20_4_;
      fVar239 = auVar12._20_4_ * fVar347;
      auVar55._20_4_ = fVar239;
      fVar176 = auVar9._24_4_;
      fVar240 = auVar12._24_4_ * fVar176;
      auVar55._24_4_ = fVar240;
      auVar55._28_4_ = auVar222._28_4_;
      fVar241 = auVar11._0_4_ * fVar115;
      fVar256 = auVar11._4_4_ * fVar335;
      auVar56._4_4_ = fVar256;
      auVar56._0_4_ = fVar241;
      fVar257 = auVar11._8_4_ * fVar174;
      auVar56._8_4_ = fVar257;
      fVar258 = auVar11._12_4_ * fVar345;
      auVar56._12_4_ = fVar258;
      fVar259 = auVar11._16_4_ * fVar175;
      auVar56._16_4_ = fVar259;
      fVar264 = auVar11._20_4_ * fVar347;
      auVar56._20_4_ = fVar264;
      fVar265 = auVar11._24_4_ * fVar176;
      auVar56._24_4_ = fVar265;
      auVar56._28_4_ = fVar349;
      fVar266 = auVar297._0_4_ * fVar115;
      fVar267 = auVar297._4_4_ * fVar335;
      auVar57._4_4_ = fVar267;
      auVar57._0_4_ = fVar266;
      fVar283 = auVar297._8_4_ * fVar174;
      auVar57._8_4_ = fVar283;
      fVar284 = auVar297._12_4_ * fVar345;
      auVar57._12_4_ = fVar284;
      fVar285 = auVar297._16_4_ * fVar175;
      auVar57._16_4_ = fVar285;
      fVar288 = auVar297._20_4_ * fVar347;
      auVar57._20_4_ = fVar288;
      fVar312 = auVar297._24_4_ * fVar176;
      auVar57._24_4_ = fVar312;
      auVar57._28_4_ = fVar313;
      fVar115 = auVar180._0_4_ * fVar115;
      fVar335 = auVar180._4_4_ * fVar335;
      auVar58._4_4_ = fVar335;
      auVar58._0_4_ = fVar115;
      fVar174 = auVar180._8_4_ * fVar174;
      auVar58._8_4_ = fVar174;
      fVar345 = auVar180._12_4_ * fVar345;
      auVar58._12_4_ = fVar345;
      fVar175 = auVar180._16_4_ * fVar175;
      auVar58._16_4_ = fVar175;
      fVar347 = auVar180._20_4_ * fVar347;
      auVar58._20_4_ = fVar347;
      fVar176 = auVar180._24_4_ * fVar176;
      auVar58._24_4_ = fVar176;
      auVar58._28_4_ = fVar177;
      auVar97._4_4_ = fStack_d4;
      auVar97._0_4_ = fStack_d8;
      auVar97._8_4_ = local_d0;
      auVar97._12_4_ = fStack_cc;
      auVar196._16_16_ = auVar97;
      auVar196._0_16_ = auVar97;
      vpermilps_avx(auVar196,0xff);
      vpermilps_avx(auVar196,0xaa);
      auVar9 = vpermilps_avx(auVar196,0);
      fVar198 = auVar10._0_4_ * auVar9._0_4_;
      fVar199 = auVar10._4_4_ * auVar9._4_4_;
      auVar59._4_4_ = fVar199;
      auVar59._0_4_ = fVar198;
      fVar200 = auVar10._8_4_ * auVar9._8_4_;
      auVar59._8_4_ = fVar200;
      fVar209 = auVar10._12_4_ * auVar9._12_4_;
      auVar59._12_4_ = fVar209;
      fVar210 = auVar10._16_4_ * auVar9._16_4_;
      auVar59._16_4_ = fVar210;
      fVar211 = auVar10._20_4_ * auVar9._20_4_;
      auVar59._20_4_ = fVar211;
      fVar197 = auVar180._28_4_;
      fVar212 = auVar10._24_4_ * auVar9._24_4_;
      auVar59._24_4_ = fVar212;
      auVar59._28_4_ = fVar197;
      auVar9 = vsubps_avx(auVar59,auVar55);
      auVar10 = vsubps_avx(auVar59,auVar56);
      auVar180 = vsubps_avx(auVar59,auVar57);
      auVar297 = vsubps_avx(auVar59,auVar58);
      *(float *)(undefined1 *)local_108._buffer = fVar198 + fVar226;
      *(float *)((undefined1 *)local_108._buffer + 4) = fVar199 + fVar227;
      *(float *)((undefined1 *)local_108._buffer + 8) = fVar200 + fVar228;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = fVar209 + fVar229;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) = fVar210 + fVar238;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) = fVar211 + fVar239;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) = fVar212 + fVar240;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) =
           fVar197 + auVar222._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) = fVar198 + fVar241;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) = fVar199 + fVar256;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) = fVar200 + fVar257;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) = fVar209 + fVar258;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) = fVar210 + fVar259;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) = fVar211 + fVar264;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) = fVar212 + fVar265;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) = fVar197 + fVar349;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) = fVar198 + fVar266;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) = fVar199 + fVar267;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) = fVar200 + fVar283;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) = fVar209 + fVar284;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) = fVar210 + fVar285;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) = fVar211 + fVar288;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) = fVar212 + fVar312;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) = fVar197 + fVar313;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) = fVar198 + fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) = fVar199 + fVar335;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) = fVar200 + fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) = fVar209 + fVar345;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) = fVar210 + fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) = fVar211 + fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) = fVar212 + fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) = fVar197 + fVar177;
      *(undefined1 (*) [32])((long)local_108._buffer + 0x80) = auVar297;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xa0) = auVar180;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xc0) = auVar10;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xe0) = auVar9;
      auVar159 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_f8,&local_108,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"1x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      for (uVar113 = 0; uVar113 != 0x40; uVar113 = uVar113 + 1) {
        auVar159._0_16_ = ZEXT816(0);
        if (uVar113 < 8) {
          auVar173._0_8_ = (double)Imath_3_2::erand48(local_e6);
          auVar173._8_56_ = extraout_var_23;
          auVar159._4_60_ = auVar173._4_60_;
          auVar159._0_4_ = (float)auVar173._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = auVar159._0_4_;
        local_f8._buffer[uVar113] = auVar159._0_4_;
      }
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      puVar109 = &DAT_001a4be0;
      pfVar110 = &local_e0;
      for (lVar112 = 0x10; lVar112 != 0; lVar112 = lVar112 + -1) {
        *(undefined8 *)pfVar110 = *puVar109;
        puVar109 = puVar109 + (ulong)bVar114 * -2 + 1;
        pfVar110 = pfVar110 + ((ulong)bVar114 * -2 + 1) * 2;
      }
      auVar384._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      auVar384._0_16_ = *(undefined1 (*) [16])local_108._buffer;
      auVar398._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      auVar398._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      auVar10 = vunpcklpd_avx(auVar384,auVar398);
      auVar9 = vunpckhpd_avx(auVar384,auVar398);
      auVar180 = vunpcklps_avx(auVar10,auVar9);
      auVar9 = vunpckhps_avx(auVar10,auVar9);
      auVar10 = vunpcklpd_avx(auVar180,auVar9);
      auVar9 = vunpckhpd_avx(auVar180,auVar9);
      auVar180 = vpermilps_avx(auVar10,0);
      auVar297 = vpermilps_avx(auVar10,0x55);
      auVar222 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      auVar139._0_4_ =
           local_e0 * auVar180._0_4_ + local_d0 * auVar297._0_4_ +
           local_c0 * auVar222._0_4_ + local_b0 * auVar10._0_4_;
      auVar139._4_4_ =
           fStack_dc * auVar180._4_4_ + fStack_cc * auVar297._4_4_ +
           fStack_bc * auVar222._4_4_ + fStack_ac * auVar10._4_4_;
      auVar139._8_4_ =
           fStack_d8 * auVar180._8_4_ + fStack_c8 * auVar297._8_4_ +
           fStack_b8 * auVar222._8_4_ + fStack_a8 * auVar10._8_4_;
      auVar139._12_4_ =
           fStack_d4 * auVar180._12_4_ + fStack_c4 * auVar297._12_4_ +
           fStack_b4 * auVar222._12_4_ + fStack_a4 * auVar10._12_4_;
      auVar139._16_4_ =
           local_e0 * auVar180._16_4_ + local_d0 * auVar297._16_4_ +
           local_c0 * auVar222._16_4_ + local_b0 * auVar10._16_4_;
      auVar139._20_4_ =
           fStack_dc * auVar180._20_4_ + fStack_cc * auVar297._20_4_ +
           fStack_bc * auVar222._20_4_ + fStack_ac * auVar10._20_4_;
      auVar139._24_4_ =
           fStack_d8 * auVar180._24_4_ + fStack_c8 * auVar297._24_4_ +
           fStack_b8 * auVar222._24_4_ + fStack_a8 * auVar10._24_4_;
      auVar139._28_4_ = auVar180._28_4_ + auVar297._28_4_ + auVar222._28_4_ + auVar10._28_4_;
      auVar10 = vpermilps_avx(auVar9,0);
      auVar180 = vpermilps_avx(auVar9,0x55);
      auVar297 = vpermilps_avx(auVar9,0xaa);
      auVar9 = vpermilps_avx(auVar9,0xff);
      auVar237._0_4_ =
           local_a0 * auVar10._0_4_ + local_90 * auVar180._0_4_ +
           local_80 * auVar297._0_4_ + local_70 * auVar9._0_4_;
      auVar237._4_4_ =
           fStack_9c * auVar10._4_4_ + fStack_8c * auVar180._4_4_ +
           fStack_7c * auVar297._4_4_ + fStack_6c * auVar9._4_4_;
      auVar237._8_4_ =
           fStack_98 * auVar10._8_4_ + fStack_88 * auVar180._8_4_ +
           fStack_78 * auVar297._8_4_ + fStack_68 * auVar9._8_4_;
      auVar237._12_4_ =
           fStack_94 * auVar10._12_4_ + fStack_84 * auVar180._12_4_ +
           fStack_74 * auVar297._12_4_ + fStack_64 * auVar9._12_4_;
      auVar237._16_4_ =
           local_a0 * auVar10._16_4_ + local_90 * auVar180._16_4_ +
           local_80 * auVar297._16_4_ + local_70 * auVar9._16_4_;
      auVar237._20_4_ =
           fStack_9c * auVar10._20_4_ + fStack_8c * auVar180._20_4_ +
           fStack_7c * auVar297._20_4_ + fStack_6c * auVar9._20_4_;
      auVar237._24_4_ =
           fStack_98 * auVar10._24_4_ + fStack_88 * auVar180._24_4_ +
           fStack_78 * auVar297._24_4_ + fStack_68 * auVar9._24_4_;
      auVar237._28_4_ = auVar10._28_4_ + auVar180._28_4_ + auVar297._28_4_ + auVar9._28_4_;
      auVar9 = vsubps_avx(auVar139,auVar237);
      auVar140._0_4_ = auVar139._0_4_ + auVar237._0_4_;
      auVar140._4_4_ = auVar139._4_4_ + auVar237._4_4_;
      auVar140._8_4_ = auVar139._8_4_ + auVar237._8_4_;
      auVar140._12_4_ = auVar139._12_4_ + auVar237._12_4_;
      auVar140._16_4_ = auVar139._16_4_ + auVar237._16_4_;
      auVar140._20_4_ = auVar139._20_4_ + auVar237._20_4_;
      auVar140._24_4_ = auVar139._24_4_ + auVar237._24_4_;
      auVar140._28_4_ = auVar139._28_4_ + auVar237._28_4_;
      auVar9 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vperm2f128_avx(auVar9,auVar140,2);
      fVar115 = auVar9._0_4_ * local_e0;
      fVar335 = auVar9._4_4_ * fStack_dc;
      fVar174 = auVar9._8_4_ * fStack_d8;
      fVar345 = auVar9._12_4_ * fStack_d4;
      fVar175 = auVar9._16_4_ * local_e0;
      fVar347 = auVar9._20_4_ * fStack_dc;
      uVar60 = auVar9._28_4_;
      fVar176 = auVar9._24_4_ * fStack_d8;
      *(float *)(undefined1 *)local_108._buffer = fVar115;
      *(float *)((undefined1 *)local_108._buffer + 4) = fVar335;
      *(float *)((undefined1 *)local_108._buffer + 8) = fVar174;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = fVar345;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) = fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) = fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) = fVar176;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) = uVar60;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) = fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) = fVar335;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) = fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) = fVar345;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) = fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) = fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) = fVar176;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) = uVar60;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) = fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) = fVar335;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) = fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) = fVar345;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) = fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) = fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) = fVar176;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) = uVar60;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) = fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) = fVar335;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) = fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) = fVar345;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) = fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) = fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) = fVar176;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) = uVar60;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x80) = fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 4) = fVar335;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 8) = fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 0xc) = fVar345;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x90) = fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 4) = fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 8) = fVar176;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 0xc) = uVar60;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) = fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 4) = fVar335;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 8) = fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 0xc) = fVar345;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) = fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 4) = fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 8) = fVar176;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 0xc) = uVar60;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) = fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 4) = fVar335;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 8) = fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 0xc) = fVar345;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) = fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 4) = fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 8) = fVar176;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 0xc) = uVar60;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) = fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + 4) = fVar335;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + 8) = fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + 0xc) = fVar345;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) = fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) + 4) = fVar347;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) + 8) = fVar176;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) + 0xc) = uVar60;
      auVar159 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_f8,&local_108,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
    }
  }
  Imf_3_2::SimdAlignedBuffer64<float>::~SimdAlignedBuffer64(&local_108);
  Imf_3_2::SimdAlignedBuffer64<float>::~SimdAlignedBuffer64(&local_f8);
  return;
}

Assistant:

void
testDct ()
{
    const int            numIter = 1000000;
    Rand48               rand48 (0);
    SimdAlignedBuffer64f orig;
    SimdAlignedBuffer64f test;

    cout << "   DCT Round Trip " << endl;
    for (int iter = 0; iter < numIter; ++iter)
    {
        for (int i = 0; i < 64; ++i)
        {
            orig._buffer[i] = test._buffer[i] = rand48.nextf ();
        }

        dctForward8x8 (test._buffer);
        dctInverse8x8_scalar<0> (test._buffer);

        compareBufferRelative (orig, test, .02, 1e-3);
    }

    cout << "      Inverse, DC Only" << endl;
    for (int iter = 0; iter < numIter; ++iter)
    {
        orig._buffer[0] = test._buffer[0] = rand48.nextf ();
        for (int i = 1; i < 64; ++i)
        {
            orig._buffer[i] = test._buffer[i] = 0;
        }

        dctInverse8x8_scalar<0> (orig._buffer);
        dctInverse8x8DcOnly (test._buffer);

        compareBufferRelative (orig, test, .01, 1e-6);
    }

#define INVERSE_DCT_SCALAR_TEST_N(_func, _n, _desc)                            \
    cout << "         " << _desc << endl;                                      \
    for (int iter = 0; iter < numIter; ++iter)                                 \
    {                                                                          \
        for (int i = 0; i < 64; ++i)                                           \
        {                                                                      \
            if (i < 8 * (8 - _n))                                              \
            {                                                                  \
                orig._buffer[i] = test._buffer[i] = rand48.nextf ();           \
            }                                                                  \
            else                                                               \
            {                                                                  \
                orig._buffer[i] = test._buffer[i] = 0;                         \
            }                                                                  \
        }                                                                      \
        dctInverse8x8_scalar<0> (orig._buffer);                                \
        _func<_n> (test._buffer);                                              \
        compareBufferRelative (orig, test, .01, 1e-6);                         \
    }

    cout << "      Inverse, Scalar: " << endl;
    INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_scalar, 0, "8x8")
    INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_scalar, 1, "7x8")
    INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_scalar, 2, "6x8")
    INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_scalar, 3, "5x8")
    INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_scalar, 4, "4x8")
    INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_scalar, 5, "3x8")
    INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_scalar, 6, "2x8")
    INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_scalar, 7, "1x8")

    CpuId cpuid;
    if (cpuid.sse2)
    {
        cout << "      Inverse, SSE2: " << endl;
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_sse2, 0, "8x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_sse2, 1, "7x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_sse2, 2, "6x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_sse2, 3, "5x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_sse2, 4, "4x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_sse2, 5, "3x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_sse2, 6, "2x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_sse2, 7, "1x8")
    }

    if (cpuid.avx)
    {
        cout << "      Inverse, AVX: " << endl;
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_avx, 0, "8x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_avx, 1, "7x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_avx, 2, "6x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_avx, 3, "5x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_avx, 4, "4x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_avx, 5, "3x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_avx, 6, "2x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_avx, 7, "1x8")
    }
}